

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  RTCRayQueryContext *pRVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [60];
  undefined1 auVar66 [60];
  undefined1 auVar67 [12];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  byte bVar91;
  byte bVar92;
  byte bVar93;
  byte bVar94;
  ulong uVar95;
  byte bVar96;
  byte bVar97;
  ulong uVar98;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  uint uVar99;
  long lVar100;
  bool bVar101;
  ulong uVar102;
  uint uVar103;
  uint uVar161;
  uint uVar162;
  uint uVar164;
  uint uVar165;
  uint uVar166;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  uint uVar163;
  uint uVar167;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar155 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar160 [64];
  float pp;
  float fVar168;
  float fVar169;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar190;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar188;
  float fVar189;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar187 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar212;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar213;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar229;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar227;
  float fVar228;
  undefined1 auVar226 [64];
  float fVar230;
  float fVar231;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [16];
  float fVar249;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar250 [64];
  undefined1 auVar265 [16];
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar251 [32];
  float fVar255;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [64];
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar260 [64];
  float fVar264;
  undefined1 auVar266 [64];
  undefined1 auVar267 [16];
  float fVar269;
  undefined1 auVar268 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  undefined1 auVar274 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar275 [64];
  undefined1 auVar276 [16];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_b90;
  undefined1 local_b60 [32];
  undefined1 local_b40 [16];
  undefined1 (*local_b28) [32];
  Primitive *local_b20;
  ulong local_b18;
  ulong local_b10;
  ulong local_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  float local_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  float local_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [64];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined4 uStack_688;
  undefined4 uStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  undefined8 uStack_160;
  float afStack_158 [74];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar146 [32];
  undefined1 auVar156 [64];
  undefined1 auVar159 [64];
  
  PVar7 = prim[1];
  uVar95 = (ulong)(byte)PVar7;
  fVar231 = *(float *)(prim + uVar95 * 0x19 + 0x12);
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar26 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar110 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar109 = vsubps_avx(auVar106,*(undefined1 (*) [16])(prim + uVar95 * 0x19 + 6));
  fVar230 = fVar231 * auVar109._0_4_;
  fVar168 = fVar231 * auVar110._0_4_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar95 * 4 + 6);
  auVar118 = vpmovsxbd_avx2(auVar106);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar95 * 5 + 6);
  auVar116 = vpmovsxbd_avx2(auVar26);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar95 * 6 + 6);
  auVar119 = vpmovsxbd_avx2(auVar107);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar265._8_8_ = 0;
  auVar265._0_8_ = *(ulong *)(prim + uVar95 * 0xb + 6);
  auVar120 = vpmovsxbd_avx2(auVar265);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar125 = vpmovsxbd_avx2(auVar104);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar121 = vcvtdq2ps_avx(auVar125);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar95 + 6);
  auVar117 = vpmovsxbd_avx2(auVar6);
  auVar117 = vcvtdq2ps_avx(auVar117);
  uVar102 = (ulong)(uint)((int)(uVar95 * 9) * 2);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar102 + 6);
  auVar122 = vpmovsxbd_avx2(auVar108);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar102 + uVar95 + 6);
  auVar123 = vpmovsxbd_avx2(auVar105);
  auVar123 = vcvtdq2ps_avx(auVar123);
  uVar98 = (ulong)(uint)((int)(uVar95 * 5) << 2);
  auVar276._8_8_ = 0;
  auVar276._0_8_ = *(ulong *)(prim + uVar98 + 6);
  auVar115 = vpmovsxbd_avx2(auVar276);
  auVar124 = vcvtdq2ps_avx(auVar115);
  auVar271 = ZEXT3264(auVar124);
  auVar136._4_4_ = fVar168;
  auVar136._0_4_ = fVar168;
  auVar136._8_4_ = fVar168;
  auVar136._12_4_ = fVar168;
  auVar136._16_4_ = fVar168;
  auVar136._20_4_ = fVar168;
  auVar136._24_4_ = fVar168;
  auVar136._28_4_ = fVar168;
  auVar130._8_4_ = 1;
  auVar130._0_8_ = 0x100000001;
  auVar130._12_4_ = 1;
  auVar130._16_4_ = 1;
  auVar130._20_4_ = 1;
  auVar130._24_4_ = 1;
  auVar130._28_4_ = 1;
  auVar113 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar127 = ZEXT1632(CONCAT412(fVar231 * auVar110._12_4_,
                                CONCAT48(fVar231 * auVar110._8_4_,
                                         CONCAT44(fVar231 * auVar110._4_4_,fVar168))));
  auVar126 = vpermps_avx2(auVar130,auVar127);
  auVar114 = vpermps_avx512vl(auVar113,auVar127);
  fVar168 = auVar114._0_4_;
  fVar252 = auVar114._4_4_;
  auVar127._4_4_ = fVar252 * auVar119._4_4_;
  auVar127._0_4_ = fVar168 * auVar119._0_4_;
  fVar253 = auVar114._8_4_;
  auVar127._8_4_ = fVar253 * auVar119._8_4_;
  fVar254 = auVar114._12_4_;
  auVar127._12_4_ = fVar254 * auVar119._12_4_;
  fVar261 = auVar114._16_4_;
  auVar127._16_4_ = fVar261 * auVar119._16_4_;
  fVar262 = auVar114._20_4_;
  auVar127._20_4_ = fVar262 * auVar119._20_4_;
  fVar263 = auVar114._24_4_;
  auVar127._24_4_ = fVar263 * auVar119._24_4_;
  auVar127._28_4_ = auVar125._28_4_;
  auVar125._4_4_ = auVar117._4_4_ * fVar252;
  auVar125._0_4_ = auVar117._0_4_ * fVar168;
  auVar125._8_4_ = auVar117._8_4_ * fVar253;
  auVar125._12_4_ = auVar117._12_4_ * fVar254;
  auVar125._16_4_ = auVar117._16_4_ * fVar261;
  auVar125._20_4_ = auVar117._20_4_ * fVar262;
  auVar125._24_4_ = auVar117._24_4_ * fVar263;
  auVar125._28_4_ = auVar115._28_4_;
  auVar115._4_4_ = auVar124._4_4_ * fVar252;
  auVar115._0_4_ = auVar124._0_4_ * fVar168;
  auVar115._8_4_ = auVar124._8_4_ * fVar253;
  auVar115._12_4_ = auVar124._12_4_ * fVar254;
  auVar115._16_4_ = auVar124._16_4_ * fVar261;
  auVar115._20_4_ = auVar124._20_4_ * fVar262;
  auVar115._24_4_ = auVar124._24_4_ * fVar263;
  auVar115._28_4_ = auVar114._28_4_;
  auVar106 = vfmadd231ps_fma(auVar127,auVar126,auVar116);
  auVar26 = vfmadd231ps_fma(auVar125,auVar126,auVar121);
  auVar107 = vfmadd231ps_fma(auVar115,auVar123,auVar126);
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar136,auVar118);
  auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar136,auVar120);
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar122,auVar136);
  auVar137._4_4_ = fVar230;
  auVar137._0_4_ = fVar230;
  auVar137._8_4_ = fVar230;
  auVar137._12_4_ = fVar230;
  auVar137._16_4_ = fVar230;
  auVar137._20_4_ = fVar230;
  auVar137._24_4_ = fVar230;
  auVar137._28_4_ = fVar230;
  auVar275 = ZEXT3264(auVar137);
  auVar115 = ZEXT1632(CONCAT412(fVar231 * auVar109._12_4_,
                                CONCAT48(fVar231 * auVar109._8_4_,
                                         CONCAT44(fVar231 * auVar109._4_4_,fVar230))));
  auVar125 = vpermps_avx2(auVar130,auVar115);
  auVar115 = vpermps_avx512vl(auVar113,auVar115);
  fVar231 = auVar115._0_4_;
  fVar168 = auVar115._4_4_;
  auVar126._4_4_ = fVar168 * auVar119._4_4_;
  auVar126._0_4_ = fVar231 * auVar119._0_4_;
  fVar252 = auVar115._8_4_;
  auVar126._8_4_ = fVar252 * auVar119._8_4_;
  fVar253 = auVar115._12_4_;
  auVar126._12_4_ = fVar253 * auVar119._12_4_;
  fVar254 = auVar115._16_4_;
  auVar126._16_4_ = fVar254 * auVar119._16_4_;
  fVar261 = auVar115._20_4_;
  auVar126._20_4_ = fVar261 * auVar119._20_4_;
  fVar262 = auVar115._24_4_;
  auVar126._24_4_ = fVar262 * auVar119._24_4_;
  auVar126._28_4_ = 1;
  auVar113._4_4_ = auVar117._4_4_ * fVar168;
  auVar113._0_4_ = auVar117._0_4_ * fVar231;
  auVar113._8_4_ = auVar117._8_4_ * fVar252;
  auVar113._12_4_ = auVar117._12_4_ * fVar253;
  auVar113._16_4_ = auVar117._16_4_ * fVar254;
  auVar113._20_4_ = auVar117._20_4_ * fVar261;
  auVar113._24_4_ = auVar117._24_4_ * fVar262;
  auVar113._28_4_ = auVar119._28_4_;
  auVar117._4_4_ = auVar124._4_4_ * fVar168;
  auVar117._0_4_ = auVar124._0_4_ * fVar231;
  auVar117._8_4_ = auVar124._8_4_ * fVar252;
  auVar117._12_4_ = auVar124._12_4_ * fVar253;
  auVar117._16_4_ = auVar124._16_4_ * fVar254;
  auVar117._20_4_ = auVar124._20_4_ * fVar261;
  auVar117._24_4_ = auVar124._24_4_ * fVar262;
  auVar117._28_4_ = auVar115._28_4_;
  auVar265 = vfmadd231ps_fma(auVar126,auVar125,auVar116);
  auVar104 = vfmadd231ps_fma(auVar113,auVar125,auVar121);
  auVar6 = vfmadd231ps_fma(auVar117,auVar125,auVar123);
  auVar265 = vfmadd231ps_fma(ZEXT1632(auVar265),auVar137,auVar118);
  auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar137,auVar120);
  auVar133._8_4_ = 0x7fffffff;
  auVar133._0_8_ = 0x7fffffff7fffffff;
  auVar133._12_4_ = 0x7fffffff;
  auVar133._16_4_ = 0x7fffffff;
  auVar133._20_4_ = 0x7fffffff;
  auVar133._24_4_ = 0x7fffffff;
  auVar133._28_4_ = 0x7fffffff;
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar137,auVar122);
  auVar118 = vandps_avx(ZEXT1632(auVar106),auVar133);
  auVar135._8_4_ = 0x219392ef;
  auVar135._0_8_ = 0x219392ef219392ef;
  auVar135._12_4_ = 0x219392ef;
  auVar135._16_4_ = 0x219392ef;
  auVar135._20_4_ = 0x219392ef;
  auVar135._24_4_ = 0x219392ef;
  auVar135._28_4_ = 0x219392ef;
  uVar102 = vcmpps_avx512vl(auVar118,auVar135,1);
  bVar12 = (bool)((byte)uVar102 & 1);
  auVar114._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar106._0_4_;
  bVar12 = (bool)((byte)(uVar102 >> 1) & 1);
  auVar114._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar106._4_4_;
  bVar12 = (bool)((byte)(uVar102 >> 2) & 1);
  auVar114._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar106._8_4_;
  bVar12 = (bool)((byte)(uVar102 >> 3) & 1);
  auVar114._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar106._12_4_;
  auVar114._16_4_ = (uint)((byte)(uVar102 >> 4) & 1) * 0x219392ef;
  auVar114._20_4_ = (uint)((byte)(uVar102 >> 5) & 1) * 0x219392ef;
  auVar114._24_4_ = (uint)((byte)(uVar102 >> 6) & 1) * 0x219392ef;
  auVar114._28_4_ = (uint)(byte)(uVar102 >> 7) * 0x219392ef;
  auVar118 = vandps_avx(ZEXT1632(auVar26),auVar133);
  uVar102 = vcmpps_avx512vl(auVar118,auVar135,1);
  bVar12 = (bool)((byte)uVar102 & 1);
  auVar128._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._0_4_;
  bVar12 = (bool)((byte)(uVar102 >> 1) & 1);
  auVar128._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._4_4_;
  bVar12 = (bool)((byte)(uVar102 >> 2) & 1);
  auVar128._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._8_4_;
  bVar12 = (bool)((byte)(uVar102 >> 3) & 1);
  auVar128._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._12_4_;
  auVar128._16_4_ = (uint)((byte)(uVar102 >> 4) & 1) * 0x219392ef;
  auVar128._20_4_ = (uint)((byte)(uVar102 >> 5) & 1) * 0x219392ef;
  auVar128._24_4_ = (uint)((byte)(uVar102 >> 6) & 1) * 0x219392ef;
  auVar128._28_4_ = (uint)(byte)(uVar102 >> 7) * 0x219392ef;
  auVar118 = vandps_avx(ZEXT1632(auVar107),auVar133);
  uVar102 = vcmpps_avx512vl(auVar118,auVar135,1);
  bVar12 = (bool)((byte)uVar102 & 1);
  auVar118._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar107._0_4_;
  bVar12 = (bool)((byte)(uVar102 >> 1) & 1);
  auVar118._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar107._4_4_;
  bVar12 = (bool)((byte)(uVar102 >> 2) & 1);
  auVar118._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar107._8_4_;
  bVar12 = (bool)((byte)(uVar102 >> 3) & 1);
  auVar118._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar107._12_4_;
  auVar118._16_4_ = (uint)((byte)(uVar102 >> 4) & 1) * 0x219392ef;
  auVar118._20_4_ = (uint)((byte)(uVar102 >> 5) & 1) * 0x219392ef;
  auVar118._24_4_ = (uint)((byte)(uVar102 >> 6) & 1) * 0x219392ef;
  auVar118._28_4_ = (uint)(byte)(uVar102 >> 7) * 0x219392ef;
  auVar116 = vrcp14ps_avx512vl(auVar114);
  auVar134._8_4_ = 0x3f800000;
  auVar134._0_8_ = &DAT_3f8000003f800000;
  auVar134._12_4_ = 0x3f800000;
  auVar134._16_4_ = 0x3f800000;
  auVar134._20_4_ = 0x3f800000;
  auVar134._24_4_ = 0x3f800000;
  auVar134._28_4_ = 0x3f800000;
  auVar106 = vfnmadd213ps_fma(auVar114,auVar116,auVar134);
  auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar128);
  auVar26 = vfnmadd213ps_fma(auVar128,auVar116,auVar134);
  auVar26 = vfmadd132ps_fma(ZEXT1632(auVar26),auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar118);
  auVar107 = vfnmadd213ps_fma(auVar118,auVar116,auVar134);
  auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar116,auVar116);
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 7 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar265));
  auVar122._4_4_ = auVar106._4_4_ * auVar118._4_4_;
  auVar122._0_4_ = auVar106._0_4_ * auVar118._0_4_;
  auVar122._8_4_ = auVar106._8_4_ * auVar118._8_4_;
  auVar122._12_4_ = auVar106._12_4_ * auVar118._12_4_;
  auVar122._16_4_ = auVar118._16_4_ * 0.0;
  auVar122._20_4_ = auVar118._20_4_ * 0.0;
  auVar122._24_4_ = auVar118._24_4_ * 0.0;
  auVar122._28_4_ = auVar118._28_4_;
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 9 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar265));
  auVar117 = vpbroadcastd_avx512vl();
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar132._0_4_ = auVar106._0_4_ * auVar118._0_4_;
  auVar132._4_4_ = auVar106._4_4_ * auVar118._4_4_;
  auVar132._8_4_ = auVar106._8_4_ * auVar118._8_4_;
  auVar132._12_4_ = auVar106._12_4_ * auVar118._12_4_;
  auVar132._16_4_ = auVar118._16_4_ * 0.0;
  auVar132._20_4_ = auVar118._20_4_ * 0.0;
  auVar132._24_4_ = auVar118._24_4_ * 0.0;
  auVar132._28_4_ = 0;
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar7 * 0x10 + uVar95 * -2 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar104));
  auVar123._4_4_ = auVar26._4_4_ * auVar118._4_4_;
  auVar123._0_4_ = auVar26._0_4_ * auVar118._0_4_;
  auVar123._8_4_ = auVar26._8_4_ * auVar118._8_4_;
  auVar123._12_4_ = auVar26._12_4_ * auVar118._12_4_;
  auVar123._16_4_ = auVar118._16_4_ * 0.0;
  auVar123._20_4_ = auVar118._20_4_ * 0.0;
  auVar123._24_4_ = auVar118._24_4_ * 0.0;
  auVar123._28_4_ = auVar118._28_4_;
  auVar118 = vcvtdq2ps_avx(auVar116);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar104));
  auVar131._0_4_ = auVar26._0_4_ * auVar118._0_4_;
  auVar131._4_4_ = auVar26._4_4_ * auVar118._4_4_;
  auVar131._8_4_ = auVar26._8_4_ * auVar118._8_4_;
  auVar131._12_4_ = auVar26._12_4_ * auVar118._12_4_;
  auVar131._16_4_ = auVar118._16_4_ * 0.0;
  auVar131._20_4_ = auVar118._20_4_ * 0.0;
  auVar131._24_4_ = auVar118._24_4_ * 0.0;
  auVar131._28_4_ = 0;
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 + uVar95 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar6));
  auVar124._4_4_ = auVar118._4_4_ * auVar107._4_4_;
  auVar124._0_4_ = auVar118._0_4_ * auVar107._0_4_;
  auVar124._8_4_ = auVar118._8_4_ * auVar107._8_4_;
  auVar124._12_4_ = auVar118._12_4_ * auVar107._12_4_;
  auVar124._16_4_ = auVar118._16_4_ * 0.0;
  auVar124._20_4_ = auVar118._20_4_ * 0.0;
  auVar124._24_4_ = auVar118._24_4_ * 0.0;
  auVar124._28_4_ = auVar118._28_4_;
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0x17 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar6));
  auVar129._0_4_ = auVar107._0_4_ * auVar118._0_4_;
  auVar129._4_4_ = auVar107._4_4_ * auVar118._4_4_;
  auVar129._8_4_ = auVar107._8_4_ * auVar118._8_4_;
  auVar129._12_4_ = auVar107._12_4_ * auVar118._12_4_;
  auVar129._16_4_ = auVar118._16_4_ * 0.0;
  auVar129._20_4_ = auVar118._20_4_ * 0.0;
  auVar129._24_4_ = auVar118._24_4_ * 0.0;
  auVar129._28_4_ = 0;
  auVar118 = vpminsd_avx2(auVar122,auVar132);
  auVar116 = vpminsd_avx2(auVar123,auVar131);
  auVar118 = vmaxps_avx(auVar118,auVar116);
  auVar116 = vpminsd_avx2(auVar124,auVar129);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar119._4_4_ = uVar5;
  auVar119._0_4_ = uVar5;
  auVar119._8_4_ = uVar5;
  auVar119._12_4_ = uVar5;
  auVar119._16_4_ = uVar5;
  auVar119._20_4_ = uVar5;
  auVar119._24_4_ = uVar5;
  auVar119._28_4_ = uVar5;
  auVar116 = vmaxps_avx512vl(auVar116,auVar119);
  auVar118 = vmaxps_avx(auVar118,auVar116);
  auVar116._8_4_ = 0x3f7ffffa;
  auVar116._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar116._12_4_ = 0x3f7ffffa;
  auVar116._16_4_ = 0x3f7ffffa;
  auVar116._20_4_ = 0x3f7ffffa;
  auVar116._24_4_ = 0x3f7ffffa;
  auVar116._28_4_ = 0x3f7ffffa;
  local_760 = vmulps_avx512vl(auVar118,auVar116);
  auVar118 = vpmaxsd_avx2(auVar122,auVar132);
  auVar116 = vpmaxsd_avx2(auVar123,auVar131);
  auVar118 = vminps_avx(auVar118,auVar116);
  auVar116 = vpmaxsd_avx2(auVar124,auVar129);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar120._4_4_ = uVar5;
  auVar120._0_4_ = uVar5;
  auVar120._8_4_ = uVar5;
  auVar120._12_4_ = uVar5;
  auVar120._16_4_ = uVar5;
  auVar120._20_4_ = uVar5;
  auVar120._24_4_ = uVar5;
  auVar120._28_4_ = uVar5;
  auVar116 = vminps_avx512vl(auVar116,auVar120);
  auVar118 = vminps_avx(auVar118,auVar116);
  auVar121._8_4_ = 0x3f800003;
  auVar121._0_8_ = 0x3f8000033f800003;
  auVar121._12_4_ = 0x3f800003;
  auVar121._16_4_ = 0x3f800003;
  auVar121._20_4_ = 0x3f800003;
  auVar121._24_4_ = 0x3f800003;
  auVar121._28_4_ = 0x3f800003;
  auVar118 = vmulps_avx512vl(auVar118,auVar121);
  uVar29 = vpcmpgtd_avx512vl(auVar117,_DAT_0205a920);
  uVar27 = vcmpps_avx512vl(local_760,auVar118,2);
  if ((byte)((byte)uVar27 & (byte)uVar29) == 0) {
    return;
  }
  local_b08 = (ulong)(byte)((byte)uVar27 & (byte)uVar29);
  local_b28 = (undefined1 (*) [32])local_240;
  auVar187 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar187);
  local_b20 = prim;
LAB_01e12eed:
  lVar100 = 0;
  for (uVar102 = local_b08; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
    lVar100 = lVar100 + 1;
  }
  uVar99 = *(uint *)(prim + 2);
  uVar8 = *(uint *)(prim + lVar100 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar99].ptr;
  uVar102 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                            pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i * (ulong)uVar8);
  p_Var10 = pGVar9[1].intersectionFilterN;
  lVar100 = *(long *)&pGVar9[1].time_range.upper;
  auVar106 = *(undefined1 (*) [16])(lVar100 + (long)p_Var10 * uVar102);
  auVar26 = *(undefined1 (*) [16])(lVar100 + (uVar102 + 1) * (long)p_Var10);
  auVar107 = *(undefined1 (*) [16])(lVar100 + (uVar102 + 2) * (long)p_Var10);
  local_b08 = local_b08 - 1 & local_b08;
  auVar265 = *(undefined1 (*) [16])(lVar100 + (uVar102 + 3) * (long)p_Var10);
  if (local_b08 != 0) {
    uVar98 = local_b08 - 1 & local_b08;
    for (uVar102 = local_b08; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
    }
    if (uVar98 != 0) {
      for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x1c);
  auVar6 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_7e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_ae0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar278 = ZEXT3264(local_ae0);
  auVar104 = vunpcklps_avx512vl(local_7e0._0_16_,local_ae0._0_16_);
  local_b00 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar277 = ZEXT3264(local_b00);
  auVar276 = local_b00._0_16_;
  local_a70 = vinsertps_avx512f(auVar104,auVar276,0x28);
  auVar260 = ZEXT1664(local_a70);
  auVar109._0_4_ = auVar106._0_4_ + auVar26._0_4_ + auVar107._0_4_ + auVar265._0_4_;
  auVar109._4_4_ = auVar106._4_4_ + auVar26._4_4_ + auVar107._4_4_ + auVar265._4_4_;
  auVar109._8_4_ = auVar106._8_4_ + auVar26._8_4_ + auVar107._8_4_ + auVar265._8_4_;
  auVar109._12_4_ = auVar106._12_4_ + auVar26._12_4_ + auVar107._12_4_ + auVar265._12_4_;
  auVar110._8_4_ = 0x3e800000;
  auVar110._0_8_ = 0x3e8000003e800000;
  auVar110._12_4_ = 0x3e800000;
  auVar104 = vmulps_avx512vl(auVar109,auVar110);
  auVar104 = vsubps_avx(auVar104,auVar6);
  auVar104 = vdpps_avx(auVar104,local_a70,0x7f);
  fVar231 = *(float *)(ray + k * 4 + 0xc0);
  auVar266 = ZEXT464((uint)fVar231);
  local_a80 = vdpps_avx(local_a70,local_a70,0x7f);
  auVar111._4_12_ = ZEXT812(0) << 0x20;
  auVar111._0_4_ = local_a80._0_4_;
  auVar105 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar111);
  auVar108 = vfnmadd213ss_fma(auVar105,local_a80,ZEXT416(0x40000000));
  local_740 = auVar104._0_4_ * auVar105._0_4_ * auVar108._0_4_;
  auVar250 = ZEXT464((uint)local_740);
  auVar112._4_4_ = local_740;
  auVar112._0_4_ = local_740;
  auVar112._8_4_ = local_740;
  auVar112._12_4_ = local_740;
  fStack_930 = local_740;
  _local_940 = auVar112;
  fStack_92c = local_740;
  fStack_928 = local_740;
  fStack_924 = local_740;
  auVar104 = vfmadd231ps_fma(auVar6,local_a70,auVar112);
  auVar104 = vblendps_avx(auVar104,ZEXT816(0) << 0x40,8);
  auVar106 = vsubps_avx(auVar106,auVar104);
  auVar107 = vsubps_avx(auVar107,auVar104);
  auVar26 = vsubps_avx(auVar26,auVar104);
  auVar259 = ZEXT1664(auVar26);
  auVar265 = vsubps_avx(auVar265,auVar104);
  local_520 = auVar106._0_4_;
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  auVar138._8_4_ = 1;
  auVar138._0_8_ = 0x100000001;
  auVar138._12_4_ = 1;
  auVar138._16_4_ = 1;
  auVar138._20_4_ = 1;
  auVar138._24_4_ = 1;
  auVar138._28_4_ = 1;
  local_a00 = ZEXT1632(auVar106);
  local_540 = vpermps_avx2(auVar138,local_a00);
  auVar139._8_4_ = 2;
  auVar139._0_8_ = 0x200000002;
  auVar139._12_4_ = 2;
  auVar139._16_4_ = 2;
  auVar139._20_4_ = 2;
  auVar139._24_4_ = 2;
  auVar139._28_4_ = 2;
  local_560 = vpermps_avx2(auVar139,local_a00);
  auVar142._8_4_ = 3;
  auVar142._0_8_ = 0x300000003;
  auVar142._12_4_ = 3;
  auVar142._16_4_ = 3;
  auVar142._20_4_ = 3;
  auVar142._24_4_ = 3;
  auVar142._28_4_ = 3;
  local_580 = vpermps_avx2(auVar142,local_a00);
  local_5a0 = auVar26._0_4_;
  uStack_59c = local_5a0;
  uStack_598 = local_5a0;
  uStack_594 = local_5a0;
  uStack_590 = local_5a0;
  uStack_58c = local_5a0;
  uStack_588 = local_5a0;
  uStack_584 = local_5a0;
  local_a40 = ZEXT1632(auVar26);
  local_5c0 = vpermps_avx2(auVar138,local_a40);
  local_5e0 = vpermps_avx2(auVar139,local_a40);
  local_600 = vpermps_avx2(auVar142,local_a40);
  local_620 = auVar107._0_4_;
  uStack_61c = local_620;
  uStack_618 = local_620;
  uStack_614 = local_620;
  uStack_610 = local_620;
  uStack_60c = local_620;
  uStack_608 = local_620;
  uStack_604 = local_620;
  local_a20 = ZEXT1632(auVar107);
  local_640 = vpermps_avx2(auVar138,local_a20);
  local_660 = vpermps_avx2(auVar139,local_a20);
  local_680 = vpermps_avx2(auVar142,local_a20);
  local_6a0 = auVar265._0_4_;
  uStack_69c = local_6a0;
  uStack_698 = local_6a0;
  uStack_694 = local_6a0;
  uStack_690 = local_6a0;
  uStack_68c = local_6a0;
  uStack_688 = local_6a0;
  uStack_684 = local_6a0;
  _local_a60 = ZEXT1632(auVar265);
  local_6c0 = vpermps_avx2(auVar138,_local_a60);
  local_6e0 = vpermps_avx2(auVar139,_local_a60);
  local_700 = vpermps_avx2(auVar142,_local_a60);
  auVar106 = vmulss_avx512f(auVar276,auVar276);
  auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar106),local_ae0,local_ae0);
  local_800 = vfmadd231ps_avx512vl(auVar118,local_7e0,local_7e0);
  local_720._0_4_ = local_800._0_4_;
  local_720._4_4_ = local_720._0_4_;
  local_720._8_4_ = local_720._0_4_;
  local_720._12_4_ = local_720._0_4_;
  local_720._16_4_ = local_720._0_4_;
  local_720._20_4_ = local_720._0_4_;
  local_720._24_4_ = local_720._0_4_;
  local_720._28_4_ = local_720._0_4_;
  auVar224._8_4_ = 0x7fffffff;
  auVar224._0_8_ = 0x7fffffff7fffffff;
  auVar224._12_4_ = 0x7fffffff;
  auVar224._16_4_ = 0x7fffffff;
  auVar224._20_4_ = 0x7fffffff;
  auVar224._24_4_ = 0x7fffffff;
  auVar224._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_720,auVar224);
  local_9c0 = ZEXT416((uint)local_740);
  local_740 = fVar231 - local_740;
  fStack_73c = local_740;
  fStack_738 = local_740;
  fStack_734 = local_740;
  fStack_730 = local_740;
  fStack_72c = local_740;
  fStack_728 = local_740;
  fStack_724 = local_740;
  auVar187 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar187);
  local_b18 = 1;
  local_b10 = 0;
  auVar187 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar187);
  auVar106 = vsqrtss_avx(local_a80,local_a80);
  auVar26 = vsqrtss_avx(local_a80,local_a80);
  auVar226 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar116 = auVar187._32_32_;
  auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar187 = ZEXT3264(auVar118);
  do {
    local_b40 = auVar226._0_16_;
    auVar107 = vmovshdup_avx(local_b40);
    fVar168 = auVar226._0_4_;
    fVar269 = auVar107._0_4_ - fVar168;
    fVar213 = fVar269 * 0.04761905;
    auVar244._4_4_ = fVar168;
    auVar244._0_4_ = fVar168;
    auVar244._8_4_ = fVar168;
    auVar244._12_4_ = fVar168;
    auVar244._16_4_ = fVar168;
    auVar244._20_4_ = fVar168;
    auVar244._24_4_ = fVar168;
    auVar244._28_4_ = fVar168;
    local_aa0._4_4_ = fVar269;
    local_aa0._0_4_ = fVar269;
    local_aa0._8_4_ = fVar269;
    local_aa0._12_4_ = fVar269;
    local_aa0._16_4_ = fVar269;
    local_aa0._20_4_ = fVar269;
    local_aa0._24_4_ = fVar269;
    local_aa0._28_4_ = fVar269;
    auVar107 = vfmadd231ps_fma(auVar244,local_aa0,_DAT_02020f20);
    auVar119 = vsubps_avx512vl(auVar187._0_32_,ZEXT1632(auVar107));
    fVar168 = auVar119._0_4_;
    fVar253 = auVar119._4_4_;
    fVar261 = auVar119._8_4_;
    fVar263 = auVar119._12_4_;
    fVar255 = auVar119._16_4_;
    fVar249 = auVar119._20_4_;
    fVar264 = auVar119._24_4_;
    fVar169 = fVar168 * fVar168 * fVar168;
    fVar188 = fVar253 * fVar253 * fVar253;
    auVar44._4_4_ = fVar188;
    auVar44._0_4_ = fVar169;
    fVar189 = fVar261 * fVar261 * fVar261;
    auVar44._8_4_ = fVar189;
    fVar190 = fVar263 * fVar263 * fVar263;
    auVar44._12_4_ = fVar190;
    fVar191 = fVar255 * fVar255 * fVar255;
    auVar44._16_4_ = fVar191;
    fVar192 = fVar249 * fVar249 * fVar249;
    auVar44._20_4_ = fVar192;
    fVar193 = fVar264 * fVar264 * fVar264;
    auVar44._24_4_ = fVar193;
    auVar44._28_4_ = fVar269;
    auVar117 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar118 = vmulps_avx512vl(auVar44,auVar117);
    fVar252 = auVar107._0_4_;
    fVar254 = auVar107._4_4_;
    fVar262 = auVar107._8_4_;
    fVar230 = auVar107._12_4_;
    fVar212 = fVar252 * fVar252 * fVar252;
    fVar227 = fVar254 * fVar254 * fVar254;
    fVar228 = fVar262 * fVar262 * fVar262;
    fVar229 = fVar230 * fVar230 * fVar230;
    auVar187._28_36_ = auVar226._28_36_;
    auVar187._0_28_ = ZEXT1628(CONCAT412(fVar229,CONCAT48(fVar228,CONCAT44(fVar227,fVar212))));
    auVar226._0_4_ = fVar252 * fVar168;
    auVar226._4_4_ = fVar254 * fVar253;
    auVar226._8_4_ = fVar262 * fVar261;
    auVar226._12_4_ = fVar230 * fVar263;
    auVar226._16_4_ = fVar255 * 0.0;
    auVar226._20_4_ = fVar249 * 0.0;
    auVar226._28_36_ = auVar266._28_36_;
    auVar226._24_4_ = fVar264 * 0.0;
    auVar120 = vmulps_avx512vl(auVar187._0_32_,auVar117);
    fVar269 = auVar120._28_4_ + fVar269;
    auVar45._4_4_ = fVar188 * 0.16666667;
    auVar45._0_4_ = fVar169 * 0.16666667;
    auVar45._8_4_ = fVar189 * 0.16666667;
    auVar45._12_4_ = fVar190 * 0.16666667;
    auVar45._16_4_ = fVar191 * 0.16666667;
    auVar45._20_4_ = fVar192 * 0.16666667;
    auVar45._24_4_ = fVar193 * 0.16666667;
    auVar45._28_4_ = fVar269;
    auVar46._4_4_ =
         (auVar226._4_4_ * fVar253 * 12.0 + auVar226._4_4_ * fVar254 * 6.0 +
         fVar227 + auVar118._4_4_) * 0.16666667;
    auVar46._0_4_ =
         (auVar226._0_4_ * fVar168 * 12.0 + auVar226._0_4_ * fVar252 * 6.0 +
         fVar212 + auVar118._0_4_) * 0.16666667;
    auVar46._8_4_ =
         (auVar226._8_4_ * fVar261 * 12.0 + auVar226._8_4_ * fVar262 * 6.0 +
         fVar228 + auVar118._8_4_) * 0.16666667;
    auVar46._12_4_ =
         (auVar226._12_4_ * fVar263 * 12.0 + auVar226._12_4_ * fVar230 * 6.0 +
         fVar229 + auVar118._12_4_) * 0.16666667;
    auVar46._16_4_ =
         (auVar226._16_4_ * fVar255 * 12.0 + auVar226._16_4_ * 0.0 * 6.0 + auVar118._16_4_ + 0.0) *
         0.16666667;
    auVar46._20_4_ =
         (auVar226._20_4_ * fVar249 * 12.0 + auVar226._20_4_ * 0.0 * 6.0 + auVar118._20_4_ + 0.0) *
         0.16666667;
    auVar46._24_4_ =
         (auVar226._24_4_ * fVar264 * 12.0 + auVar226._24_4_ * 0.0 * 6.0 + auVar118._24_4_ + 0.0) *
         0.16666667;
    auVar46._28_4_ = auVar271._28_4_;
    auVar47._4_4_ =
         (auVar120._4_4_ + fVar188 +
         auVar226._4_4_ * fVar254 * 12.0 + auVar226._4_4_ * fVar253 * 6.0) * 0.16666667;
    auVar47._0_4_ =
         (auVar120._0_4_ + fVar169 +
         auVar226._0_4_ * fVar252 * 12.0 + auVar226._0_4_ * fVar168 * 6.0) * 0.16666667;
    auVar47._8_4_ =
         (auVar120._8_4_ + fVar189 +
         auVar226._8_4_ * fVar262 * 12.0 + auVar226._8_4_ * fVar261 * 6.0) * 0.16666667;
    auVar47._12_4_ =
         (auVar120._12_4_ + fVar190 +
         auVar226._12_4_ * fVar230 * 12.0 + auVar226._12_4_ * fVar263 * 6.0) * 0.16666667;
    auVar47._16_4_ =
         (auVar120._16_4_ + fVar191 + auVar226._16_4_ * 0.0 * 12.0 + auVar226._16_4_ * fVar255 * 6.0
         ) * 0.16666667;
    auVar47._20_4_ =
         (auVar120._20_4_ + fVar192 + auVar226._20_4_ * 0.0 * 12.0 + auVar226._20_4_ * fVar249 * 6.0
         ) * 0.16666667;
    auVar47._24_4_ =
         (auVar120._24_4_ + fVar193 + auVar226._24_4_ * 0.0 * 12.0 + auVar226._24_4_ * fVar264 * 6.0
         ) * 0.16666667;
    auVar47._28_4_ = auVar275._28_4_;
    auVar48._28_4_ = fVar269 + auVar271._28_4_ + auVar250._28_4_;
    auVar48._0_28_ =
         ZEXT1628(CONCAT412(fVar229 * 0.16666667,
                            CONCAT48(fVar228 * 0.16666667,
                                     CONCAT44(fVar227 * 0.16666667,fVar212 * 0.16666667))));
    auVar87._4_4_ = uStack_69c;
    auVar87._0_4_ = local_6a0;
    auVar87._8_4_ = uStack_698;
    auVar87._12_4_ = uStack_694;
    auVar87._16_4_ = uStack_690;
    auVar87._20_4_ = uStack_68c;
    auVar87._24_4_ = uStack_688;
    auVar87._28_4_ = uStack_684;
    auVar118 = vmulps_avx512vl(auVar87,auVar48);
    auVar120 = vmulps_avx512vl(local_6c0,auVar48);
    auVar121 = vmulps_avx512vl(local_6e0,auVar48);
    auVar122 = vmulps_avx512vl(local_700,auVar48);
    auVar88._4_4_ = uStack_61c;
    auVar88._0_4_ = local_620;
    auVar88._8_4_ = uStack_618;
    auVar88._12_4_ = uStack_614;
    auVar88._16_4_ = uStack_610;
    auVar88._20_4_ = uStack_60c;
    auVar88._24_4_ = uStack_608;
    auVar88._28_4_ = uStack_604;
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar47,auVar88);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar47,local_640);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar47,local_660);
    auVar122 = vfmadd231ps_avx512vl(auVar122,local_680,auVar47);
    auVar89._4_4_ = uStack_59c;
    auVar89._0_4_ = local_5a0;
    auVar89._8_4_ = uStack_598;
    auVar89._12_4_ = uStack_594;
    auVar89._16_4_ = uStack_590;
    auVar89._20_4_ = uStack_58c;
    auVar89._24_4_ = uStack_588;
    auVar89._28_4_ = uStack_584;
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar46,auVar89);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar46,local_5c0);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar46,local_5e0);
    auVar122 = vfmadd231ps_avx512vl(auVar122,local_600,auVar46);
    auVar90._4_4_ = fStack_51c;
    auVar90._0_4_ = local_520;
    auVar90._8_4_ = fStack_518;
    auVar90._12_4_ = fStack_514;
    auVar90._16_4_ = fStack_510;
    auVar90._20_4_ = fStack_50c;
    auVar90._24_4_ = fStack_508;
    auVar90._28_4_ = fStack_504;
    auVar265 = vfmadd231ps_fma(auVar118,auVar45,auVar90);
    auVar104 = vfmadd231ps_fma(auVar120,auVar45,local_540);
    auVar6 = vfmadd231ps_fma(auVar121,auVar45,local_560);
    auVar108 = vfmadd231ps_fma(auVar122,local_580,auVar45);
    auVar118 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar120 = vxorps_avx512vl(auVar119,auVar118);
    auVar121 = vxorps_avx512vl(ZEXT1632(auVar107),auVar118);
    auVar245._0_4_ = auVar121._0_4_ * fVar252;
    auVar245._4_4_ = auVar121._4_4_ * fVar254;
    auVar245._8_4_ = auVar121._8_4_ * fVar262;
    auVar245._12_4_ = auVar121._12_4_ * fVar230;
    auVar245._16_4_ = auVar121._16_4_ * 0.0;
    auVar245._20_4_ = auVar121._20_4_ * 0.0;
    auVar245._24_4_ = auVar121._24_4_ * 0.0;
    auVar245._28_4_ = 0;
    auVar122 = vmulps_avx512vl(auVar226._0_32_,auVar117);
    auVar118 = vsubps_avx(auVar245,auVar122);
    auVar49._4_4_ = auVar120._4_4_ * fVar253 * 0.5;
    auVar49._0_4_ = auVar120._0_4_ * fVar168 * 0.5;
    auVar49._8_4_ = auVar120._8_4_ * fVar261 * 0.5;
    auVar49._12_4_ = auVar120._12_4_ * fVar263 * 0.5;
    auVar49._16_4_ = auVar120._16_4_ * fVar255 * 0.5;
    auVar49._20_4_ = auVar120._20_4_ * fVar249 * 0.5;
    auVar49._24_4_ = auVar120._24_4_ * fVar264 * 0.5;
    auVar49._28_4_ = auVar119._28_4_;
    auVar50._4_4_ = auVar118._4_4_ * 0.5;
    auVar50._0_4_ = auVar118._0_4_ * 0.5;
    auVar50._8_4_ = auVar118._8_4_ * 0.5;
    auVar50._12_4_ = auVar118._12_4_ * 0.5;
    auVar50._16_4_ = auVar118._16_4_ * 0.5;
    auVar50._20_4_ = auVar118._20_4_ * 0.5;
    auVar50._24_4_ = auVar118._24_4_ * 0.5;
    auVar50._28_4_ = auVar118._28_4_;
    auVar51._4_4_ = (fVar253 * fVar253 + auVar122._4_4_) * 0.5;
    auVar51._0_4_ = (fVar168 * fVar168 + auVar122._0_4_) * 0.5;
    auVar51._8_4_ = (fVar261 * fVar261 + auVar122._8_4_) * 0.5;
    auVar51._12_4_ = (fVar263 * fVar263 + auVar122._12_4_) * 0.5;
    auVar51._16_4_ = (fVar255 * fVar255 + auVar122._16_4_) * 0.5;
    auVar51._20_4_ = (fVar249 * fVar249 + auVar122._20_4_) * 0.5;
    auVar51._24_4_ = (fVar264 * fVar264 + auVar122._24_4_) * 0.5;
    auVar51._28_4_ = auVar259._28_4_ + auVar122._28_4_;
    auVar52._28_4_ = auVar260._28_4_;
    auVar52._0_28_ =
         ZEXT1628(CONCAT412(fVar230 * fVar230 * 0.5,
                            CONCAT48(fVar262 * fVar262 * 0.5,
                                     CONCAT44(fVar254 * fVar254 * 0.5,fVar252 * fVar252 * 0.5))));
    auVar118 = vmulps_avx512vl(auVar87,auVar52);
    auVar119 = vmulps_avx512vl(local_6c0,auVar52);
    auVar120 = vmulps_avx512vl(local_6e0,auVar52);
    auVar122 = vmulps_avx512vl(local_700,auVar52);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar51,auVar88);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar51,local_640);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar51,local_660);
    auVar122 = vfmadd231ps_avx512vl(auVar122,local_680,auVar51);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar50,auVar89);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar50,local_5c0);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar50,local_5e0);
    auVar122 = vfmadd231ps_avx512vl(auVar122,local_600,auVar50);
    auVar107 = vfmadd231ps_fma(auVar118,auVar49,auVar90);
    auVar105 = vfmadd231ps_fma(auVar119,auVar49,local_540);
    auVar276 = vfmadd231ps_fma(auVar120,auVar49,local_560);
    auVar110 = vfmadd231ps_fma(auVar122,local_580,auVar49);
    auVar53._4_4_ = auVar107._4_4_ * fVar213;
    auVar53._0_4_ = auVar107._0_4_ * fVar213;
    auVar53._8_4_ = auVar107._8_4_ * fVar213;
    auVar53._12_4_ = auVar107._12_4_ * fVar213;
    auVar53._16_4_ = fVar213 * 0.0;
    auVar53._20_4_ = fVar213 * 0.0;
    auVar53._24_4_ = fVar213 * 0.0;
    auVar53._28_4_ = auVar121._28_4_;
    auVar270._0_4_ = auVar105._0_4_ * fVar213;
    auVar270._4_4_ = auVar105._4_4_ * fVar213;
    auVar270._8_4_ = auVar105._8_4_ * fVar213;
    auVar270._12_4_ = auVar105._12_4_ * fVar213;
    auVar270._16_4_ = fVar213 * 0.0;
    auVar270._20_4_ = fVar213 * 0.0;
    auVar270._24_4_ = fVar213 * 0.0;
    auVar270._28_4_ = 0;
    auVar271 = ZEXT3264(auVar270);
    auVar274._0_4_ = auVar276._0_4_ * fVar213;
    auVar274._4_4_ = auVar276._4_4_ * fVar213;
    auVar274._8_4_ = auVar276._8_4_ * fVar213;
    auVar274._12_4_ = auVar276._12_4_ * fVar213;
    auVar274._16_4_ = fVar213 * 0.0;
    auVar274._20_4_ = fVar213 * 0.0;
    auVar274._24_4_ = fVar213 * 0.0;
    auVar274._28_4_ = 0;
    auVar275 = ZEXT3264(auVar274);
    fVar168 = auVar110._0_4_ * fVar213;
    fVar252 = auVar110._4_4_ * fVar213;
    auVar54._4_4_ = fVar252;
    auVar54._0_4_ = fVar168;
    fVar253 = auVar110._8_4_ * fVar213;
    auVar54._8_4_ = fVar253;
    fVar254 = auVar110._12_4_ * fVar213;
    auVar54._12_4_ = fVar254;
    auVar54._16_4_ = fVar213 * 0.0;
    auVar54._20_4_ = fVar213 * 0.0;
    auVar54._24_4_ = fVar213 * 0.0;
    auVar54._28_4_ = fStack_504;
    auVar107 = vxorps_avx512vl(auVar278._0_16_,auVar278._0_16_);
    auVar122 = vpermt2ps_avx512vl(ZEXT1632(auVar265),_DAT_0205fd20,ZEXT1632(auVar107));
    auVar259 = ZEXT3264(auVar122);
    auVar123 = vpermt2ps_avx512vl(ZEXT1632(auVar104),_DAT_0205fd20,ZEXT1632(auVar107));
    auVar260 = ZEXT3264(auVar123);
    auVar120 = ZEXT1632(auVar107);
    auVar124 = vpermt2ps_avx512vl(ZEXT1632(auVar6),_DAT_0205fd20,auVar120);
    auVar266 = ZEXT3264(auVar124);
    auVar246._0_4_ = fVar168 + auVar108._0_4_;
    auVar246._4_4_ = fVar252 + auVar108._4_4_;
    auVar246._8_4_ = fVar253 + auVar108._8_4_;
    auVar246._12_4_ = fVar254 + auVar108._12_4_;
    auVar246._16_4_ = fVar213 * 0.0 + 0.0;
    auVar246._20_4_ = fVar213 * 0.0 + 0.0;
    auVar246._24_4_ = fVar213 * 0.0 + 0.0;
    auVar246._28_4_ = fStack_504 + 0.0;
    auVar118 = vmaxps_avx(ZEXT1632(auVar108),auVar246);
    auVar119 = vminps_avx(ZEXT1632(auVar108),auVar246);
    auVar125 = vpermt2ps_avx512vl(ZEXT1632(auVar108),_DAT_0205fd20,auVar120);
    auVar115 = vpermt2ps_avx512vl(auVar53,_DAT_0205fd20,auVar120);
    auVar126 = vpermt2ps_avx512vl(auVar270,_DAT_0205fd20,auVar120);
    auVar138 = ZEXT1632(auVar107);
    auVar127 = vpermt2ps_avx512vl(auVar274,_DAT_0205fd20,auVar138);
    auVar250 = ZEXT3264(auVar127);
    auVar120 = vpermt2ps_avx512vl(auVar54,_DAT_0205fd20,auVar138);
    auVar113 = vsubps_avx512vl(auVar125,auVar120);
    auVar120 = vsubps_avx(auVar122,ZEXT1632(auVar265));
    auVar121 = vsubps_avx(auVar123,ZEXT1632(auVar104));
    local_920 = vsubps_avx512vl(auVar124,ZEXT1632(auVar6));
    auVar114 = vmulps_avx512vl(auVar121,auVar274);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar270,local_920);
    auVar128 = vmulps_avx512vl(local_920,auVar53);
    auVar128 = vfmsub231ps_avx512vl(auVar128,auVar274,auVar120);
    auVar129 = vmulps_avx512vl(auVar120,auVar270);
    auVar129 = vfmsub231ps_avx512vl(auVar129,auVar53,auVar121);
    auVar129 = vmulps_avx512vl(auVar129,auVar129);
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar128,auVar128);
    auVar114 = vfmadd231ps_avx512vl(auVar128,auVar114,auVar114);
    auVar128 = vmulps_avx512vl(local_920,local_920);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar121,auVar121);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar120,auVar120);
    auVar129 = vrcp14ps_avx512vl(auVar128);
    auVar130 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar131 = vfnmadd213ps_avx512vl(auVar129,auVar128,auVar130);
    auVar129 = vfmadd132ps_avx512vl(auVar131,auVar129,auVar129);
    auVar114 = vmulps_avx512vl(auVar114,auVar129);
    auVar131 = vmulps_avx512vl(auVar121,auVar127);
    auVar131 = vfmsub231ps_avx512vl(auVar131,auVar126,local_920);
    auVar132 = vmulps_avx512vl(local_920,auVar115);
    auVar132 = vfmsub231ps_avx512vl(auVar132,auVar127,auVar120);
    auVar133 = vmulps_avx512vl(auVar120,auVar126);
    auVar133 = vfmsub231ps_avx512vl(auVar133,auVar115,auVar121);
    auVar133 = vmulps_avx512vl(auVar133,auVar133);
    auVar132 = vfmadd231ps_avx512vl(auVar133,auVar132,auVar132);
    auVar131 = vfmadd231ps_avx512vl(auVar132,auVar131,auVar131);
    auVar129 = vmulps_avx512vl(auVar131,auVar129);
    auVar114 = vmaxps_avx512vl(auVar114,auVar129);
    auVar114 = vsqrtps_avx512vl(auVar114);
    auVar129 = vmaxps_avx512vl(auVar113,auVar125);
    auVar118 = vmaxps_avx512vl(auVar118,auVar129);
    auVar129 = vaddps_avx512vl(auVar114,auVar118);
    auVar118 = vminps_avx512vl(auVar113,auVar125);
    auVar118 = vminps_avx(auVar119,auVar118);
    auVar118 = vsubps_avx512vl(auVar118,auVar114);
    auVar143._8_4_ = 0x3f800002;
    auVar143._0_8_ = 0x3f8000023f800002;
    auVar143._12_4_ = 0x3f800002;
    auVar143._16_4_ = 0x3f800002;
    auVar143._20_4_ = 0x3f800002;
    auVar143._24_4_ = 0x3f800002;
    auVar143._28_4_ = 0x3f800002;
    auVar119 = vmulps_avx512vl(auVar129,auVar143);
    auVar144._8_4_ = 0x3f7ffffc;
    auVar144._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar144._12_4_ = 0x3f7ffffc;
    auVar144._16_4_ = 0x3f7ffffc;
    auVar144._20_4_ = 0x3f7ffffc;
    auVar144._24_4_ = 0x3f7ffffc;
    auVar144._28_4_ = 0x3f7ffffc;
    auVar125 = vmulps_avx512vl(auVar118,auVar144);
    auVar55._4_4_ = auVar119._4_4_ * auVar119._4_4_;
    auVar55._0_4_ = auVar119._0_4_ * auVar119._0_4_;
    auVar55._8_4_ = auVar119._8_4_ * auVar119._8_4_;
    auVar55._12_4_ = auVar119._12_4_ * auVar119._12_4_;
    auVar55._16_4_ = auVar119._16_4_ * auVar119._16_4_;
    auVar55._20_4_ = auVar119._20_4_ * auVar119._20_4_;
    auVar55._24_4_ = auVar119._24_4_ * auVar119._24_4_;
    auVar55._28_4_ = auVar125._28_4_;
    auVar118 = vrsqrt14ps_avx512vl(auVar128);
    auVar145._8_4_ = 0xbf000000;
    auVar145._0_8_ = 0xbf000000bf000000;
    auVar145._12_4_ = 0xbf000000;
    auVar145._16_4_ = 0xbf000000;
    auVar145._20_4_ = 0xbf000000;
    auVar145._24_4_ = 0xbf000000;
    auVar145._28_4_ = 0xbf000000;
    auVar119 = vmulps_avx512vl(auVar128,auVar145);
    auVar56._4_4_ = auVar118._4_4_ * auVar119._4_4_;
    auVar56._0_4_ = auVar118._0_4_ * auVar119._0_4_;
    auVar56._8_4_ = auVar118._8_4_ * auVar119._8_4_;
    auVar56._12_4_ = auVar118._12_4_ * auVar119._12_4_;
    auVar56._16_4_ = auVar118._16_4_ * auVar119._16_4_;
    auVar56._20_4_ = auVar118._20_4_ * auVar119._20_4_;
    auVar56._24_4_ = auVar118._24_4_ * auVar119._24_4_;
    auVar56._28_4_ = auVar119._28_4_;
    auVar119 = vmulps_avx512vl(auVar118,auVar118);
    auVar119 = vmulps_avx512vl(auVar119,auVar56);
    auVar32._8_4_ = 0x3fc00000;
    auVar32._0_8_ = 0x3fc000003fc00000;
    auVar32._12_4_ = 0x3fc00000;
    auVar32._16_4_ = 0x3fc00000;
    auVar32._20_4_ = 0x3fc00000;
    auVar32._24_4_ = 0x3fc00000;
    auVar32._28_4_ = 0x3fc00000;
    auVar113 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar32);
    auVar57._4_4_ = auVar113._4_4_ * auVar120._4_4_;
    auVar57._0_4_ = auVar113._0_4_ * auVar120._0_4_;
    auVar57._8_4_ = auVar113._8_4_ * auVar120._8_4_;
    auVar57._12_4_ = auVar113._12_4_ * auVar120._12_4_;
    auVar57._16_4_ = auVar113._16_4_ * auVar120._16_4_;
    auVar57._20_4_ = auVar113._20_4_ * auVar120._20_4_;
    auVar57._24_4_ = auVar113._24_4_ * auVar120._24_4_;
    auVar57._28_4_ = auVar118._28_4_;
    auVar118 = vmulps_avx512vl(auVar121,auVar113);
    auVar119 = vmulps_avx512vl(local_920,auVar113);
    local_b60 = ZEXT1632(auVar265);
    auVar114 = vsubps_avx512vl(auVar138,local_b60);
    auVar224 = ZEXT1632(auVar104);
    auVar128 = vsubps_avx512vl(auVar138,auVar224);
    local_ac0 = ZEXT1632(auVar6);
    auVar129 = vsubps_avx512vl(auVar138,local_ac0);
    auVar131 = vmulps_avx512vl(auVar277._0_32_,auVar129);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar278._0_32_,auVar128);
    auVar131 = vfmadd231ps_avx512vl(auVar131,local_7e0,auVar114);
    auVar132 = vmulps_avx512vl(auVar129,auVar129);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar128,auVar128);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar114,auVar114);
    auVar133 = vmulps_avx512vl(auVar277._0_32_,auVar119);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar118,auVar278._0_32_);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar57,local_7e0);
    auVar119 = vmulps_avx512vl(auVar129,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar128,auVar118);
    auVar134 = vfmadd231ps_avx512vl(auVar118,auVar114,auVar57);
    auVar135 = vmulps_avx512vl(auVar133,auVar133);
    auVar118 = vsubps_avx(local_720,auVar135);
    auVar119 = vmulps_avx512vl(auVar133,auVar134);
    auVar119 = vsubps_avx512vl(auVar131,auVar119);
    auVar131 = vaddps_avx512vl(auVar119,auVar119);
    auVar119 = vmulps_avx512vl(auVar134,auVar134);
    auVar132 = vsubps_avx512vl(auVar132,auVar119);
    auVar119 = vsubps_avx(auVar132,auVar55);
    auVar136 = vmulps_avx512vl(auVar131,auVar131);
    auVar117 = vmulps_avx512vl(auVar118,auVar117);
    auVar137 = vmulps_avx512vl(auVar117,auVar119);
    auVar137 = vsubps_avx512vl(auVar136,auVar137);
    uVar102 = vcmpps_avx512vl(auVar137,auVar138,5);
    bVar91 = (byte)uVar102;
    if (bVar91 == 0) {
      auVar140 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar141 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar137 = vsqrtps_avx512vl(auVar137);
      auVar138 = vaddps_avx512vl(auVar118,auVar118);
      auVar139 = vrcp14ps_avx512vl(auVar138);
      auVar130 = vfnmadd213ps_avx512vl(auVar138,auVar139,auVar130);
      auVar130 = vfmadd132ps_avx512vl(auVar130,auVar139,auVar139);
      auVar33._8_4_ = 0x80000000;
      auVar33._0_8_ = 0x8000000080000000;
      auVar33._12_4_ = 0x80000000;
      auVar33._16_4_ = 0x80000000;
      auVar33._20_4_ = 0x80000000;
      auVar33._24_4_ = 0x80000000;
      auVar33._28_4_ = 0x80000000;
      auVar138 = vxorps_avx512vl(auVar131,auVar33);
      auVar138 = vsubps_avx512vl(auVar138,auVar137);
      auVar138 = vmulps_avx512vl(auVar138,auVar130);
      auVar137 = vsubps_avx512vl(auVar137,auVar131);
      auVar137 = vmulps_avx512vl(auVar137,auVar130);
      auVar130 = vfmadd213ps_avx512vl(auVar133,auVar138,auVar134);
      local_840 = vmulps_avx512vl(auVar113,auVar130);
      auVar130 = vfmadd213ps_avx512vl(auVar133,auVar137,auVar134);
      local_860 = vmulps_avx512vl(auVar113,auVar130);
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar130 = vblendmps_avx512vl(auVar130,auVar138);
      auVar140._0_4_ =
           (uint)(bVar91 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar91 & 1) * local_860._0_4_;
      bVar12 = (bool)((byte)(uVar102 >> 1) & 1);
      auVar140._4_4_ = (uint)bVar12 * auVar130._4_4_ | (uint)!bVar12 * local_860._4_4_;
      bVar12 = (bool)((byte)(uVar102 >> 2) & 1);
      auVar140._8_4_ = (uint)bVar12 * auVar130._8_4_ | (uint)!bVar12 * local_860._8_4_;
      bVar12 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar140._12_4_ = (uint)bVar12 * auVar130._12_4_ | (uint)!bVar12 * local_860._12_4_;
      bVar12 = (bool)((byte)(uVar102 >> 4) & 1);
      auVar140._16_4_ = (uint)bVar12 * auVar130._16_4_ | (uint)!bVar12 * local_860._16_4_;
      bVar12 = (bool)((byte)(uVar102 >> 5) & 1);
      auVar140._20_4_ = (uint)bVar12 * auVar130._20_4_ | (uint)!bVar12 * local_860._20_4_;
      bVar12 = (bool)((byte)(uVar102 >> 6) & 1);
      auVar140._24_4_ = (uint)bVar12 * auVar130._24_4_ | (uint)!bVar12 * local_860._24_4_;
      bVar12 = SUB81(uVar102 >> 7,0);
      auVar140._28_4_ = (uint)bVar12 * auVar130._28_4_ | (uint)!bVar12 * local_860._28_4_;
      auVar236._8_4_ = 0xff800000;
      auVar236._0_8_ = 0xff800000ff800000;
      auVar236._12_4_ = 0xff800000;
      auVar236._16_4_ = 0xff800000;
      auVar236._20_4_ = 0xff800000;
      auVar236._24_4_ = 0xff800000;
      auVar236._28_4_ = 0xff800000;
      auVar130 = vblendmps_avx512vl(auVar236,auVar137);
      auVar141._0_4_ =
           (uint)(bVar91 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar137._0_4_;
      bVar12 = (bool)((byte)(uVar102 >> 1) & 1);
      auVar141._4_4_ = (uint)bVar12 * auVar130._4_4_ | (uint)!bVar12 * auVar137._4_4_;
      bVar12 = (bool)((byte)(uVar102 >> 2) & 1);
      auVar141._8_4_ = (uint)bVar12 * auVar130._8_4_ | (uint)!bVar12 * auVar137._8_4_;
      bVar12 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar141._12_4_ = (uint)bVar12 * auVar130._12_4_ | (uint)!bVar12 * auVar137._12_4_;
      bVar12 = (bool)((byte)(uVar102 >> 4) & 1);
      auVar141._16_4_ = (uint)bVar12 * auVar130._16_4_ | (uint)!bVar12 * auVar137._16_4_;
      bVar12 = (bool)((byte)(uVar102 >> 5) & 1);
      auVar141._20_4_ = (uint)bVar12 * auVar130._20_4_ | (uint)!bVar12 * auVar137._20_4_;
      bVar12 = (bool)((byte)(uVar102 >> 6) & 1);
      auVar141._24_4_ = (uint)bVar12 * auVar130._24_4_ | (uint)!bVar12 * auVar137._24_4_;
      bVar12 = SUB81(uVar102 >> 7,0);
      auVar141._28_4_ = (uint)bVar12 * auVar130._28_4_ | (uint)!bVar12 * auVar137._28_4_;
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar135,auVar137);
      auVar130 = vmaxps_avx512vl(local_800,auVar137);
      auVar34._8_4_ = 0x36000000;
      auVar34._0_8_ = 0x3600000036000000;
      auVar34._12_4_ = 0x36000000;
      auVar34._16_4_ = 0x36000000;
      auVar34._20_4_ = 0x36000000;
      auVar34._24_4_ = 0x36000000;
      auVar34._28_4_ = 0x36000000;
      auVar130 = vmulps_avx512vl(auVar130,auVar34);
      vandps_avx512vl(auVar118,auVar137);
      uVar98 = vcmpps_avx512vl(auVar130,auVar130,1);
      uVar102 = uVar102 & uVar98;
      bVar97 = (byte)uVar102;
      if (bVar97 != 0) {
        uVar98 = vcmpps_avx512vl(auVar119,_DAT_02020f00,2);
        auVar248._8_4_ = 0xff800000;
        auVar248._0_8_ = 0xff800000ff800000;
        auVar248._12_4_ = 0xff800000;
        auVar248._16_4_ = 0xff800000;
        auVar248._20_4_ = 0xff800000;
        auVar248._24_4_ = 0xff800000;
        auVar248._28_4_ = 0xff800000;
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar137 = vblendmps_avx512vl(auVar119,auVar248);
        bVar94 = (byte)uVar98;
        uVar103 = (uint)(bVar94 & 1) * auVar137._0_4_ | (uint)!(bool)(bVar94 & 1) * auVar130._0_4_;
        bVar12 = (bool)((byte)(uVar98 >> 1) & 1);
        uVar161 = (uint)bVar12 * auVar137._4_4_ | (uint)!bVar12 * auVar130._4_4_;
        bVar12 = (bool)((byte)(uVar98 >> 2) & 1);
        uVar162 = (uint)bVar12 * auVar137._8_4_ | (uint)!bVar12 * auVar130._8_4_;
        bVar12 = (bool)((byte)(uVar98 >> 3) & 1);
        uVar163 = (uint)bVar12 * auVar137._12_4_ | (uint)!bVar12 * auVar130._12_4_;
        bVar12 = (bool)((byte)(uVar98 >> 4) & 1);
        uVar164 = (uint)bVar12 * auVar137._16_4_ | (uint)!bVar12 * auVar130._16_4_;
        bVar12 = (bool)((byte)(uVar98 >> 5) & 1);
        uVar165 = (uint)bVar12 * auVar137._20_4_ | (uint)!bVar12 * auVar130._20_4_;
        bVar12 = (bool)((byte)(uVar98 >> 6) & 1);
        uVar166 = (uint)bVar12 * auVar137._24_4_ | (uint)!bVar12 * auVar130._24_4_;
        bVar12 = SUB81(uVar98 >> 7,0);
        uVar167 = (uint)bVar12 * auVar137._28_4_ | (uint)!bVar12 * auVar130._28_4_;
        auVar140._0_4_ = (bVar97 & 1) * uVar103 | !(bool)(bVar97 & 1) * auVar140._0_4_;
        bVar12 = (bool)((byte)(uVar102 >> 1) & 1);
        auVar140._4_4_ = bVar12 * uVar161 | !bVar12 * auVar140._4_4_;
        bVar12 = (bool)((byte)(uVar102 >> 2) & 1);
        auVar140._8_4_ = bVar12 * uVar162 | !bVar12 * auVar140._8_4_;
        bVar12 = (bool)((byte)(uVar102 >> 3) & 1);
        auVar140._12_4_ = bVar12 * uVar163 | !bVar12 * auVar140._12_4_;
        bVar12 = (bool)((byte)(uVar102 >> 4) & 1);
        auVar140._16_4_ = bVar12 * uVar164 | !bVar12 * auVar140._16_4_;
        bVar12 = (bool)((byte)(uVar102 >> 5) & 1);
        auVar140._20_4_ = bVar12 * uVar165 | !bVar12 * auVar140._20_4_;
        bVar12 = (bool)((byte)(uVar102 >> 6) & 1);
        auVar140._24_4_ = bVar12 * uVar166 | !bVar12 * auVar140._24_4_;
        bVar12 = SUB81(uVar102 >> 7,0);
        auVar140._28_4_ = bVar12 * uVar167 | !bVar12 * auVar140._28_4_;
        auVar119 = vblendmps_avx512vl(auVar248,auVar119);
        bVar12 = (bool)((byte)(uVar98 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar98 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar98 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar98 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar98 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar98 >> 6) & 1);
        bVar18 = SUB81(uVar98 >> 7,0);
        auVar141._0_4_ =
             (uint)(bVar97 & 1) *
             ((uint)(bVar94 & 1) * auVar119._0_4_ | !(bool)(bVar94 & 1) * uVar103) |
             !(bool)(bVar97 & 1) * auVar141._0_4_;
        bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
        auVar141._4_4_ =
             (uint)bVar101 * ((uint)bVar12 * auVar119._4_4_ | !bVar12 * uVar161) |
             !bVar101 * auVar141._4_4_;
        bVar12 = (bool)((byte)(uVar102 >> 2) & 1);
        auVar141._8_4_ =
             (uint)bVar12 * ((uint)bVar13 * auVar119._8_4_ | !bVar13 * uVar162) |
             !bVar12 * auVar141._8_4_;
        bVar12 = (bool)((byte)(uVar102 >> 3) & 1);
        auVar141._12_4_ =
             (uint)bVar12 * ((uint)bVar14 * auVar119._12_4_ | !bVar14 * uVar163) |
             !bVar12 * auVar141._12_4_;
        bVar12 = (bool)((byte)(uVar102 >> 4) & 1);
        auVar141._16_4_ =
             (uint)bVar12 * ((uint)bVar15 * auVar119._16_4_ | !bVar15 * uVar164) |
             !bVar12 * auVar141._16_4_;
        bVar12 = (bool)((byte)(uVar102 >> 5) & 1);
        auVar141._20_4_ =
             (uint)bVar12 * ((uint)bVar16 * auVar119._20_4_ | !bVar16 * uVar165) |
             !bVar12 * auVar141._20_4_;
        bVar12 = (bool)((byte)(uVar102 >> 6) & 1);
        auVar141._24_4_ =
             (uint)bVar12 * ((uint)bVar17 * auVar119._24_4_ | !bVar17 * uVar166) |
             !bVar12 * auVar141._24_4_;
        bVar12 = SUB81(uVar102 >> 7,0);
        auVar141._28_4_ =
             (uint)bVar12 * ((uint)bVar18 * auVar119._28_4_ | !bVar18 * uVar167) |
             !bVar12 * auVar141._28_4_;
        bVar91 = (~bVar97 | bVar94) & bVar91;
      }
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar187 = ZEXT3264(auVar130);
    if ((bVar91 & 0x7f) == 0) {
      auVar278 = ZEXT3264(local_ae0);
      auVar277 = ZEXT3264(local_b00);
    }
    else {
      fVar168 = *(float *)(ray + k * 4 + 0x200) - (float)local_9c0._0_4_;
      auVar237._4_4_ = fVar168;
      auVar237._0_4_ = fVar168;
      auVar237._8_4_ = fVar168;
      auVar237._12_4_ = fVar168;
      auVar237._16_4_ = fVar168;
      auVar237._20_4_ = fVar168;
      auVar237._24_4_ = fVar168;
      auVar237._28_4_ = fVar168;
      auVar137 = vminps_avx512vl(auVar237,auVar141);
      auVar86._4_4_ = fStack_73c;
      auVar86._0_4_ = local_740;
      auVar86._8_4_ = fStack_738;
      auVar86._12_4_ = fStack_734;
      auVar86._16_4_ = fStack_730;
      auVar86._20_4_ = fStack_72c;
      auVar86._24_4_ = fStack_728;
      auVar86._28_4_ = fStack_724;
      auVar119 = vmaxps_avx512vl(auVar86,auVar140);
      auVar129 = vmulps_avx512vl(auVar274,auVar129);
      auVar128 = vfmadd213ps_avx512vl(auVar128,auVar270,auVar129);
      auVar114 = vfmadd213ps_avx512vl(auVar114,auVar53,auVar128);
      auVar277 = ZEXT3264(local_b00);
      auVar128 = vmulps_avx512vl(local_b00,auVar274);
      auVar278 = ZEXT3264(local_ae0);
      auVar128 = vfmadd231ps_avx512vl(auVar128,local_ae0,auVar270);
      auVar128 = vfmadd231ps_avx512vl(auVar128,local_7e0,auVar53);
      auVar129 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar128,auVar129);
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar27 = vcmpps_avx512vl(auVar129,auVar138,1);
      auVar139 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar114 = vxorps_avx512vl(auVar114,auVar139);
      auVar142 = vrcp14ps_avx512vl(auVar128);
      auVar143 = vxorps_avx512vl(auVar128,auVar139);
      auVar144 = vfnmadd213ps_avx512vl(auVar142,auVar128,auVar130);
      auVar144 = vfmadd132ps_avx512vl(auVar144,auVar142,auVar142);
      auVar114 = vmulps_avx512vl(auVar144,auVar114);
      uVar29 = vcmpps_avx512vl(auVar128,auVar143,1);
      bVar97 = (byte)uVar27 | (byte)uVar29;
      auVar144 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar145 = vblendmps_avx512vl(auVar114,auVar144);
      auVar146._0_4_ =
           (uint)(bVar97 & 1) * auVar145._0_4_ | (uint)!(bool)(bVar97 & 1) * auVar142._0_4_;
      bVar12 = (bool)(bVar97 >> 1 & 1);
      auVar146._4_4_ = (uint)bVar12 * auVar145._4_4_ | (uint)!bVar12 * auVar142._4_4_;
      bVar12 = (bool)(bVar97 >> 2 & 1);
      auVar146._8_4_ = (uint)bVar12 * auVar145._8_4_ | (uint)!bVar12 * auVar142._8_4_;
      bVar12 = (bool)(bVar97 >> 3 & 1);
      auVar146._12_4_ = (uint)bVar12 * auVar145._12_4_ | (uint)!bVar12 * auVar142._12_4_;
      bVar12 = (bool)(bVar97 >> 4 & 1);
      auVar146._16_4_ = (uint)bVar12 * auVar145._16_4_ | (uint)!bVar12 * auVar142._16_4_;
      bVar12 = (bool)(bVar97 >> 5 & 1);
      auVar146._20_4_ = (uint)bVar12 * auVar145._20_4_ | (uint)!bVar12 * auVar142._20_4_;
      bVar12 = (bool)(bVar97 >> 6 & 1);
      auVar146._24_4_ = (uint)bVar12 * auVar145._24_4_ | (uint)!bVar12 * auVar142._24_4_;
      auVar146._28_4_ =
           (uint)(bVar97 >> 7) * auVar145._28_4_ | (uint)!(bool)(bVar97 >> 7) * auVar142._28_4_;
      auVar119 = vmaxps_avx(auVar119,auVar146);
      uVar29 = vcmpps_avx512vl(auVar128,auVar143,6);
      bVar97 = (byte)uVar27 | (byte)uVar29;
      auVar275 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar147._0_4_ = (uint)(bVar97 & 1) * 0x7f800000 | (uint)!(bool)(bVar97 & 1) * auVar114._0_4_;
      bVar12 = (bool)(bVar97 >> 1 & 1);
      auVar147._4_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar114._4_4_;
      bVar12 = (bool)(bVar97 >> 2 & 1);
      auVar147._8_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar114._8_4_;
      bVar12 = (bool)(bVar97 >> 3 & 1);
      auVar147._12_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar114._12_4_;
      bVar12 = (bool)(bVar97 >> 4 & 1);
      auVar147._16_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar114._16_4_;
      bVar12 = (bool)(bVar97 >> 5 & 1);
      auVar147._20_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar114._20_4_;
      bVar12 = (bool)(bVar97 >> 6 & 1);
      auVar147._24_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar114._24_4_;
      auVar147._28_4_ =
           (uint)(bVar97 >> 7) * 0x7f800000 | (uint)!(bool)(bVar97 >> 7) * auVar114._28_4_;
      auVar114 = vminps_avx(auVar137,auVar147);
      auVar107 = vxorps_avx512vl(auVar143._0_16_,auVar143._0_16_);
      auVar122 = vsubps_avx512vl(ZEXT1632(auVar107),auVar122);
      auVar123 = vsubps_avx512vl(ZEXT1632(auVar107),auVar123);
      auVar128 = ZEXT1632(auVar107);
      auVar124 = vsubps_avx512vl(auVar128,auVar124);
      auVar58._4_4_ = auVar124._4_4_ * auVar127._4_4_;
      auVar58._0_4_ = auVar124._0_4_ * auVar127._0_4_;
      auVar58._8_4_ = auVar124._8_4_ * auVar127._8_4_;
      auVar58._12_4_ = auVar124._12_4_ * auVar127._12_4_;
      auVar58._16_4_ = auVar124._16_4_ * auVar127._16_4_;
      auVar58._20_4_ = auVar124._20_4_ * auVar127._20_4_;
      auVar58._24_4_ = auVar124._24_4_ * auVar127._24_4_;
      auVar58._28_4_ = auVar124._28_4_;
      auVar123 = vfnmsub231ps_avx512vl(auVar58,auVar126,auVar123);
      auVar122 = vfnmadd231ps_avx512vl(auVar123,auVar115,auVar122);
      auVar123 = vmulps_avx512vl(local_b00,auVar127);
      auVar123 = vfnmsub231ps_avx512vl(auVar123,local_ae0,auVar126);
      auVar123 = vfnmadd231ps_avx512vl(auVar123,local_7e0,auVar115);
      vandps_avx512vl(auVar123,auVar129);
      uVar27 = vcmpps_avx512vl(auVar123,auVar138,1);
      auVar122 = vxorps_avx512vl(auVar122,auVar139);
      auVar124 = vrcp14ps_avx512vl(auVar123);
      auVar115 = vxorps_avx512vl(auVar123,auVar139);
      auVar127 = vfnmadd213ps_avx512vl(auVar124,auVar123,auVar130);
      auVar107 = vfmadd132ps_fma(auVar127,auVar124,auVar124);
      auVar271 = ZEXT1664(auVar107);
      fVar168 = auVar107._0_4_ * auVar122._0_4_;
      fVar252 = auVar107._4_4_ * auVar122._4_4_;
      auVar59._4_4_ = fVar252;
      auVar59._0_4_ = fVar168;
      fVar253 = auVar107._8_4_ * auVar122._8_4_;
      auVar59._8_4_ = fVar253;
      fVar254 = auVar107._12_4_ * auVar122._12_4_;
      auVar59._12_4_ = fVar254;
      fVar261 = auVar122._16_4_ * 0.0;
      auVar59._16_4_ = fVar261;
      fVar262 = auVar122._20_4_ * 0.0;
      auVar59._20_4_ = fVar262;
      fVar263 = auVar122._24_4_ * 0.0;
      auVar59._24_4_ = fVar263;
      auVar59._28_4_ = auVar122._28_4_;
      uVar29 = vcmpps_avx512vl(auVar123,auVar115,1);
      bVar97 = (byte)uVar27 | (byte)uVar29;
      auVar127 = vblendmps_avx512vl(auVar59,auVar144);
      auVar148._0_4_ =
           (uint)(bVar97 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar97 & 1) * auVar124._0_4_;
      bVar12 = (bool)(bVar97 >> 1 & 1);
      auVar148._4_4_ = (uint)bVar12 * auVar127._4_4_ | (uint)!bVar12 * auVar124._4_4_;
      bVar12 = (bool)(bVar97 >> 2 & 1);
      auVar148._8_4_ = (uint)bVar12 * auVar127._8_4_ | (uint)!bVar12 * auVar124._8_4_;
      bVar12 = (bool)(bVar97 >> 3 & 1);
      auVar148._12_4_ = (uint)bVar12 * auVar127._12_4_ | (uint)!bVar12 * auVar124._12_4_;
      bVar12 = (bool)(bVar97 >> 4 & 1);
      auVar148._16_4_ = (uint)bVar12 * auVar127._16_4_ | (uint)!bVar12 * auVar124._16_4_;
      bVar12 = (bool)(bVar97 >> 5 & 1);
      auVar148._20_4_ = (uint)bVar12 * auVar127._20_4_ | (uint)!bVar12 * auVar124._20_4_;
      bVar12 = (bool)(bVar97 >> 6 & 1);
      auVar148._24_4_ = (uint)bVar12 * auVar127._24_4_ | (uint)!bVar12 * auVar124._24_4_;
      auVar148._28_4_ =
           (uint)(bVar97 >> 7) * auVar127._28_4_ | (uint)!(bool)(bVar97 >> 7) * auVar124._28_4_;
      auVar266 = ZEXT3264(auVar148);
      _local_960 = vmaxps_avx(auVar119,auVar148);
      uVar29 = vcmpps_avx512vl(auVar123,auVar115,6);
      bVar97 = (byte)uVar27 | (byte)uVar29;
      auVar149._0_4_ = (uint)(bVar97 & 1) * 0x7f800000 | (uint)!(bool)(bVar97 & 1) * (int)fVar168;
      bVar12 = (bool)(bVar97 >> 1 & 1);
      auVar149._4_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar252;
      bVar12 = (bool)(bVar97 >> 2 & 1);
      auVar149._8_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar253;
      bVar12 = (bool)(bVar97 >> 3 & 1);
      auVar149._12_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar254;
      bVar12 = (bool)(bVar97 >> 4 & 1);
      auVar149._16_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar261;
      bVar12 = (bool)(bVar97 >> 5 & 1);
      auVar149._20_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar262;
      bVar12 = (bool)(bVar97 >> 6 & 1);
      auVar149._24_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar263;
      auVar149._28_4_ =
           (uint)(bVar97 >> 7) * 0x7f800000 | (uint)!(bool)(bVar97 >> 7) * auVar122._28_4_;
      auVar260 = ZEXT3264(auVar149);
      local_7a0 = vminps_avx(auVar114,auVar149);
      auVar259 = ZEXT3264(local_7a0);
      uVar27 = vcmpps_avx512vl(_local_960,local_7a0,2);
      bVar91 = bVar91 & 0x7f & (byte)uVar27;
      if (bVar91 != 0) {
        auVar122 = vmaxps_avx512vl(auVar128,auVar125);
        auVar119 = vminps_avx512vl(local_840,auVar130);
        auVar67 = ZEXT412(0);
        auVar266 = ZEXT1264(auVar67) << 0x20;
        auVar119 = vmaxps_avx(auVar119,ZEXT1232(auVar67) << 0x20);
        auVar123 = vminps_avx512vl(local_860,auVar130);
        auVar271 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar60._4_4_ = (auVar119._4_4_ + 1.0) * 0.125;
        auVar60._0_4_ = (auVar119._0_4_ + 0.0) * 0.125;
        auVar60._8_4_ = (auVar119._8_4_ + 2.0) * 0.125;
        auVar60._12_4_ = (auVar119._12_4_ + 3.0) * 0.125;
        auVar60._16_4_ = (auVar119._16_4_ + 4.0) * 0.125;
        auVar60._20_4_ = (auVar119._20_4_ + 5.0) * 0.125;
        auVar60._24_4_ = (auVar119._24_4_ + 6.0) * 0.125;
        auVar60._28_4_ = auVar119._28_4_ + 7.0;
        auVar107 = vfmadd213ps_fma(auVar60,local_aa0,auVar244);
        local_840 = ZEXT1632(auVar107);
        auVar119 = vmaxps_avx(auVar123,ZEXT1232(auVar67) << 0x20);
        auVar61._4_4_ = (auVar119._4_4_ + 1.0) * 0.125;
        auVar61._0_4_ = (auVar119._0_4_ + 0.0) * 0.125;
        auVar61._8_4_ = (auVar119._8_4_ + 2.0) * 0.125;
        auVar61._12_4_ = (auVar119._12_4_ + 3.0) * 0.125;
        auVar61._16_4_ = (auVar119._16_4_ + 4.0) * 0.125;
        auVar61._20_4_ = (auVar119._20_4_ + 5.0) * 0.125;
        auVar61._24_4_ = (auVar119._24_4_ + 6.0) * 0.125;
        auVar61._28_4_ = auVar119._28_4_ + 7.0;
        auVar107 = vfmadd213ps_fma(auVar61,local_aa0,auVar244);
        local_860 = ZEXT1632(auVar107);
        auVar238._0_4_ = auVar122._0_4_ * auVar122._0_4_;
        auVar238._4_4_ = auVar122._4_4_ * auVar122._4_4_;
        auVar238._8_4_ = auVar122._8_4_ * auVar122._8_4_;
        auVar238._12_4_ = auVar122._12_4_ * auVar122._12_4_;
        auVar238._16_4_ = auVar122._16_4_ * auVar122._16_4_;
        auVar238._20_4_ = auVar122._20_4_ * auVar122._20_4_;
        auVar238._24_4_ = auVar122._24_4_ * auVar122._24_4_;
        auVar238._28_4_ = 0;
        auVar119 = vsubps_avx(auVar132,auVar238);
        auVar117 = vmulps_avx512vl(auVar117,auVar119);
        auVar117 = vsubps_avx512vl(auVar136,auVar117);
        uVar27 = vcmpps_avx512vl(auVar117,ZEXT1232(auVar67) << 0x20,5);
        bVar97 = (byte)uVar27;
        if (bVar97 == 0) {
          auVar120 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar121 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar117 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar122 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar260 = ZEXT864(0) << 0x20;
          auVar150._8_4_ = 0x7f800000;
          auVar150._0_8_ = 0x7f8000007f800000;
          auVar150._12_4_ = 0x7f800000;
          auVar150._16_4_ = 0x7f800000;
          auVar150._20_4_ = 0x7f800000;
          auVar150._24_4_ = 0x7f800000;
          auVar150._28_4_ = 0x7f800000;
          auVar151._8_4_ = 0xff800000;
          auVar151._0_8_ = 0xff800000ff800000;
          auVar151._12_4_ = 0xff800000;
          auVar151._16_4_ = 0xff800000;
          auVar151._20_4_ = 0xff800000;
          auVar151._24_4_ = 0xff800000;
          auVar151._28_4_ = 0xff800000;
        }
        else {
          auVar104 = vxorps_avx512vl(auVar126._0_16_,auVar126._0_16_);
          uVar102 = vcmpps_avx512vl(auVar117,auVar128,5);
          auVar117 = vsqrtps_avx(auVar117);
          auVar247._0_4_ = auVar118._0_4_ + auVar118._0_4_;
          auVar247._4_4_ = auVar118._4_4_ + auVar118._4_4_;
          auVar247._8_4_ = auVar118._8_4_ + auVar118._8_4_;
          auVar247._12_4_ = auVar118._12_4_ + auVar118._12_4_;
          auVar247._16_4_ = auVar118._16_4_ + auVar118._16_4_;
          auVar247._20_4_ = auVar118._20_4_ + auVar118._20_4_;
          auVar247._24_4_ = auVar118._24_4_ + auVar118._24_4_;
          auVar247._28_4_ = auVar118._28_4_ + auVar118._28_4_;
          auVar122 = vrcp14ps_avx512vl(auVar247);
          auVar123 = vfnmadd213ps_avx512vl(auVar247,auVar122,auVar130);
          auVar107 = vfmadd132ps_fma(auVar123,auVar122,auVar122);
          auVar35._8_4_ = 0x80000000;
          auVar35._0_8_ = 0x8000000080000000;
          auVar35._12_4_ = 0x80000000;
          auVar35._16_4_ = 0x80000000;
          auVar35._20_4_ = 0x80000000;
          auVar35._24_4_ = 0x80000000;
          auVar35._28_4_ = 0x80000000;
          auVar122 = vxorps_avx512vl(auVar131,auVar35);
          auVar122 = vsubps_avx(auVar122,auVar117);
          auVar62._4_4_ = auVar122._4_4_ * auVar107._4_4_;
          auVar62._0_4_ = auVar122._0_4_ * auVar107._0_4_;
          auVar62._8_4_ = auVar122._8_4_ * auVar107._8_4_;
          auVar62._12_4_ = auVar122._12_4_ * auVar107._12_4_;
          auVar62._16_4_ = auVar122._16_4_ * 0.0;
          auVar62._20_4_ = auVar122._20_4_ * 0.0;
          auVar62._24_4_ = auVar122._24_4_ * 0.0;
          auVar62._28_4_ = 0x3e000000;
          auVar117 = vsubps_avx512vl(auVar117,auVar131);
          auVar63._4_4_ = auVar117._4_4_ * auVar107._4_4_;
          auVar63._0_4_ = auVar117._0_4_ * auVar107._0_4_;
          auVar63._8_4_ = auVar117._8_4_ * auVar107._8_4_;
          auVar63._12_4_ = auVar117._12_4_ * auVar107._12_4_;
          auVar63._16_4_ = auVar117._16_4_ * 0.0;
          auVar63._20_4_ = auVar117._20_4_ * 0.0;
          auVar63._24_4_ = auVar117._24_4_ * 0.0;
          auVar63._28_4_ = 0x7f800000;
          auVar275 = ZEXT3264(auVar63);
          auVar117 = vfmadd213ps_avx512vl(auVar133,auVar62,auVar134);
          auVar64._4_4_ = auVar113._4_4_ * auVar117._4_4_;
          auVar64._0_4_ = auVar113._0_4_ * auVar117._0_4_;
          auVar64._8_4_ = auVar113._8_4_ * auVar117._8_4_;
          auVar64._12_4_ = auVar113._12_4_ * auVar117._12_4_;
          auVar64._16_4_ = auVar113._16_4_ * auVar117._16_4_;
          auVar64._20_4_ = auVar113._20_4_ * auVar117._20_4_;
          auVar64._24_4_ = auVar113._24_4_ * auVar117._24_4_;
          auVar64._28_4_ = auVar122._28_4_;
          auVar117 = vmulps_avx512vl(local_7e0,auVar62);
          auVar122 = vmulps_avx512vl(local_ae0,auVar62);
          auVar123 = vmulps_avx512vl(local_b00,auVar62);
          auVar124 = vfmadd213ps_avx512vl(auVar120,auVar64,local_b60);
          auVar117 = vsubps_avx512vl(auVar117,auVar124);
          auVar124 = vfmadd213ps_avx512vl(auVar121,auVar64,auVar224);
          auVar122 = vsubps_avx512vl(auVar122,auVar124);
          auVar107 = vfmadd213ps_fma(auVar64,local_920,local_ac0);
          auVar123 = vsubps_avx(auVar123,ZEXT1632(auVar107));
          auVar260 = ZEXT3264(auVar123);
          auVar123 = vfmadd213ps_avx512vl(auVar133,auVar63,auVar134);
          auVar123 = vmulps_avx512vl(auVar113,auVar123);
          auVar124 = vmulps_avx512vl(local_7e0,auVar63);
          auVar125 = vmulps_avx512vl(local_ae0,auVar63);
          auVar115 = vmulps_avx512vl(local_b00,auVar63);
          auVar107 = vfmadd213ps_fma(auVar120,auVar123,local_b60);
          auVar120 = vsubps_avx(auVar124,ZEXT1632(auVar107));
          auVar266 = ZEXT3264(auVar120);
          auVar107 = vfmadd213ps_fma(auVar121,auVar123,auVar224);
          auVar120 = vsubps_avx512vl(auVar125,ZEXT1632(auVar107));
          auVar107 = vfmadd213ps_fma(local_920,auVar123,local_ac0);
          auVar121 = vsubps_avx512vl(auVar115,ZEXT1632(auVar107));
          auVar178._8_4_ = 0x7f800000;
          auVar178._0_8_ = 0x7f8000007f800000;
          auVar178._12_4_ = 0x7f800000;
          auVar178._16_4_ = 0x7f800000;
          auVar178._20_4_ = 0x7f800000;
          auVar178._24_4_ = 0x7f800000;
          auVar178._28_4_ = 0x7f800000;
          auVar123 = vblendmps_avx512vl(auVar178,auVar62);
          bVar12 = (bool)((byte)uVar102 & 1);
          auVar150._0_4_ = (uint)bVar12 * auVar123._0_4_ | (uint)!bVar12 * auVar265._0_4_;
          bVar12 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar150._4_4_ = (uint)bVar12 * auVar123._4_4_ | (uint)!bVar12 * auVar265._4_4_;
          bVar12 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar150._8_4_ = (uint)bVar12 * auVar123._8_4_ | (uint)!bVar12 * auVar265._8_4_;
          bVar12 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar150._12_4_ = (uint)bVar12 * auVar123._12_4_ | (uint)!bVar12 * auVar265._12_4_;
          iVar1 = (uint)((byte)(uVar102 >> 4) & 1) * auVar123._16_4_;
          auVar150._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar102 >> 5) & 1) * auVar123._20_4_;
          auVar150._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar102 >> 6) & 1) * auVar123._24_4_;
          auVar150._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar102 >> 7) * auVar123._28_4_;
          auVar150._28_4_ = iVar4;
          auVar179._8_4_ = 0xff800000;
          auVar179._0_8_ = 0xff800000ff800000;
          auVar179._12_4_ = 0xff800000;
          auVar179._16_4_ = 0xff800000;
          auVar179._20_4_ = 0xff800000;
          auVar179._24_4_ = 0xff800000;
          auVar179._28_4_ = 0xff800000;
          auVar123 = vblendmps_avx512vl(auVar179,auVar63);
          bVar12 = (bool)((byte)uVar102 & 1);
          auVar151._0_4_ = (uint)bVar12 * auVar123._0_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar151._4_4_ = (uint)bVar12 * auVar123._4_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar151._8_4_ = (uint)bVar12 * auVar123._8_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar151._12_4_ = (uint)bVar12 * auVar123._12_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar102 >> 4) & 1);
          auVar151._16_4_ = (uint)bVar12 * auVar123._16_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar102 >> 5) & 1);
          auVar151._20_4_ = (uint)bVar12 * auVar123._20_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar102 >> 6) & 1);
          auVar151._24_4_ = (uint)bVar12 * auVar123._24_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = SUB81(uVar102 >> 7,0);
          auVar151._28_4_ = (uint)bVar12 * auVar123._28_4_ | (uint)!bVar12 * -0x800000;
          auVar256._8_4_ = 0x7fffffff;
          auVar256._0_8_ = 0x7fffffff7fffffff;
          auVar256._12_4_ = 0x7fffffff;
          auVar256._16_4_ = 0x7fffffff;
          auVar256._20_4_ = 0x7fffffff;
          auVar256._24_4_ = 0x7fffffff;
          auVar256._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar135,auVar256);
          auVar271 = ZEXT3264(local_800);
          auVar123 = vmaxps_avx(local_800,auVar151);
          auVar36._8_4_ = 0x36000000;
          auVar36._0_8_ = 0x3600000036000000;
          auVar36._12_4_ = 0x36000000;
          auVar36._16_4_ = 0x36000000;
          auVar36._20_4_ = 0x36000000;
          auVar36._24_4_ = 0x36000000;
          auVar36._28_4_ = 0x36000000;
          auVar123 = vmulps_avx512vl(auVar123,auVar36);
          auVar118 = vandps_avx(auVar118,auVar256);
          uVar98 = vcmpps_avx512vl(auVar118,auVar123,1);
          uVar102 = uVar102 & uVar98;
          bVar94 = (byte)uVar102;
          if (bVar94 != 0) {
            uVar98 = vcmpps_avx512vl(auVar119,ZEXT1632(auVar104),2);
            auVar257._8_4_ = 0xff800000;
            auVar257._0_8_ = 0xff800000ff800000;
            auVar257._12_4_ = 0xff800000;
            auVar257._16_4_ = 0xff800000;
            auVar257._20_4_ = 0xff800000;
            auVar257._24_4_ = 0xff800000;
            auVar257._28_4_ = 0xff800000;
            auVar268._8_4_ = 0x7f800000;
            auVar268._0_8_ = 0x7f8000007f800000;
            auVar268._12_4_ = 0x7f800000;
            auVar268._16_4_ = 0x7f800000;
            auVar268._20_4_ = 0x7f800000;
            auVar268._24_4_ = 0x7f800000;
            auVar268._28_4_ = 0x7f800000;
            auVar118 = vblendmps_avx512vl(auVar268,auVar257);
            bVar96 = (byte)uVar98;
            uVar103 = (uint)(bVar96 & 1) * auVar118._0_4_ |
                      (uint)!(bool)(bVar96 & 1) * auVar123._0_4_;
            bVar12 = (bool)((byte)(uVar98 >> 1) & 1);
            uVar161 = (uint)bVar12 * auVar118._4_4_ | (uint)!bVar12 * auVar123._4_4_;
            bVar12 = (bool)((byte)(uVar98 >> 2) & 1);
            uVar162 = (uint)bVar12 * auVar118._8_4_ | (uint)!bVar12 * auVar123._8_4_;
            bVar12 = (bool)((byte)(uVar98 >> 3) & 1);
            uVar163 = (uint)bVar12 * auVar118._12_4_ | (uint)!bVar12 * auVar123._12_4_;
            bVar12 = (bool)((byte)(uVar98 >> 4) & 1);
            uVar164 = (uint)bVar12 * auVar118._16_4_ | (uint)!bVar12 * auVar123._16_4_;
            bVar12 = (bool)((byte)(uVar98 >> 5) & 1);
            uVar165 = (uint)bVar12 * auVar118._20_4_ | (uint)!bVar12 * auVar123._20_4_;
            bVar12 = (bool)((byte)(uVar98 >> 6) & 1);
            uVar166 = (uint)bVar12 * auVar118._24_4_ | (uint)!bVar12 * auVar123._24_4_;
            bVar12 = SUB81(uVar98 >> 7,0);
            uVar167 = (uint)bVar12 * auVar118._28_4_ | (uint)!bVar12 * auVar123._28_4_;
            auVar150._0_4_ = (bVar94 & 1) * uVar103 | !(bool)(bVar94 & 1) * auVar150._0_4_;
            bVar12 = (bool)((byte)(uVar102 >> 1) & 1);
            auVar150._4_4_ = bVar12 * uVar161 | !bVar12 * auVar150._4_4_;
            bVar12 = (bool)((byte)(uVar102 >> 2) & 1);
            auVar150._8_4_ = bVar12 * uVar162 | !bVar12 * auVar150._8_4_;
            bVar12 = (bool)((byte)(uVar102 >> 3) & 1);
            auVar150._12_4_ = bVar12 * uVar163 | !bVar12 * auVar150._12_4_;
            bVar12 = (bool)((byte)(uVar102 >> 4) & 1);
            auVar150._16_4_ = bVar12 * uVar164 | (uint)!bVar12 * iVar1;
            bVar12 = (bool)((byte)(uVar102 >> 5) & 1);
            auVar150._20_4_ = bVar12 * uVar165 | (uint)!bVar12 * iVar2;
            bVar12 = (bool)((byte)(uVar102 >> 6) & 1);
            auVar150._24_4_ = bVar12 * uVar166 | (uint)!bVar12 * iVar3;
            bVar12 = SUB81(uVar102 >> 7,0);
            auVar150._28_4_ = bVar12 * uVar167 | (uint)!bVar12 * iVar4;
            auVar118 = vblendmps_avx512vl(auVar257,auVar268);
            bVar12 = (bool)((byte)(uVar98 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar98 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar98 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar98 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar98 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar98 >> 6) & 1);
            bVar18 = SUB81(uVar98 >> 7,0);
            auVar151._0_4_ =
                 (uint)(bVar94 & 1) *
                 ((uint)(bVar96 & 1) * auVar118._0_4_ | !(bool)(bVar96 & 1) * uVar103) |
                 !(bool)(bVar94 & 1) * auVar151._0_4_;
            bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
            auVar151._4_4_ =
                 (uint)bVar101 * ((uint)bVar12 * auVar118._4_4_ | !bVar12 * uVar161) |
                 !bVar101 * auVar151._4_4_;
            bVar12 = (bool)((byte)(uVar102 >> 2) & 1);
            auVar151._8_4_ =
                 (uint)bVar12 * ((uint)bVar13 * auVar118._8_4_ | !bVar13 * uVar162) |
                 !bVar12 * auVar151._8_4_;
            bVar12 = (bool)((byte)(uVar102 >> 3) & 1);
            auVar151._12_4_ =
                 (uint)bVar12 * ((uint)bVar14 * auVar118._12_4_ | !bVar14 * uVar163) |
                 !bVar12 * auVar151._12_4_;
            bVar12 = (bool)((byte)(uVar102 >> 4) & 1);
            auVar151._16_4_ =
                 (uint)bVar12 * ((uint)bVar15 * auVar118._16_4_ | !bVar15 * uVar164) |
                 !bVar12 * auVar151._16_4_;
            bVar12 = (bool)((byte)(uVar102 >> 5) & 1);
            auVar151._20_4_ =
                 (uint)bVar12 * ((uint)bVar16 * auVar118._20_4_ | !bVar16 * uVar165) |
                 !bVar12 * auVar151._20_4_;
            bVar12 = (bool)((byte)(uVar102 >> 6) & 1);
            auVar151._24_4_ =
                 (uint)bVar12 * ((uint)bVar17 * auVar118._24_4_ | !bVar17 * uVar166) |
                 !bVar12 * auVar151._24_4_;
            bVar12 = SUB81(uVar102 >> 7,0);
            auVar151._28_4_ =
                 (uint)bVar12 * ((uint)bVar18 * auVar118._28_4_ | !bVar18 * uVar167) |
                 !bVar12 * auVar151._28_4_;
            bVar97 = (~bVar94 | bVar96) & bVar97;
          }
        }
        auVar267._8_4_ = 0x7fffffff;
        auVar267._0_8_ = 0x7fffffff7fffffff;
        auVar267._12_4_ = 0x7fffffff;
        auVar118 = vmulps_avx512vl(local_b00,auVar121);
        auVar118 = vfmadd231ps_avx512vl(auVar118,local_ae0,auVar120);
        auVar118 = vfmadd231ps_avx512vl(auVar118,local_7e0,auVar266._0_32_);
        _local_500 = _local_960;
        local_4e0 = vminps_avx(local_7a0,auVar150);
        auVar251._8_4_ = 0x7fffffff;
        auVar251._0_8_ = 0x7fffffff7fffffff;
        auVar251._12_4_ = 0x7fffffff;
        auVar251._16_4_ = 0x7fffffff;
        auVar251._20_4_ = 0x7fffffff;
        auVar251._24_4_ = 0x7fffffff;
        auVar251._28_4_ = 0x7fffffff;
        auVar118 = vandps_avx(auVar118,auVar251);
        _local_8a0 = vmaxps_avx(_local_960,auVar151);
        auVar250 = ZEXT3264(_local_8a0);
        _local_7c0 = _local_8a0;
        auVar180._8_4_ = 0x3e99999a;
        auVar180._0_8_ = 0x3e99999a3e99999a;
        auVar180._12_4_ = 0x3e99999a;
        auVar180._16_4_ = 0x3e99999a;
        auVar180._20_4_ = 0x3e99999a;
        auVar180._24_4_ = 0x3e99999a;
        auVar180._28_4_ = 0x3e99999a;
        uVar27 = vcmpps_avx512vl(auVar118,auVar180,1);
        uVar29 = vcmpps_avx512vl(_local_960,local_4e0,2);
        bVar94 = (byte)uVar29 & bVar91;
        uVar28 = vcmpps_avx512vl(_local_8a0,local_7a0,2);
        if ((bVar91 & ((byte)uVar28 | (byte)uVar29)) == 0) {
          auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar187 = ZEXT3264(auVar118);
        }
        else {
          auVar118 = vmulps_avx512vl(local_b00,auVar260._0_32_);
          auVar118 = vfmadd213ps_avx512vl(auVar122,local_ae0,auVar118);
          auVar118 = vfmadd213ps_avx512vl(auVar117,local_7e0,auVar118);
          auVar118 = vandps_avx(auVar118,auVar251);
          uVar29 = vcmpps_avx512vl(auVar118,auVar180,1);
          bVar96 = (byte)uVar29 | ~bVar97;
          auVar181._8_4_ = 2;
          auVar181._0_8_ = 0x200000002;
          auVar181._12_4_ = 2;
          auVar181._16_4_ = 2;
          auVar181._20_4_ = 2;
          auVar181._24_4_ = 2;
          auVar181._28_4_ = 2;
          auVar37._8_4_ = 3;
          auVar37._0_8_ = 0x300000003;
          auVar37._12_4_ = 3;
          auVar37._16_4_ = 3;
          auVar37._20_4_ = 3;
          auVar37._24_4_ = 3;
          auVar37._28_4_ = 3;
          auVar118 = vpblendmd_avx512vl(auVar181,auVar37);
          local_780._0_4_ = (uint)(bVar96 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar96 & 1) * 2;
          bVar12 = (bool)(bVar96 >> 1 & 1);
          local_780._4_4_ = (uint)bVar12 * auVar118._4_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar96 >> 2 & 1);
          local_780._8_4_ = (uint)bVar12 * auVar118._8_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar96 >> 3 & 1);
          local_780._12_4_ = (uint)bVar12 * auVar118._12_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar96 >> 4 & 1);
          local_780._16_4_ = (uint)bVar12 * auVar118._16_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar96 >> 5 & 1);
          local_780._20_4_ = (uint)bVar12 * auVar118._20_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar96 >> 6 & 1);
          local_780._24_4_ = (uint)bVar12 * auVar118._24_4_ | (uint)!bVar12 * 2;
          local_780._28_4_ = (uint)(bVar96 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar96 >> 7) * 2;
          auVar157._0_32_ = vpbroadcastd_avx512vl();
          auVar157._32_32_ = auVar116;
          local_820 = auVar157._0_32_;
          uVar29 = vpcmpd_avx512vl(auVar157._0_32_,local_780,5);
          bVar96 = (byte)uVar29 & bVar94;
          if (bVar96 != 0) {
            auVar265 = vminps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar107 = vmaxps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar104 = vminps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar6 = vminps_avx(auVar265,auVar104);
            auVar265 = vmaxps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar104 = vmaxps_avx(auVar107,auVar265);
            auVar107 = vandps_avx(auVar267,auVar6);
            auVar265 = vandps_avx(auVar267,auVar104);
            auVar107 = vmaxps_avx(auVar107,auVar265);
            auVar265 = vmovshdup_avx(auVar107);
            auVar265 = vmaxss_avx(auVar265,auVar107);
            auVar107 = vshufpd_avx(auVar107,auVar107,1);
            auVar107 = vmaxss_avx(auVar107,auVar265);
            fVar168 = auVar107._0_4_ * 1.9073486e-06;
            local_9d0 = vshufps_avx(auVar104,auVar104,0xff);
            local_880 = (float)local_960._0_4_ + (float)local_940._0_4_;
            fStack_87c = (float)local_960._4_4_ + (float)local_940._4_4_;
            fStack_878 = fStack_958 + fStack_938;
            fStack_874 = fStack_954 + fStack_934;
            fStack_870 = fStack_950 + fStack_930;
            fStack_86c = fStack_94c + fStack_92c;
            fStack_868 = fStack_948 + fStack_928;
            fStack_864 = fStack_944 + fStack_924;
            do {
              auVar182._8_4_ = 0x7f800000;
              auVar182._0_8_ = 0x7f8000007f800000;
              auVar182._12_4_ = 0x7f800000;
              auVar182._16_4_ = 0x7f800000;
              auVar182._20_4_ = 0x7f800000;
              auVar182._24_4_ = 0x7f800000;
              auVar182._28_4_ = 0x7f800000;
              auVar118 = vblendmps_avx512vl(auVar182,_local_960);
              auVar152._0_4_ =
                   (uint)(bVar96 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar96 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar96 >> 1 & 1);
              auVar152._4_4_ = (uint)bVar12 * auVar118._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar96 >> 2 & 1);
              auVar152._8_4_ = (uint)bVar12 * auVar118._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar96 >> 3 & 1);
              auVar152._12_4_ = (uint)bVar12 * auVar118._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar96 >> 4 & 1);
              auVar152._16_4_ = (uint)bVar12 * auVar118._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar96 >> 5 & 1);
              auVar152._20_4_ = (uint)bVar12 * auVar118._20_4_ | (uint)!bVar12 * 0x7f800000;
              auVar152._24_4_ =
                   (uint)(bVar96 >> 6) * auVar118._24_4_ | (uint)!(bool)(bVar96 >> 6) * 0x7f800000;
              auVar152._28_4_ = 0x7f800000;
              auVar157._0_32_ = auVar152;
              auVar118 = vshufps_avx(auVar152,auVar152,0xb1);
              auVar118 = vminps_avx(auVar152,auVar118);
              auVar116 = vshufpd_avx(auVar118,auVar118,5);
              auVar118 = vminps_avx(auVar118,auVar116);
              auVar116 = vpermpd_avx2(auVar118,0x4e);
              auVar118 = vminps_avx(auVar118,auVar116);
              uVar29 = vcmpps_avx512vl(auVar152,auVar118,0);
              bVar92 = (byte)uVar29 & bVar96;
              bVar93 = bVar96;
              if (bVar92 != 0) {
                bVar93 = bVar92;
              }
              iVar2 = 0;
              for (uVar103 = (uint)bVar93; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x80000000)
              {
                iVar2 = iVar2 + 1;
              }
              uVar103 = *(uint *)(local_840 + (uint)(iVar2 << 2));
              uVar161 = *(uint *)(local_500 + (uint)(iVar2 << 2));
              fVar252 = auVar26._0_4_;
              if ((float)local_a80._0_4_ < 0.0) {
                fVar252 = sqrtf((float)local_a80._0_4_);
              }
              auVar266 = ZEXT464(uVar103);
              auVar259 = ZEXT464(uVar161);
              lVar100 = 4;
              do {
                auVar118 = auVar157._32_32_;
                fVar253 = auVar259._0_4_;
                auVar170._4_4_ = fVar253;
                auVar170._0_4_ = fVar253;
                auVar170._8_4_ = fVar253;
                auVar170._12_4_ = fVar253;
                auVar107 = vfmadd132ps_fma(auVar170,ZEXT816(0) << 0x40,local_a70);
                fVar264 = auVar266._0_4_;
                fVar249 = 1.0 - fVar264;
                fVar262 = fVar249 * fVar249 * fVar249;
                fVar254 = fVar264 * fVar264;
                fVar255 = fVar264 * fVar254;
                auVar265 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar262),
                                           ZEXT416((uint)fVar255));
                fVar261 = fVar264 * fVar249;
                auVar105 = ZEXT416((uint)fVar249);
                auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar264 * fVar261 * 6.0)),
                                         ZEXT416((uint)(fVar261 * fVar249)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar104 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar255),
                                           ZEXT416((uint)fVar262));
                auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar261 * fVar249 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar264 * fVar261)));
                fVar262 = fVar262 * 0.16666667;
                fVar263 = (auVar265._0_4_ + auVar6._0_4_) * 0.16666667;
                fVar230 = (auVar104._0_4_ + auVar108._0_4_) * 0.16666667;
                fVar255 = fVar255 * 0.16666667;
                auVar214._0_4_ = fVar255 * (float)local_a60._0_4_;
                auVar214._4_4_ = fVar255 * (float)local_a60._4_4_;
                auVar214._8_4_ = fVar255 * fStack_a58;
                auVar214._12_4_ = fVar255 * fStack_a54;
                auVar240._4_4_ = fVar230;
                auVar240._0_4_ = fVar230;
                auVar240._8_4_ = fVar230;
                auVar240._12_4_ = fVar230;
                auVar265 = vfmadd132ps_fma(auVar240,auVar214,local_a20._0_16_);
                auVar215._4_4_ = fVar263;
                auVar215._0_4_ = fVar263;
                auVar215._8_4_ = fVar263;
                auVar215._12_4_ = fVar263;
                auVar265 = vfmadd132ps_fma(auVar215,auVar265,local_a40._0_16_);
                auVar194._4_4_ = fVar262;
                auVar194._0_4_ = fVar262;
                auVar194._8_4_ = fVar262;
                auVar194._12_4_ = fVar262;
                auVar265 = vfmadd132ps_fma(auVar194,auVar265,local_a00._0_16_);
                local_920._0_16_ = auVar265;
                auVar107 = vsubps_avx(auVar107,auVar265);
                local_aa0._0_16_ = auVar107;
                auVar107 = vdpps_avx(auVar107,auVar107,0x7f);
                auVar265 = auVar266._0_16_;
                local_ac0._0_16_ = auVar107;
                if (auVar107._0_4_ < 0.0) {
                  local_b60._0_4_ = fVar254;
                  auVar271._0_4_ = sqrtf(auVar107._0_4_);
                  auVar271._4_60_ = extraout_var;
                  auVar107 = auVar271._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar107,auVar107);
                  local_b60._0_4_ = fVar254;
                }
                auVar6 = vfnmsub213ss_fma(auVar265,auVar265,ZEXT416((uint)(fVar261 * 4.0)));
                auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar261 * 4.0)),auVar105,auVar105);
                fVar254 = fVar249 * -fVar249 * 0.5;
                fVar261 = auVar6._0_4_ * 0.5;
                fVar262 = auVar104._0_4_ * 0.5;
                local_b60._0_4_ = (float)local_b60._0_4_ * 0.5;
                auVar232._0_4_ = (float)local_b60._0_4_ * (float)local_a60._0_4_;
                auVar232._4_4_ = (float)local_b60._0_4_ * (float)local_a60._4_4_;
                auVar232._8_4_ = (float)local_b60._0_4_ * fStack_a58;
                auVar232._12_4_ = (float)local_b60._0_4_ * fStack_a54;
                auVar195._4_4_ = fVar262;
                auVar195._0_4_ = fVar262;
                auVar195._8_4_ = fVar262;
                auVar195._12_4_ = fVar262;
                auVar104 = vfmadd132ps_fma(auVar195,auVar232,local_a20._0_16_);
                auVar216._4_4_ = fVar261;
                auVar216._0_4_ = fVar261;
                auVar216._8_4_ = fVar261;
                auVar216._12_4_ = fVar261;
                auVar104 = vfmadd132ps_fma(auVar216,auVar104,local_a40._0_16_);
                auVar272._4_4_ = fVar254;
                auVar272._0_4_ = fVar254;
                auVar272._8_4_ = fVar254;
                auVar272._12_4_ = fVar254;
                local_b60._0_16_ = vfmadd132ps_fma(auVar272,auVar104,local_a00._0_16_);
                local_980 = vdpps_avx(local_b60._0_16_,local_b60._0_16_,0x7f);
                auVar68._12_4_ = 0;
                auVar68._0_12_ = ZEXT812(0);
                fVar254 = local_980._0_4_;
                auVar104 = vrsqrt14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar254));
                fVar261 = auVar104._0_4_;
                local_990 = vrcp14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar254));
                auVar104 = vfnmadd213ss_fma(local_990,local_980,ZEXT416(0x40000000));
                uVar103 = auVar107._0_4_;
                local_970 = fVar249;
                fStack_96c = fVar249;
                fStack_968 = fVar249;
                fStack_964 = fVar249;
                if (fVar254 < -fVar254) {
                  auVar275._0_4_ = sqrtf(fVar254);
                  auVar275._4_60_ = extraout_var_00;
                  auVar107 = ZEXT416(uVar103);
                  auVar108 = auVar275._0_16_;
                  auVar6 = local_b60._0_16_;
                }
                else {
                  auVar108 = vsqrtss_avx512f(local_980,local_980);
                  auVar6 = local_b60._0_16_;
                }
                fVar254 = fVar261 * 1.5 + fVar254 * -0.5 * fVar261 * fVar261 * fVar261;
                auVar171._0_4_ = auVar6._0_4_ * fVar254;
                auVar171._4_4_ = auVar6._4_4_ * fVar254;
                auVar171._8_4_ = auVar6._8_4_ * fVar254;
                auVar171._12_4_ = auVar6._12_4_ * fVar254;
                auVar276 = vdpps_avx(local_aa0._0_16_,auVar171,0x7f);
                fVar263 = auVar107._0_4_;
                fVar261 = auVar276._0_4_;
                auVar172._0_4_ = fVar261 * fVar261;
                auVar172._4_4_ = auVar276._4_4_ * auVar276._4_4_;
                auVar172._8_4_ = auVar276._8_4_ * auVar276._8_4_;
                auVar172._12_4_ = auVar276._12_4_ * auVar276._12_4_;
                auVar109 = vsubps_avx512vl(local_ac0._0_16_,auVar172);
                fVar262 = auVar109._0_4_;
                auVar196._4_12_ = ZEXT812(0) << 0x20;
                auVar196._0_4_ = fVar262;
                auVar110 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar196);
                auVar111 = vmulss_avx512f(auVar110,ZEXT416(0x3fc00000));
                auVar112 = vmulss_avx512f(auVar109,ZEXT416(0xbf000000));
                if (fVar262 < 0.0) {
                  local_9b0 = fVar254;
                  fStack_9ac = fVar254;
                  fStack_9a8 = fVar254;
                  fStack_9a4 = fVar254;
                  local_9a0 = auVar110;
                  fVar262 = sqrtf(fVar262);
                  auVar112 = ZEXT416(auVar112._0_4_);
                  auVar111 = ZEXT416(auVar111._0_4_);
                  auVar108 = ZEXT416(auVar108._0_4_);
                  auVar107 = ZEXT416(uVar103);
                  auVar6 = local_b60._0_16_;
                  auVar110 = local_9a0;
                  fVar254 = local_9b0;
                  fVar230 = fStack_9ac;
                  fVar255 = fStack_9a8;
                  fVar249 = fStack_9a4;
                }
                else {
                  auVar109 = vsqrtss_avx(auVar109,auVar109);
                  fVar262 = auVar109._0_4_;
                  fVar230 = fVar254;
                  fVar255 = fVar254;
                  fVar249 = fVar254;
                }
                auVar275 = ZEXT1664(auVar6);
                auVar260 = ZEXT1664(local_aa0._0_16_);
                auVar267._8_4_ = 0x7fffffff;
                auVar267._0_8_ = 0x7fffffff7fffffff;
                auVar267._12_4_ = 0x7fffffff;
                auVar278 = ZEXT3264(local_ae0);
                auVar250._32_32_ = auVar118;
                auVar250._0_32_ = local_b00;
                auVar277 = ZEXT3264(local_b00);
                auVar109 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar105,auVar265);
                auVar265 = vfmadd231ss_fma(auVar105,auVar265,SUB6416(ZEXT464(0xc0000000),0));
                auVar217._0_4_ = fVar264 * (float)local_a60._0_4_;
                auVar217._4_4_ = fVar264 * (float)local_a60._4_4_;
                auVar217._8_4_ = fVar264 * fStack_a58;
                auVar217._12_4_ = fVar264 * fStack_a54;
                auVar233._0_4_ = auVar265._0_4_;
                auVar233._4_4_ = auVar233._0_4_;
                auVar233._8_4_ = auVar233._0_4_;
                auVar233._12_4_ = auVar233._0_4_;
                auVar265 = vfmadd132ps_fma(auVar233,auVar217,local_a20._0_16_);
                auVar197._0_4_ = auVar109._0_4_;
                auVar197._4_4_ = auVar197._0_4_;
                auVar197._8_4_ = auVar197._0_4_;
                auVar197._12_4_ = auVar197._0_4_;
                auVar265 = vfmadd132ps_fma(auVar197,auVar265,local_a40._0_16_);
                auVar82._4_4_ = fStack_96c;
                auVar82._0_4_ = local_970;
                auVar82._8_4_ = fStack_968;
                auVar82._12_4_ = fStack_964;
                auVar265 = vfmadd132ps_fma(auVar82,auVar265,local_a00._0_16_);
                auVar198._0_4_ = auVar265._0_4_ * (float)local_980._0_4_;
                auVar198._4_4_ = auVar265._4_4_ * (float)local_980._0_4_;
                auVar198._8_4_ = auVar265._8_4_ * (float)local_980._0_4_;
                auVar198._12_4_ = auVar265._12_4_ * (float)local_980._0_4_;
                auVar265 = vdpps_avx(auVar6,auVar265,0x7f);
                fVar213 = auVar265._0_4_;
                auVar218._0_4_ = auVar6._0_4_ * fVar213;
                auVar218._4_4_ = auVar6._4_4_ * fVar213;
                auVar218._8_4_ = auVar6._8_4_ * fVar213;
                auVar218._12_4_ = auVar6._12_4_ * fVar213;
                auVar265 = vsubps_avx(auVar198,auVar218);
                fVar213 = auVar104._0_4_ * (float)local_990._0_4_;
                auVar30._8_4_ = 0x80000000;
                auVar30._0_8_ = 0x8000000080000000;
                auVar30._12_4_ = 0x80000000;
                auVar157._16_48_ = auVar250._16_48_;
                auVar109 = vxorps_avx512vl(auVar6,auVar30);
                auVar241._0_4_ = fVar254 * auVar265._0_4_ * fVar213;
                auVar241._4_4_ = fVar230 * auVar265._4_4_ * fVar213;
                auVar241._8_4_ = fVar255 * auVar265._8_4_ * fVar213;
                auVar241._12_4_ = fVar249 * auVar265._12_4_ * fVar213;
                auVar271 = ZEXT1664(auVar171);
                auVar265 = vdpps_avx(auVar109,auVar171,0x7f);
                auVar105 = vmaxss_avx(ZEXT416((uint)fVar168),
                                      ZEXT416((uint)(fVar253 * fVar252 * 1.9073486e-06)));
                auVar108 = vdivss_avx512f(ZEXT416((uint)fVar168),auVar108);
                auVar104 = vdpps_avx(local_aa0._0_16_,auVar241,0x7f);
                auVar107 = vfmadd213ss_fma(auVar107,ZEXT416((uint)fVar168),auVar105);
                auVar108 = vfmadd213ss_fma(ZEXT416((uint)(fVar263 + 1.0)),auVar108,auVar107);
                auVar107 = vdpps_avx(local_a70,auVar171,0x7f);
                fVar254 = auVar265._0_4_ + auVar104._0_4_;
                auVar265 = vdpps_avx(local_aa0._0_16_,auVar109,0x7f);
                auVar109 = vmulss_avx512f(auVar112,auVar110);
                auVar110 = vmulss_avx512f(auVar110,auVar110);
                auVar104 = vdpps_avx(local_aa0._0_16_,local_a70,0x7f);
                auVar157._0_16_ =
                     vaddss_avx512f(auVar111,ZEXT416((uint)(auVar109._0_4_ * auVar110._0_4_)));
                auVar110 = vfnmadd231ss_fma(auVar265,auVar276,ZEXT416((uint)fVar254));
                auVar109 = vfnmadd231ss_fma(auVar104,auVar276,auVar107);
                auVar265 = vpermilps_avx(local_920._0_16_,0xff);
                fVar262 = fVar262 - auVar265._0_4_;
                auVar265 = vshufps_avx(auVar6,auVar6,0xff);
                auVar104 = vfmsub213ss_fma(auVar110,auVar157._0_16_,auVar265);
                fVar263 = auVar109._0_4_ * auVar157._0_4_;
                auVar110 = vfmsub231ss_fma(ZEXT416((uint)(auVar107._0_4_ * auVar104._0_4_)),
                                           ZEXT416((uint)fVar254),ZEXT416((uint)fVar263));
                fVar255 = auVar110._0_4_;
                fVar230 = fVar261 * (auVar104._0_4_ / fVar255);
                auVar250 = ZEXT464((uint)fVar230);
                fVar264 = fVar264 - (fVar261 * (fVar263 / fVar255) -
                                    fVar262 * (auVar107._0_4_ / fVar255));
                auVar266 = ZEXT464((uint)fVar264);
                fVar253 = fVar253 - (fVar262 * (fVar254 / fVar255) - fVar230);
                auVar259 = ZEXT464((uint)fVar253);
                auVar107 = vandps_avx(auVar276,auVar267);
                if (auVar108._0_4_ <= auVar107._0_4_) {
LAB_01e14693:
                  bVar12 = false;
                }
                else {
                  auVar104 = vfmadd231ss_fma(ZEXT416((uint)(auVar108._0_4_ + auVar105._0_4_)),
                                             local_9d0,ZEXT416(0x36000000));
                  auVar107 = vandps_avx(auVar267,ZEXT416((uint)fVar262));
                  if (auVar104._0_4_ <= auVar107._0_4_) goto LAB_01e14693;
                  fVar253 = fVar253 + (float)local_9c0._0_4_;
                  auVar259 = ZEXT464((uint)fVar253);
                  bVar12 = true;
                  if ((((fVar231 <= fVar253) &&
                       (fVar254 = *(float *)(ray + k * 4 + 0x200), fVar253 <= fVar254)) &&
                      (0.0 <= fVar264)) && (fVar264 <= 1.0)) {
                    auVar156._16_48_ = auVar157._16_48_;
                    auVar156._0_16_ = ZEXT816(0) << 0x20;
                    auVar155._4_60_ = auVar156._4_60_;
                    auVar155._0_4_ = local_ac0._0_4_;
                    auVar107 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar155._0_16_);
                    fVar261 = auVar107._0_4_;
                    auVar157._0_16_ = vmulss_avx512f(local_ac0._0_16_,ZEXT416(0xbf000000));
                    pGVar9 = (context->scene->geometries).items[uVar99].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      fVar261 = fVar261 * 1.5 + auVar157._0_4_ * fVar261 * fVar261 * fVar261;
                      auVar199._0_4_ = local_aa0._0_4_ * fVar261;
                      auVar199._4_4_ = local_aa0._4_4_ * fVar261;
                      auVar199._8_4_ = local_aa0._8_4_ * fVar261;
                      auVar199._12_4_ = local_aa0._12_4_ * fVar261;
                      auVar108 = vfmadd213ps_fma(auVar265,auVar199,auVar6);
                      auVar107 = vshufps_avx(auVar199,auVar199,0xc9);
                      auVar265 = vshufps_avx(auVar6,auVar6,0xc9);
                      auVar200._0_4_ = auVar199._0_4_ * auVar265._0_4_;
                      auVar200._4_4_ = auVar199._4_4_ * auVar265._4_4_;
                      auVar200._8_4_ = auVar199._8_4_ * auVar265._8_4_;
                      auVar200._12_4_ = auVar199._12_4_ * auVar265._12_4_;
                      auVar104 = vfmsub231ps_fma(auVar200,auVar6,auVar107);
                      auVar107 = vshufps_avx(auVar104,auVar104,0xc9);
                      auVar265 = vshufps_avx(auVar108,auVar108,0xc9);
                      auVar104 = vshufps_avx(auVar104,auVar104,0xd2);
                      auVar173._0_4_ = auVar108._0_4_ * auVar104._0_4_;
                      auVar173._4_4_ = auVar108._4_4_ * auVar104._4_4_;
                      auVar173._8_4_ = auVar108._8_4_ * auVar104._8_4_;
                      auVar173._12_4_ = auVar108._12_4_ * auVar104._12_4_;
                      auVar107 = vfmsub231ps_fma(auVar173,auVar107,auVar265);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar253;
                        uVar5 = vextractps_avx(auVar107,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar5;
                        uVar5 = vextractps_avx(auVar107,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar5;
                        *(int *)(ray + k * 4 + 0x380) = auVar107._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar264;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(uint *)(ray + k * 4 + 0x440) = uVar8;
                        *(uint *)(ray + k * 4 + 0x480) = uVar99;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar11 = context->user;
                        auVar265 = ZEXT416((uint)fVar264);
                        local_340 = vbroadcastss_avx512f(auVar265);
                        auVar187 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar187 = vpermps_avx512f(auVar187,ZEXT1664(auVar107));
                        auVar226 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar226,ZEXT1664(auVar107));
                        local_380 = vbroadcastss_avx512f(auVar107);
                        local_400[0] = (RTCHitN)auVar187[0];
                        local_400[1] = (RTCHitN)auVar187[1];
                        local_400[2] = (RTCHitN)auVar187[2];
                        local_400[3] = (RTCHitN)auVar187[3];
                        local_400[4] = (RTCHitN)auVar187[4];
                        local_400[5] = (RTCHitN)auVar187[5];
                        local_400[6] = (RTCHitN)auVar187[6];
                        local_400[7] = (RTCHitN)auVar187[7];
                        local_400[8] = (RTCHitN)auVar187[8];
                        local_400[9] = (RTCHitN)auVar187[9];
                        local_400[10] = (RTCHitN)auVar187[10];
                        local_400[0xb] = (RTCHitN)auVar187[0xb];
                        local_400[0xc] = (RTCHitN)auVar187[0xc];
                        local_400[0xd] = (RTCHitN)auVar187[0xd];
                        local_400[0xe] = (RTCHitN)auVar187[0xe];
                        local_400[0xf] = (RTCHitN)auVar187[0xf];
                        local_400[0x10] = (RTCHitN)auVar187[0x10];
                        local_400[0x11] = (RTCHitN)auVar187[0x11];
                        local_400[0x12] = (RTCHitN)auVar187[0x12];
                        local_400[0x13] = (RTCHitN)auVar187[0x13];
                        local_400[0x14] = (RTCHitN)auVar187[0x14];
                        local_400[0x15] = (RTCHitN)auVar187[0x15];
                        local_400[0x16] = (RTCHitN)auVar187[0x16];
                        local_400[0x17] = (RTCHitN)auVar187[0x17];
                        local_400[0x18] = (RTCHitN)auVar187[0x18];
                        local_400[0x19] = (RTCHitN)auVar187[0x19];
                        local_400[0x1a] = (RTCHitN)auVar187[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar187[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar187[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar187[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar187[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar187[0x1f];
                        local_400[0x20] = (RTCHitN)auVar187[0x20];
                        local_400[0x21] = (RTCHitN)auVar187[0x21];
                        local_400[0x22] = (RTCHitN)auVar187[0x22];
                        local_400[0x23] = (RTCHitN)auVar187[0x23];
                        local_400[0x24] = (RTCHitN)auVar187[0x24];
                        local_400[0x25] = (RTCHitN)auVar187[0x25];
                        local_400[0x26] = (RTCHitN)auVar187[0x26];
                        local_400[0x27] = (RTCHitN)auVar187[0x27];
                        local_400[0x28] = (RTCHitN)auVar187[0x28];
                        local_400[0x29] = (RTCHitN)auVar187[0x29];
                        local_400[0x2a] = (RTCHitN)auVar187[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar187[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar187[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar187[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar187[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar187[0x2f];
                        local_400[0x30] = (RTCHitN)auVar187[0x30];
                        local_400[0x31] = (RTCHitN)auVar187[0x31];
                        local_400[0x32] = (RTCHitN)auVar187[0x32];
                        local_400[0x33] = (RTCHitN)auVar187[0x33];
                        local_400[0x34] = (RTCHitN)auVar187[0x34];
                        local_400[0x35] = (RTCHitN)auVar187[0x35];
                        local_400[0x36] = (RTCHitN)auVar187[0x36];
                        local_400[0x37] = (RTCHitN)auVar187[0x37];
                        local_400[0x38] = (RTCHitN)auVar187[0x38];
                        local_400[0x39] = (RTCHitN)auVar187[0x39];
                        local_400[0x3a] = (RTCHitN)auVar187[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar187[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar187[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar187[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar187[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar187[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar187 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar187);
                        auVar118 = vpcmpeqd_avx2(auVar187._0_32_,auVar187._0_32_);
                        local_b28[3] = auVar118;
                        local_b28[2] = auVar118;
                        local_b28[1] = auVar118;
                        *local_b28 = auVar118;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar11->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar11->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar253;
                        local_900 = local_4c0;
                        local_b90.valid = (int *)local_900;
                        local_b90.geometryUserPtr = pGVar9->userPtr;
                        local_b90.context = context->user;
                        local_b90.hit = local_400;
                        local_b90.N = 0x10;
                        local_b90.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar250 = ZEXT464((uint)fVar230);
                          auVar260 = ZEXT1664(local_aa0._0_16_);
                          auVar271 = ZEXT1664(auVar171);
                          auVar275 = ZEXT1664(auVar6);
                          (*pGVar9->intersectionFilterN)(&local_b90);
                          auVar259 = ZEXT1664(ZEXT416((uint)fVar253));
                          auVar266 = ZEXT1664(auVar265);
                          auVar277 = ZEXT3264(local_b00);
                          auVar278 = ZEXT3264(local_ae0);
                          auVar267._8_4_ = 0x7fffffff;
                          auVar267._0_8_ = 0x7fffffff7fffffff;
                          auVar267._12_4_ = 0x7fffffff;
                        }
                        auVar157 = vmovdqa64_avx512f(local_900);
                        uVar29 = vptestmd_avx512f(auVar157,auVar157);
                        if ((short)uVar29 != 0) {
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar250 = ZEXT1664(auVar250._0_16_);
                            auVar260 = ZEXT1664(auVar260._0_16_);
                            auVar271 = ZEXT1664(auVar271._0_16_);
                            auVar275 = ZEXT1664(auVar275._0_16_);
                            (*p_Var10)(&local_b90);
                            auVar259 = ZEXT1664(ZEXT416((uint)fVar253));
                            auVar266 = ZEXT1664(auVar265);
                            auVar277 = ZEXT3264(local_b00);
                            auVar278 = ZEXT3264(local_ae0);
                            auVar267._8_4_ = 0x7fffffff;
                            auVar267._0_8_ = 0x7fffffff7fffffff;
                            auVar267._12_4_ = 0x7fffffff;
                          }
                          auVar157 = vmovdqa64_avx512f(local_900);
                          uVar102 = vptestmd_avx512f(auVar157,auVar157);
                          if ((short)uVar102 != 0) {
                            iVar3 = *(int *)(local_b90.hit + 4);
                            iVar4 = *(int *)(local_b90.hit + 8);
                            iVar1 = *(int *)(local_b90.hit + 0xc);
                            iVar70 = *(int *)(local_b90.hit + 0x10);
                            iVar71 = *(int *)(local_b90.hit + 0x14);
                            iVar72 = *(int *)(local_b90.hit + 0x18);
                            iVar73 = *(int *)(local_b90.hit + 0x1c);
                            iVar74 = *(int *)(local_b90.hit + 0x20);
                            iVar75 = *(int *)(local_b90.hit + 0x24);
                            iVar76 = *(int *)(local_b90.hit + 0x28);
                            iVar77 = *(int *)(local_b90.hit + 0x2c);
                            iVar78 = *(int *)(local_b90.hit + 0x30);
                            iVar79 = *(int *)(local_b90.hit + 0x34);
                            iVar80 = *(int *)(local_b90.hit + 0x38);
                            iVar81 = *(int *)(local_b90.hit + 0x3c);
                            bVar93 = (byte)uVar102;
                            bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar102 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar102 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar102 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar102 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar102 >> 7) & 1);
                            bVar92 = (byte)(uVar102 >> 8);
                            bVar19 = (bool)((byte)(uVar102 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar102 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar102 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar102 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar102 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar102 >> 0xe) & 1);
                            bVar25 = SUB81(uVar102 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x300) =
                                 (uint)(bVar93 & 1) * *(int *)local_b90.hit |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x300);
                            *(uint *)(local_b90.ray + 0x304) =
                                 (uint)bVar101 * iVar3 |
                                 (uint)!bVar101 * *(int *)(local_b90.ray + 0x304);
                            *(uint *)(local_b90.ray + 0x308) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x308);
                            *(uint *)(local_b90.ray + 0x30c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x30c);
                            *(uint *)(local_b90.ray + 0x310) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x310);
                            *(uint *)(local_b90.ray + 0x314) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x314);
                            *(uint *)(local_b90.ray + 0x318) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x318);
                            *(uint *)(local_b90.ray + 0x31c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x31c);
                            *(uint *)(local_b90.ray + 800) =
                                 (uint)(bVar92 & 1) * iVar74 |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b90.ray + 800);
                            *(uint *)(local_b90.ray + 0x324) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x324);
                            *(uint *)(local_b90.ray + 0x328) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x328);
                            *(uint *)(local_b90.ray + 0x32c) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x32c);
                            *(uint *)(local_b90.ray + 0x330) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x330);
                            *(uint *)(local_b90.ray + 0x334) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x334);
                            *(uint *)(local_b90.ray + 0x338) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x338);
                            *(uint *)(local_b90.ray + 0x33c) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x33c);
                            iVar3 = *(int *)(local_b90.hit + 0x44);
                            iVar4 = *(int *)(local_b90.hit + 0x48);
                            iVar1 = *(int *)(local_b90.hit + 0x4c);
                            iVar70 = *(int *)(local_b90.hit + 0x50);
                            iVar71 = *(int *)(local_b90.hit + 0x54);
                            iVar72 = *(int *)(local_b90.hit + 0x58);
                            iVar73 = *(int *)(local_b90.hit + 0x5c);
                            iVar74 = *(int *)(local_b90.hit + 0x60);
                            iVar75 = *(int *)(local_b90.hit + 100);
                            iVar76 = *(int *)(local_b90.hit + 0x68);
                            iVar77 = *(int *)(local_b90.hit + 0x6c);
                            iVar78 = *(int *)(local_b90.hit + 0x70);
                            iVar79 = *(int *)(local_b90.hit + 0x74);
                            iVar80 = *(int *)(local_b90.hit + 0x78);
                            iVar81 = *(int *)(local_b90.hit + 0x7c);
                            bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar102 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar102 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar102 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar102 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar102 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar102 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar102 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar102 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar102 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar102 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar102 >> 0xe) & 1);
                            bVar25 = SUB81(uVar102 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x340) =
                                 (uint)(bVar93 & 1) * *(int *)(local_b90.hit + 0x40) |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x340);
                            *(uint *)(local_b90.ray + 0x344) =
                                 (uint)bVar101 * iVar3 |
                                 (uint)!bVar101 * *(int *)(local_b90.ray + 0x344);
                            *(uint *)(local_b90.ray + 0x348) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x348);
                            *(uint *)(local_b90.ray + 0x34c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x34c);
                            *(uint *)(local_b90.ray + 0x350) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x350);
                            *(uint *)(local_b90.ray + 0x354) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x354);
                            *(uint *)(local_b90.ray + 0x358) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x358);
                            *(uint *)(local_b90.ray + 0x35c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x35c);
                            *(uint *)(local_b90.ray + 0x360) =
                                 (uint)(bVar92 & 1) * iVar74 |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b90.ray + 0x360);
                            *(uint *)(local_b90.ray + 0x364) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x364);
                            *(uint *)(local_b90.ray + 0x368) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x368);
                            *(uint *)(local_b90.ray + 0x36c) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x36c);
                            *(uint *)(local_b90.ray + 0x370) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x370);
                            *(uint *)(local_b90.ray + 0x374) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x374);
                            *(uint *)(local_b90.ray + 0x378) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x378);
                            *(uint *)(local_b90.ray + 0x37c) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x37c);
                            iVar3 = *(int *)(local_b90.hit + 0x84);
                            iVar4 = *(int *)(local_b90.hit + 0x88);
                            iVar1 = *(int *)(local_b90.hit + 0x8c);
                            iVar70 = *(int *)(local_b90.hit + 0x90);
                            iVar71 = *(int *)(local_b90.hit + 0x94);
                            iVar72 = *(int *)(local_b90.hit + 0x98);
                            iVar73 = *(int *)(local_b90.hit + 0x9c);
                            iVar74 = *(int *)(local_b90.hit + 0xa0);
                            iVar75 = *(int *)(local_b90.hit + 0xa4);
                            iVar76 = *(int *)(local_b90.hit + 0xa8);
                            iVar77 = *(int *)(local_b90.hit + 0xac);
                            iVar78 = *(int *)(local_b90.hit + 0xb0);
                            iVar79 = *(int *)(local_b90.hit + 0xb4);
                            iVar80 = *(int *)(local_b90.hit + 0xb8);
                            iVar81 = *(int *)(local_b90.hit + 0xbc);
                            bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar102 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar102 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar102 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar102 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar102 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar102 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar102 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar102 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar102 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar102 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar102 >> 0xe) & 1);
                            bVar25 = SUB81(uVar102 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x380) =
                                 (uint)(bVar93 & 1) * *(int *)(local_b90.hit + 0x80) |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x380);
                            *(uint *)(local_b90.ray + 900) =
                                 (uint)bVar101 * iVar3 |
                                 (uint)!bVar101 * *(int *)(local_b90.ray + 900);
                            *(uint *)(local_b90.ray + 0x388) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x388);
                            *(uint *)(local_b90.ray + 0x38c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x38c);
                            *(uint *)(local_b90.ray + 0x390) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x390);
                            *(uint *)(local_b90.ray + 0x394) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x394);
                            *(uint *)(local_b90.ray + 0x398) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x398);
                            *(uint *)(local_b90.ray + 0x39c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x39c);
                            *(uint *)(local_b90.ray + 0x3a0) =
                                 (uint)(bVar92 & 1) * iVar74 |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b90.ray + 0x3a0);
                            *(uint *)(local_b90.ray + 0x3a4) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x3a4);
                            *(uint *)(local_b90.ray + 0x3a8) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x3a8);
                            *(uint *)(local_b90.ray + 0x3ac) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x3ac);
                            *(uint *)(local_b90.ray + 0x3b0) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x3b0);
                            *(uint *)(local_b90.ray + 0x3b4) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x3b4);
                            *(uint *)(local_b90.ray + 0x3b8) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x3b8);
                            *(uint *)(local_b90.ray + 0x3bc) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x3bc);
                            iVar3 = *(int *)(local_b90.hit + 0xc4);
                            iVar4 = *(int *)(local_b90.hit + 200);
                            iVar1 = *(int *)(local_b90.hit + 0xcc);
                            iVar70 = *(int *)(local_b90.hit + 0xd0);
                            iVar71 = *(int *)(local_b90.hit + 0xd4);
                            iVar72 = *(int *)(local_b90.hit + 0xd8);
                            iVar73 = *(int *)(local_b90.hit + 0xdc);
                            iVar74 = *(int *)(local_b90.hit + 0xe0);
                            iVar75 = *(int *)(local_b90.hit + 0xe4);
                            iVar76 = *(int *)(local_b90.hit + 0xe8);
                            iVar77 = *(int *)(local_b90.hit + 0xec);
                            iVar78 = *(int *)(local_b90.hit + 0xf0);
                            iVar79 = *(int *)(local_b90.hit + 0xf4);
                            iVar80 = *(int *)(local_b90.hit + 0xf8);
                            iVar81 = *(int *)(local_b90.hit + 0xfc);
                            bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar102 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar102 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar102 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar102 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar102 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar102 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar102 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar102 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar102 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar102 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar102 >> 0xe) & 1);
                            bVar25 = SUB81(uVar102 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x3c0) =
                                 (uint)(bVar93 & 1) * *(int *)(local_b90.hit + 0xc0) |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x3c0);
                            *(uint *)(local_b90.ray + 0x3c4) =
                                 (uint)bVar101 * iVar3 |
                                 (uint)!bVar101 * *(int *)(local_b90.ray + 0x3c4);
                            *(uint *)(local_b90.ray + 0x3c8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x3c8);
                            *(uint *)(local_b90.ray + 0x3cc) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x3cc);
                            *(uint *)(local_b90.ray + 0x3d0) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x3d0);
                            *(uint *)(local_b90.ray + 0x3d4) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x3d4);
                            *(uint *)(local_b90.ray + 0x3d8) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x3d8);
                            *(uint *)(local_b90.ray + 0x3dc) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x3dc);
                            *(uint *)(local_b90.ray + 0x3e0) =
                                 (uint)(bVar92 & 1) * iVar74 |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b90.ray + 0x3e0);
                            *(uint *)(local_b90.ray + 0x3e4) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x3e4);
                            *(uint *)(local_b90.ray + 1000) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 1000);
                            *(uint *)(local_b90.ray + 0x3ec) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x3ec);
                            *(uint *)(local_b90.ray + 0x3f0) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x3f0);
                            *(uint *)(local_b90.ray + 0x3f4) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x3f4);
                            *(uint *)(local_b90.ray + 0x3f8) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x3f8);
                            *(uint *)(local_b90.ray + 0x3fc) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x3fc);
                            iVar3 = *(int *)(local_b90.hit + 0x104);
                            iVar4 = *(int *)(local_b90.hit + 0x108);
                            iVar1 = *(int *)(local_b90.hit + 0x10c);
                            iVar70 = *(int *)(local_b90.hit + 0x110);
                            iVar71 = *(int *)(local_b90.hit + 0x114);
                            iVar72 = *(int *)(local_b90.hit + 0x118);
                            iVar73 = *(int *)(local_b90.hit + 0x11c);
                            iVar74 = *(int *)(local_b90.hit + 0x120);
                            iVar75 = *(int *)(local_b90.hit + 0x124);
                            iVar76 = *(int *)(local_b90.hit + 0x128);
                            iVar77 = *(int *)(local_b90.hit + 300);
                            iVar78 = *(int *)(local_b90.hit + 0x130);
                            iVar79 = *(int *)(local_b90.hit + 0x134);
                            iVar80 = *(int *)(local_b90.hit + 0x138);
                            iVar81 = *(int *)(local_b90.hit + 0x13c);
                            bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar102 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar102 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar102 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar102 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar102 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar102 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar102 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar102 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar102 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar102 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar102 >> 0xe) & 1);
                            bVar25 = SUB81(uVar102 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x400) =
                                 (uint)(bVar93 & 1) * *(int *)(local_b90.hit + 0x100) |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x400);
                            *(uint *)(local_b90.ray + 0x404) =
                                 (uint)bVar101 * iVar3 |
                                 (uint)!bVar101 * *(int *)(local_b90.ray + 0x404);
                            *(uint *)(local_b90.ray + 0x408) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x408);
                            *(uint *)(local_b90.ray + 0x40c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x40c);
                            *(uint *)(local_b90.ray + 0x410) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x410);
                            *(uint *)(local_b90.ray + 0x414) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x414);
                            *(uint *)(local_b90.ray + 0x418) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x418);
                            *(uint *)(local_b90.ray + 0x41c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x41c);
                            *(uint *)(local_b90.ray + 0x420) =
                                 (uint)(bVar92 & 1) * iVar74 |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b90.ray + 0x420);
                            *(uint *)(local_b90.ray + 0x424) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x424);
                            *(uint *)(local_b90.ray + 0x428) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x428);
                            *(uint *)(local_b90.ray + 0x42c) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x42c);
                            *(uint *)(local_b90.ray + 0x430) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x430);
                            *(uint *)(local_b90.ray + 0x434) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x434);
                            *(uint *)(local_b90.ray + 0x438) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x438);
                            *(uint *)(local_b90.ray + 0x43c) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x43c);
                            auVar187 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x140));
                            auVar187 = vmovdqu32_avx512f(auVar187);
                            *(undefined1 (*) [64])(local_b90.ray + 0x440) = auVar187;
                            auVar187 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x180));
                            auVar187 = vmovdqu32_avx512f(auVar187);
                            *(undefined1 (*) [64])(local_b90.ray + 0x480) = auVar187;
                            auVar226 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x1c0));
                            auVar187 = vmovdqa32_avx512f(auVar226);
                            *(undefined1 (*) [64])(local_b90.ray + 0x4c0) = auVar187;
                            auVar187 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x200));
                            bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                            auVar65._4_56_ = auVar187._8_56_;
                            auVar65._0_4_ =
                                 (uint)bVar101 * auVar187._4_4_ | (uint)!bVar101 * auVar226._4_4_;
                            auVar157._0_8_ = auVar65._0_8_ << 0x20;
                            bVar101 = (bool)((byte)(uVar102 >> 2) & 1);
                            auVar157._8_4_ =
                                 (uint)bVar101 * auVar187._8_4_ | (uint)!bVar101 * auVar226._8_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 3) & 1);
                            auVar157._12_4_ =
                                 (uint)bVar101 * auVar187._12_4_ | (uint)!bVar101 * auVar226._12_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 4) & 1);
                            auVar157._16_4_ =
                                 (uint)bVar101 * auVar187._16_4_ | (uint)!bVar101 * auVar226._16_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 5) & 1);
                            auVar157._20_4_ =
                                 (uint)bVar101 * auVar187._20_4_ | (uint)!bVar101 * auVar226._20_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 6) & 1);
                            auVar157._24_4_ =
                                 (uint)bVar101 * auVar187._24_4_ | (uint)!bVar101 * auVar226._24_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 7) & 1);
                            auVar157._28_4_ =
                                 (uint)bVar101 * auVar187._28_4_ | (uint)!bVar101 * auVar226._28_4_;
                            auVar157._32_4_ =
                                 (uint)(bVar92 & 1) * auVar187._32_4_ |
                                 (uint)!(bool)(bVar92 & 1) * auVar226._32_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 9) & 1);
                            auVar157._36_4_ =
                                 (uint)bVar101 * auVar187._36_4_ | (uint)!bVar101 * auVar226._36_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 10) & 1);
                            auVar157._40_4_ =
                                 (uint)bVar101 * auVar187._40_4_ | (uint)!bVar101 * auVar226._40_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 0xb) & 1);
                            auVar157._44_4_ =
                                 (uint)bVar101 * auVar187._44_4_ | (uint)!bVar101 * auVar226._44_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 0xc) & 1);
                            auVar157._48_4_ =
                                 (uint)bVar101 * auVar187._48_4_ | (uint)!bVar101 * auVar226._48_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 0xd) & 1);
                            auVar157._52_4_ =
                                 (uint)bVar101 * auVar187._52_4_ | (uint)!bVar101 * auVar226._52_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 0xe) & 1);
                            auVar157._56_4_ =
                                 (uint)bVar101 * auVar187._56_4_ | (uint)!bVar101 * auVar226._56_4_;
                            bVar101 = SUB81(uVar102 >> 0xf,0);
                            auVar157._60_4_ =
                                 (uint)bVar101 * auVar187._60_4_ | (uint)!bVar101 * auVar226._60_4_;
                            auVar187 = vmovdqa32_avx512f(auVar187);
                            *(undefined1 (*) [64])(local_b90.ray + 0x500) = auVar187;
                            goto LAB_01e14696;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar254;
                      }
                    }
                  }
                }
LAB_01e14696:
                auVar116 = auVar157._32_32_;
                bVar101 = lVar100 != 0;
                lVar100 = lVar100 + -1;
              } while ((!bVar12) && (bVar101));
              auVar84._4_4_ = fStack_87c;
              auVar84._0_4_ = local_880;
              auVar84._8_4_ = fStack_878;
              auVar84._12_4_ = fStack_874;
              auVar84._16_4_ = fStack_870;
              auVar84._20_4_ = fStack_86c;
              auVar84._24_4_ = fStack_868;
              auVar84._28_4_ = fStack_864;
              uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar38._4_4_ = uVar5;
              auVar38._0_4_ = uVar5;
              auVar38._8_4_ = uVar5;
              auVar38._12_4_ = uVar5;
              auVar38._16_4_ = uVar5;
              auVar38._20_4_ = uVar5;
              auVar38._24_4_ = uVar5;
              auVar38._28_4_ = uVar5;
              uVar29 = vcmpps_avx512vl(auVar84,auVar38,2);
              bVar96 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar96 & (byte)uVar29;
            } while (bVar96 != 0);
          }
          auVar183._0_4_ = (float)local_8a0._0_4_ + (float)local_940._0_4_;
          auVar183._4_4_ = (float)local_8a0._4_4_ + (float)local_940._4_4_;
          auVar183._8_4_ = fStack_898 + fStack_938;
          auVar183._12_4_ = fStack_894 + fStack_934;
          auVar183._16_4_ = fStack_890 + fStack_930;
          auVar183._20_4_ = fStack_88c + fStack_92c;
          auVar183._24_4_ = fStack_888 + fStack_928;
          auVar183._28_4_ = fStack_884 + fStack_924;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar39._4_4_ = uVar5;
          auVar39._0_4_ = uVar5;
          auVar39._8_4_ = uVar5;
          auVar39._12_4_ = uVar5;
          auVar39._16_4_ = uVar5;
          auVar39._20_4_ = uVar5;
          auVar39._24_4_ = uVar5;
          auVar39._28_4_ = uVar5;
          uVar29 = vcmpps_avx512vl(auVar183,auVar39,2);
          bVar97 = (byte)uVar27 | ~bVar97;
          bVar91 = (byte)uVar28 & bVar91 & (byte)uVar29;
          auVar184._8_4_ = 2;
          auVar184._0_8_ = 0x200000002;
          auVar184._12_4_ = 2;
          auVar184._16_4_ = 2;
          auVar184._20_4_ = 2;
          auVar184._24_4_ = 2;
          auVar184._28_4_ = 2;
          auVar40._8_4_ = 3;
          auVar40._0_8_ = 0x300000003;
          auVar40._12_4_ = 3;
          auVar40._16_4_ = 3;
          auVar40._20_4_ = 3;
          auVar40._24_4_ = 3;
          auVar40._28_4_ = 3;
          auVar118 = vpblendmd_avx512vl(auVar184,auVar40);
          local_8a0._0_4_ = (uint)(bVar97 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar97 & 1) * 2;
          bVar12 = (bool)(bVar97 >> 1 & 1);
          local_8a0._4_4_ = (uint)bVar12 * auVar118._4_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar97 >> 2 & 1);
          fStack_898 = (float)((uint)bVar12 * auVar118._8_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar97 >> 3 & 1);
          fStack_894 = (float)((uint)bVar12 * auVar118._12_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar97 >> 4 & 1);
          fStack_890 = (float)((uint)bVar12 * auVar118._16_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar97 >> 5 & 1);
          fStack_88c = (float)((uint)bVar12 * auVar118._20_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar97 >> 6 & 1);
          fStack_888 = (float)((uint)bVar12 * auVar118._24_4_ | (uint)!bVar12 * 2);
          fStack_884 = (float)((uint)(bVar97 >> 7) * auVar118._28_4_ |
                              (uint)!(bool)(bVar97 >> 7) * 2);
          auVar160._32_32_ = auVar116;
          auVar160._0_32_ = _local_8a0;
          uVar27 = vpcmpd_avx512vl(_local_8a0,local_820,2);
          bVar97 = (byte)uVar27 & bVar91;
          if (bVar97 != 0) {
            auVar265 = vminps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar107 = vmaxps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar104 = vminps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar6 = vminps_avx(auVar265,auVar104);
            auVar265 = vmaxps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar104 = vmaxps_avx(auVar107,auVar265);
            auVar107 = vandps_avx(auVar267,auVar6);
            auVar265 = vandps_avx(auVar267,auVar104);
            auVar107 = vmaxps_avx(auVar107,auVar265);
            auVar265 = vmovshdup_avx(auVar107);
            auVar265 = vmaxss_avx(auVar265,auVar107);
            auVar107 = vshufpd_avx(auVar107,auVar107,1);
            auVar107 = vmaxss_avx(auVar107,auVar265);
            fVar168 = auVar107._0_4_ * 1.9073486e-06;
            local_9d0 = vshufps_avx(auVar104,auVar104,0xff);
            _local_960 = _local_7c0;
            local_880 = (float)local_7c0._0_4_ + (float)local_940._0_4_;
            fStack_87c = (float)local_7c0._4_4_ + (float)local_940._4_4_;
            fStack_878 = fStack_7b8 + fStack_938;
            fStack_874 = fStack_7b4 + fStack_934;
            fStack_870 = fStack_7b0 + fStack_930;
            fStack_86c = fStack_7ac + fStack_92c;
            fStack_868 = fStack_7a8 + fStack_928;
            fStack_864 = fStack_7a4 + fStack_924;
            do {
              auVar185._8_4_ = 0x7f800000;
              auVar185._0_8_ = 0x7f8000007f800000;
              auVar185._12_4_ = 0x7f800000;
              auVar185._16_4_ = 0x7f800000;
              auVar185._20_4_ = 0x7f800000;
              auVar185._24_4_ = 0x7f800000;
              auVar185._28_4_ = 0x7f800000;
              auVar118 = vblendmps_avx512vl(auVar185,_local_960);
              auVar153._0_4_ =
                   (uint)(bVar97 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar97 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar97 >> 1 & 1);
              auVar153._4_4_ = (uint)bVar12 * auVar118._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar97 >> 2 & 1);
              auVar153._8_4_ = (uint)bVar12 * auVar118._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar97 >> 3 & 1);
              auVar153._12_4_ = (uint)bVar12 * auVar118._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar97 >> 4 & 1);
              auVar153._16_4_ = (uint)bVar12 * auVar118._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar97 >> 5 & 1);
              auVar153._20_4_ = (uint)bVar12 * auVar118._20_4_ | (uint)!bVar12 * 0x7f800000;
              auVar153._24_4_ =
                   (uint)(bVar97 >> 6) * auVar118._24_4_ | (uint)!(bool)(bVar97 >> 6) * 0x7f800000;
              auVar153._28_4_ = 0x7f800000;
              auVar160._0_32_ = auVar153;
              auVar118 = vshufps_avx(auVar153,auVar153,0xb1);
              auVar118 = vminps_avx(auVar153,auVar118);
              auVar116 = vshufpd_avx(auVar118,auVar118,5);
              auVar118 = vminps_avx(auVar118,auVar116);
              auVar116 = vpermpd_avx2(auVar118,0x4e);
              auVar118 = vminps_avx(auVar118,auVar116);
              uVar27 = vcmpps_avx512vl(auVar153,auVar118,0);
              bVar93 = (byte)uVar27 & bVar97;
              bVar96 = bVar97;
              if (bVar93 != 0) {
                bVar96 = bVar93;
              }
              iVar2 = 0;
              for (uVar103 = (uint)bVar96; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x80000000)
              {
                iVar2 = iVar2 + 1;
              }
              uVar103 = *(uint *)(local_860 + (uint)(iVar2 << 2));
              uVar161 = *(uint *)(local_7a0 + (uint)(iVar2 << 2));
              fVar252 = auVar106._0_4_;
              if ((float)local_a80._0_4_ < 0.0) {
                fVar252 = sqrtf((float)local_a80._0_4_);
              }
              auVar266 = ZEXT464(uVar103);
              auVar260 = ZEXT464(uVar161);
              lVar100 = 4;
              do {
                auVar118 = auVar160._32_32_;
                fVar253 = auVar260._0_4_;
                auVar174._4_4_ = fVar253;
                auVar174._0_4_ = fVar253;
                auVar174._8_4_ = fVar253;
                auVar174._12_4_ = fVar253;
                auVar107 = vfmadd132ps_fma(auVar174,ZEXT816(0) << 0x40,local_a70);
                fVar264 = auVar266._0_4_;
                fVar249 = 1.0 - fVar264;
                fVar262 = fVar249 * fVar249 * fVar249;
                fVar254 = fVar264 * fVar264;
                fVar255 = fVar264 * fVar254;
                auVar265 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar262),
                                           ZEXT416((uint)fVar255));
                fVar261 = fVar264 * fVar249;
                auVar105 = ZEXT416((uint)fVar249);
                auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar264 * fVar261 * 6.0)),
                                         ZEXT416((uint)(fVar261 * fVar249)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar104 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar255),
                                           ZEXT416((uint)fVar262));
                auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar261 * fVar249 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar264 * fVar261)));
                fVar262 = fVar262 * 0.16666667;
                fVar263 = (auVar265._0_4_ + auVar6._0_4_) * 0.16666667;
                fVar230 = (auVar104._0_4_ + auVar108._0_4_) * 0.16666667;
                fVar255 = fVar255 * 0.16666667;
                auVar219._0_4_ = fVar255 * (float)local_a60._0_4_;
                auVar219._4_4_ = fVar255 * (float)local_a60._4_4_;
                auVar219._8_4_ = fVar255 * fStack_a58;
                auVar219._12_4_ = fVar255 * fStack_a54;
                auVar242._4_4_ = fVar230;
                auVar242._0_4_ = fVar230;
                auVar242._8_4_ = fVar230;
                auVar242._12_4_ = fVar230;
                auVar265 = vfmadd132ps_fma(auVar242,auVar219,local_a20._0_16_);
                auVar220._4_4_ = fVar263;
                auVar220._0_4_ = fVar263;
                auVar220._8_4_ = fVar263;
                auVar220._12_4_ = fVar263;
                auVar265 = vfmadd132ps_fma(auVar220,auVar265,local_a40._0_16_);
                auVar201._4_4_ = fVar262;
                auVar201._0_4_ = fVar262;
                auVar201._8_4_ = fVar262;
                auVar201._12_4_ = fVar262;
                auVar265 = vfmadd132ps_fma(auVar201,auVar265,local_a00._0_16_);
                local_920._0_16_ = auVar265;
                auVar107 = vsubps_avx(auVar107,auVar265);
                local_aa0._0_16_ = auVar107;
                auVar107 = vdpps_avx(auVar107,auVar107,0x7f);
                auVar265 = auVar266._0_16_;
                local_ac0._0_16_ = auVar107;
                if (auVar107._0_4_ < 0.0) {
                  local_b60._0_4_ = fVar254;
                  auVar259._0_4_ = sqrtf(auVar107._0_4_);
                  auVar259._4_60_ = extraout_var_01;
                  auVar107 = auVar259._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar107,auVar107);
                  local_b60._0_4_ = fVar254;
                }
                auVar6 = vfnmsub213ss_fma(auVar265,auVar265,ZEXT416((uint)(fVar261 * 4.0)));
                auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar261 * 4.0)),auVar105,auVar105);
                fVar254 = fVar249 * -fVar249 * 0.5;
                fVar261 = auVar6._0_4_ * 0.5;
                fVar262 = auVar104._0_4_ * 0.5;
                local_b60._0_4_ = (float)local_b60._0_4_ * 0.5;
                auVar234._0_4_ = (float)local_b60._0_4_ * (float)local_a60._0_4_;
                auVar234._4_4_ = (float)local_b60._0_4_ * (float)local_a60._4_4_;
                auVar234._8_4_ = (float)local_b60._0_4_ * fStack_a58;
                auVar234._12_4_ = (float)local_b60._0_4_ * fStack_a54;
                auVar202._4_4_ = fVar262;
                auVar202._0_4_ = fVar262;
                auVar202._8_4_ = fVar262;
                auVar202._12_4_ = fVar262;
                auVar104 = vfmadd132ps_fma(auVar202,auVar234,local_a20._0_16_);
                auVar221._4_4_ = fVar261;
                auVar221._0_4_ = fVar261;
                auVar221._8_4_ = fVar261;
                auVar221._12_4_ = fVar261;
                auVar104 = vfmadd132ps_fma(auVar221,auVar104,local_a40._0_16_);
                auVar273._4_4_ = fVar254;
                auVar273._0_4_ = fVar254;
                auVar273._8_4_ = fVar254;
                auVar273._12_4_ = fVar254;
                local_b60._0_16_ = vfmadd132ps_fma(auVar273,auVar104,local_a00._0_16_);
                local_980 = vdpps_avx(local_b60._0_16_,local_b60._0_16_,0x7f);
                auVar69._12_4_ = 0;
                auVar69._0_12_ = ZEXT812(0);
                fVar254 = local_980._0_4_;
                auVar104 = vrsqrt14ss_avx512f(auVar69 << 0x20,ZEXT416((uint)fVar254));
                fVar261 = auVar104._0_4_;
                local_990 = vrcp14ss_avx512f(auVar69 << 0x20,ZEXT416((uint)fVar254));
                auVar104 = vfnmadd213ss_fma(local_990,local_980,ZEXT416(0x40000000));
                uVar103 = auVar107._0_4_;
                local_970 = fVar249;
                fStack_96c = fVar249;
                fStack_968 = fVar249;
                fStack_964 = fVar249;
                if (fVar254 < -fVar254) {
                  auVar260._0_4_ = sqrtf(fVar254);
                  auVar260._4_60_ = extraout_var_02;
                  auVar107 = ZEXT416(uVar103);
                  auVar108 = auVar260._0_16_;
                  auVar6 = local_b60._0_16_;
                }
                else {
                  auVar108 = vsqrtss_avx512f(local_980,local_980);
                  auVar6 = local_b60._0_16_;
                }
                fVar254 = fVar261 * 1.5 + fVar254 * -0.5 * fVar261 * fVar261 * fVar261;
                auVar175._0_4_ = auVar6._0_4_ * fVar254;
                auVar175._4_4_ = auVar6._4_4_ * fVar254;
                auVar175._8_4_ = auVar6._8_4_ * fVar254;
                auVar175._12_4_ = auVar6._12_4_ * fVar254;
                auVar276 = vdpps_avx(local_aa0._0_16_,auVar175,0x7f);
                fVar263 = auVar107._0_4_;
                fVar261 = auVar276._0_4_;
                auVar176._0_4_ = fVar261 * fVar261;
                auVar176._4_4_ = auVar276._4_4_ * auVar276._4_4_;
                auVar176._8_4_ = auVar276._8_4_ * auVar276._8_4_;
                auVar176._12_4_ = auVar276._12_4_ * auVar276._12_4_;
                auVar109 = vsubps_avx512vl(local_ac0._0_16_,auVar176);
                fVar262 = auVar109._0_4_;
                auVar203._4_12_ = ZEXT812(0) << 0x20;
                auVar203._0_4_ = fVar262;
                auVar110 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar203);
                auVar111 = vmulss_avx512f(auVar110,ZEXT416(0x3fc00000));
                auVar112 = vmulss_avx512f(auVar109,ZEXT416(0xbf000000));
                if (fVar262 < 0.0) {
                  local_9b0 = fVar254;
                  fStack_9ac = fVar254;
                  fStack_9a8 = fVar254;
                  fStack_9a4 = fVar254;
                  local_9a0 = auVar110;
                  fVar262 = sqrtf(fVar262);
                  auVar112 = ZEXT416(auVar112._0_4_);
                  auVar111 = ZEXT416(auVar111._0_4_);
                  auVar108 = ZEXT416(auVar108._0_4_);
                  auVar107 = ZEXT416(uVar103);
                  auVar6 = local_b60._0_16_;
                  auVar110 = local_9a0;
                  fVar254 = local_9b0;
                  fVar230 = fStack_9ac;
                  fVar255 = fStack_9a8;
                  fVar249 = fStack_9a4;
                }
                else {
                  auVar109 = vsqrtss_avx(auVar109,auVar109);
                  fVar262 = auVar109._0_4_;
                  fVar230 = fVar254;
                  fVar255 = fVar254;
                  fVar249 = fVar254;
                }
                auVar275 = ZEXT1664(auVar6);
                auVar258._8_4_ = 0x7fffffff;
                auVar258._0_8_ = 0x7fffffff7fffffff;
                auVar258._12_4_ = 0x7fffffff;
                auVar259 = ZEXT1664(auVar258);
                auVar278 = ZEXT3264(local_ae0);
                auVar266._32_32_ = auVar118;
                auVar266._0_32_ = local_b00;
                auVar277 = ZEXT3264(local_b00);
                auVar109 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar105,auVar265);
                auVar265 = vfmadd231ss_fma(auVar105,auVar265,SUB6416(ZEXT464(0xc0000000),0));
                auVar222._0_4_ = fVar264 * (float)local_a60._0_4_;
                auVar222._4_4_ = fVar264 * (float)local_a60._4_4_;
                auVar222._8_4_ = fVar264 * fStack_a58;
                auVar222._12_4_ = fVar264 * fStack_a54;
                auVar235._0_4_ = auVar265._0_4_;
                auVar235._4_4_ = auVar235._0_4_;
                auVar235._8_4_ = auVar235._0_4_;
                auVar235._12_4_ = auVar235._0_4_;
                auVar265 = vfmadd132ps_fma(auVar235,auVar222,local_a20._0_16_);
                auVar204._0_4_ = auVar109._0_4_;
                auVar204._4_4_ = auVar204._0_4_;
                auVar204._8_4_ = auVar204._0_4_;
                auVar204._12_4_ = auVar204._0_4_;
                auVar265 = vfmadd132ps_fma(auVar204,auVar265,local_a40._0_16_);
                auVar83._4_4_ = fStack_96c;
                auVar83._0_4_ = local_970;
                auVar83._8_4_ = fStack_968;
                auVar83._12_4_ = fStack_964;
                auVar265 = vfmadd132ps_fma(auVar83,auVar265,local_a00._0_16_);
                auVar205._0_4_ = auVar265._0_4_ * (float)local_980._0_4_;
                auVar205._4_4_ = auVar265._4_4_ * (float)local_980._0_4_;
                auVar205._8_4_ = auVar265._8_4_ * (float)local_980._0_4_;
                auVar205._12_4_ = auVar265._12_4_ * (float)local_980._0_4_;
                auVar265 = vdpps_avx(auVar6,auVar265,0x7f);
                fVar213 = auVar265._0_4_;
                auVar223._0_4_ = auVar6._0_4_ * fVar213;
                auVar223._4_4_ = auVar6._4_4_ * fVar213;
                auVar223._8_4_ = auVar6._8_4_ * fVar213;
                auVar223._12_4_ = auVar6._12_4_ * fVar213;
                auVar265 = vsubps_avx(auVar205,auVar223);
                fVar213 = auVar104._0_4_ * (float)local_990._0_4_;
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar160._16_48_ = auVar266._16_48_;
                auVar109 = vxorps_avx512vl(auVar6,auVar31);
                auVar243._0_4_ = fVar254 * auVar265._0_4_ * fVar213;
                auVar243._4_4_ = fVar230 * auVar265._4_4_ * fVar213;
                auVar243._8_4_ = fVar255 * auVar265._8_4_ * fVar213;
                auVar243._12_4_ = fVar249 * auVar265._12_4_ * fVar213;
                auVar271 = ZEXT1664(auVar175);
                auVar265 = vdpps_avx(auVar109,auVar175,0x7f);
                auVar105 = vmaxss_avx(ZEXT416((uint)fVar168),
                                      ZEXT416((uint)(fVar253 * fVar252 * 1.9073486e-06)));
                auVar108 = vdivss_avx512f(ZEXT416((uint)fVar168),auVar108);
                auVar104 = vdpps_avx(local_aa0._0_16_,auVar243,0x7f);
                auVar107 = vfmadd213ss_fma(auVar107,ZEXT416((uint)fVar168),auVar105);
                auVar108 = vfmadd213ss_fma(ZEXT416((uint)(fVar263 + 1.0)),auVar108,auVar107);
                auVar107 = vdpps_avx(local_a70,auVar175,0x7f);
                fVar254 = auVar265._0_4_ + auVar104._0_4_;
                auVar265 = vdpps_avx(local_aa0._0_16_,auVar109,0x7f);
                auVar109 = vmulss_avx512f(auVar112,auVar110);
                auVar110 = vmulss_avx512f(auVar110,auVar110);
                auVar104 = vdpps_avx(local_aa0._0_16_,local_a70,0x7f);
                auVar160._0_16_ =
                     vaddss_avx512f(auVar111,ZEXT416((uint)(auVar109._0_4_ * auVar110._0_4_)));
                auVar110 = vfnmadd231ss_fma(auVar265,auVar276,ZEXT416((uint)fVar254));
                auVar109 = vfnmadd231ss_fma(auVar104,auVar276,auVar107);
                auVar265 = vpermilps_avx(local_920._0_16_,0xff);
                fVar262 = fVar262 - auVar265._0_4_;
                auVar265 = vshufps_avx(auVar6,auVar6,0xff);
                auVar104 = vfmsub213ss_fma(auVar110,auVar160._0_16_,auVar265);
                fVar263 = auVar109._0_4_ * auVar160._0_4_;
                auVar110 = vfmsub231ss_fma(ZEXT416((uint)(auVar107._0_4_ * auVar104._0_4_)),
                                           ZEXT416((uint)fVar254),ZEXT416((uint)fVar263));
                fVar255 = auVar110._0_4_;
                fVar230 = fVar261 * (auVar104._0_4_ / fVar255);
                auVar250 = ZEXT464((uint)fVar230);
                fVar264 = fVar264 - (fVar261 * (fVar263 / fVar255) -
                                    fVar262 * (auVar107._0_4_ / fVar255));
                auVar266 = ZEXT464((uint)fVar264);
                fVar253 = fVar253 - (fVar262 * (fVar254 / fVar255) - fVar230);
                auVar260 = ZEXT464((uint)fVar253);
                auVar107 = vandps_avx(auVar276,auVar258);
                if (auVar108._0_4_ <= auVar107._0_4_) {
LAB_01e152b4:
                  bVar12 = false;
                }
                else {
                  auVar104 = vfmadd231ss_fma(ZEXT416((uint)(auVar108._0_4_ + auVar105._0_4_)),
                                             local_9d0,ZEXT416(0x36000000));
                  auVar107 = vandps_avx(auVar258,ZEXT416((uint)fVar262));
                  if (auVar104._0_4_ <= auVar107._0_4_) goto LAB_01e152b4;
                  fVar253 = fVar253 + (float)local_9c0._0_4_;
                  auVar260 = ZEXT464((uint)fVar253);
                  bVar12 = true;
                  if ((((fVar231 <= fVar253) &&
                       (fVar254 = *(float *)(ray + k * 4 + 0x200), fVar253 <= fVar254)) &&
                      (0.0 <= fVar264)) && (fVar264 <= 1.0)) {
                    auVar159._16_48_ = auVar160._16_48_;
                    auVar159._0_16_ = ZEXT816(0) << 0x20;
                    auVar158._4_60_ = auVar159._4_60_;
                    auVar158._0_4_ = local_ac0._0_4_;
                    auVar107 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar158._0_16_);
                    fVar261 = auVar107._0_4_;
                    auVar160._0_16_ = vmulss_avx512f(local_ac0._0_16_,ZEXT416(0xbf000000));
                    pGVar9 = (context->scene->geometries).items[uVar99].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      fVar261 = fVar261 * 1.5 + auVar160._0_4_ * fVar261 * fVar261 * fVar261;
                      auVar206._0_4_ = local_aa0._0_4_ * fVar261;
                      auVar206._4_4_ = local_aa0._4_4_ * fVar261;
                      auVar206._8_4_ = local_aa0._8_4_ * fVar261;
                      auVar206._12_4_ = local_aa0._12_4_ * fVar261;
                      auVar108 = vfmadd213ps_fma(auVar265,auVar206,auVar6);
                      auVar107 = vshufps_avx(auVar206,auVar206,0xc9);
                      auVar265 = vshufps_avx(auVar6,auVar6,0xc9);
                      auVar207._0_4_ = auVar206._0_4_ * auVar265._0_4_;
                      auVar207._4_4_ = auVar206._4_4_ * auVar265._4_4_;
                      auVar207._8_4_ = auVar206._8_4_ * auVar265._8_4_;
                      auVar207._12_4_ = auVar206._12_4_ * auVar265._12_4_;
                      auVar104 = vfmsub231ps_fma(auVar207,auVar6,auVar107);
                      auVar107 = vshufps_avx(auVar104,auVar104,0xc9);
                      auVar265 = vshufps_avx(auVar108,auVar108,0xc9);
                      auVar104 = vshufps_avx(auVar104,auVar104,0xd2);
                      auVar177._0_4_ = auVar108._0_4_ * auVar104._0_4_;
                      auVar177._4_4_ = auVar108._4_4_ * auVar104._4_4_;
                      auVar177._8_4_ = auVar108._8_4_ * auVar104._8_4_;
                      auVar177._12_4_ = auVar108._12_4_ * auVar104._12_4_;
                      auVar107 = vfmsub231ps_fma(auVar177,auVar107,auVar265);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar253;
                        uVar5 = vextractps_avx(auVar107,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar5;
                        uVar5 = vextractps_avx(auVar107,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar5;
                        *(int *)(ray + k * 4 + 0x380) = auVar107._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar264;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(uint *)(ray + k * 4 + 0x440) = uVar8;
                        *(uint *)(ray + k * 4 + 0x480) = uVar99;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar11 = context->user;
                        auVar265 = ZEXT416((uint)fVar264);
                        local_340 = vbroadcastss_avx512f(auVar265);
                        auVar187 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar187 = vpermps_avx512f(auVar187,ZEXT1664(auVar107));
                        auVar226 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar226,ZEXT1664(auVar107));
                        local_380 = vbroadcastss_avx512f(auVar107);
                        local_400[0] = (RTCHitN)auVar187[0];
                        local_400[1] = (RTCHitN)auVar187[1];
                        local_400[2] = (RTCHitN)auVar187[2];
                        local_400[3] = (RTCHitN)auVar187[3];
                        local_400[4] = (RTCHitN)auVar187[4];
                        local_400[5] = (RTCHitN)auVar187[5];
                        local_400[6] = (RTCHitN)auVar187[6];
                        local_400[7] = (RTCHitN)auVar187[7];
                        local_400[8] = (RTCHitN)auVar187[8];
                        local_400[9] = (RTCHitN)auVar187[9];
                        local_400[10] = (RTCHitN)auVar187[10];
                        local_400[0xb] = (RTCHitN)auVar187[0xb];
                        local_400[0xc] = (RTCHitN)auVar187[0xc];
                        local_400[0xd] = (RTCHitN)auVar187[0xd];
                        local_400[0xe] = (RTCHitN)auVar187[0xe];
                        local_400[0xf] = (RTCHitN)auVar187[0xf];
                        local_400[0x10] = (RTCHitN)auVar187[0x10];
                        local_400[0x11] = (RTCHitN)auVar187[0x11];
                        local_400[0x12] = (RTCHitN)auVar187[0x12];
                        local_400[0x13] = (RTCHitN)auVar187[0x13];
                        local_400[0x14] = (RTCHitN)auVar187[0x14];
                        local_400[0x15] = (RTCHitN)auVar187[0x15];
                        local_400[0x16] = (RTCHitN)auVar187[0x16];
                        local_400[0x17] = (RTCHitN)auVar187[0x17];
                        local_400[0x18] = (RTCHitN)auVar187[0x18];
                        local_400[0x19] = (RTCHitN)auVar187[0x19];
                        local_400[0x1a] = (RTCHitN)auVar187[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar187[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar187[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar187[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar187[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar187[0x1f];
                        local_400[0x20] = (RTCHitN)auVar187[0x20];
                        local_400[0x21] = (RTCHitN)auVar187[0x21];
                        local_400[0x22] = (RTCHitN)auVar187[0x22];
                        local_400[0x23] = (RTCHitN)auVar187[0x23];
                        local_400[0x24] = (RTCHitN)auVar187[0x24];
                        local_400[0x25] = (RTCHitN)auVar187[0x25];
                        local_400[0x26] = (RTCHitN)auVar187[0x26];
                        local_400[0x27] = (RTCHitN)auVar187[0x27];
                        local_400[0x28] = (RTCHitN)auVar187[0x28];
                        local_400[0x29] = (RTCHitN)auVar187[0x29];
                        local_400[0x2a] = (RTCHitN)auVar187[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar187[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar187[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar187[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar187[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar187[0x2f];
                        local_400[0x30] = (RTCHitN)auVar187[0x30];
                        local_400[0x31] = (RTCHitN)auVar187[0x31];
                        local_400[0x32] = (RTCHitN)auVar187[0x32];
                        local_400[0x33] = (RTCHitN)auVar187[0x33];
                        local_400[0x34] = (RTCHitN)auVar187[0x34];
                        local_400[0x35] = (RTCHitN)auVar187[0x35];
                        local_400[0x36] = (RTCHitN)auVar187[0x36];
                        local_400[0x37] = (RTCHitN)auVar187[0x37];
                        local_400[0x38] = (RTCHitN)auVar187[0x38];
                        local_400[0x39] = (RTCHitN)auVar187[0x39];
                        local_400[0x3a] = (RTCHitN)auVar187[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar187[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar187[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar187[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar187[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar187[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar187 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar187);
                        auVar118 = vpcmpeqd_avx2(auVar187._0_32_,auVar187._0_32_);
                        local_b28[3] = auVar118;
                        local_b28[2] = auVar118;
                        local_b28[1] = auVar118;
                        *local_b28 = auVar118;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar11->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar11->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar253;
                        local_900 = local_4c0;
                        local_b90.valid = (int *)local_900;
                        local_b90.geometryUserPtr = pGVar9->userPtr;
                        local_b90.context = context->user;
                        local_b90.hit = local_400;
                        local_b90.N = 0x10;
                        local_b90.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar250 = ZEXT464((uint)fVar230);
                          auVar259 = ZEXT1664(auVar258);
                          auVar271 = ZEXT1664(auVar175);
                          auVar275 = ZEXT1664(auVar6);
                          (*pGVar9->intersectionFilterN)(&local_b90);
                          auVar260 = ZEXT1664(ZEXT416((uint)fVar253));
                          auVar266 = ZEXT1664(auVar265);
                          auVar277 = ZEXT3264(local_b00);
                          auVar278 = ZEXT3264(local_ae0);
                        }
                        auVar160 = vmovdqa64_avx512f(local_900);
                        uVar27 = vptestmd_avx512f(auVar160,auVar160);
                        if ((short)uVar27 != 0) {
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar250 = ZEXT1664(auVar250._0_16_);
                            auVar259 = ZEXT1664(auVar259._0_16_);
                            auVar271 = ZEXT1664(auVar271._0_16_);
                            auVar275 = ZEXT1664(auVar275._0_16_);
                            (*p_Var10)(&local_b90);
                            auVar260 = ZEXT1664(ZEXT416((uint)fVar253));
                            auVar266 = ZEXT1664(auVar265);
                            auVar277 = ZEXT3264(local_b00);
                            auVar278 = ZEXT3264(local_ae0);
                          }
                          auVar160 = vmovdqa64_avx512f(local_900);
                          uVar102 = vptestmd_avx512f(auVar160,auVar160);
                          if ((short)uVar102 != 0) {
                            iVar3 = *(int *)(local_b90.hit + 4);
                            iVar4 = *(int *)(local_b90.hit + 8);
                            iVar1 = *(int *)(local_b90.hit + 0xc);
                            iVar70 = *(int *)(local_b90.hit + 0x10);
                            iVar71 = *(int *)(local_b90.hit + 0x14);
                            iVar72 = *(int *)(local_b90.hit + 0x18);
                            iVar73 = *(int *)(local_b90.hit + 0x1c);
                            iVar74 = *(int *)(local_b90.hit + 0x20);
                            iVar75 = *(int *)(local_b90.hit + 0x24);
                            iVar76 = *(int *)(local_b90.hit + 0x28);
                            iVar77 = *(int *)(local_b90.hit + 0x2c);
                            iVar78 = *(int *)(local_b90.hit + 0x30);
                            iVar79 = *(int *)(local_b90.hit + 0x34);
                            iVar80 = *(int *)(local_b90.hit + 0x38);
                            iVar81 = *(int *)(local_b90.hit + 0x3c);
                            bVar96 = (byte)uVar102;
                            bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar102 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar102 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar102 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar102 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar102 >> 7) & 1);
                            bVar93 = (byte)(uVar102 >> 8);
                            bVar19 = (bool)((byte)(uVar102 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar102 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar102 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar102 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar102 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar102 >> 0xe) & 1);
                            bVar25 = SUB81(uVar102 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x300) =
                                 (uint)(bVar96 & 1) * *(int *)local_b90.hit |
                                 (uint)!(bool)(bVar96 & 1) * *(int *)(local_b90.ray + 0x300);
                            *(uint *)(local_b90.ray + 0x304) =
                                 (uint)bVar101 * iVar3 |
                                 (uint)!bVar101 * *(int *)(local_b90.ray + 0x304);
                            *(uint *)(local_b90.ray + 0x308) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x308);
                            *(uint *)(local_b90.ray + 0x30c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x30c);
                            *(uint *)(local_b90.ray + 0x310) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x310);
                            *(uint *)(local_b90.ray + 0x314) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x314);
                            *(uint *)(local_b90.ray + 0x318) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x318);
                            *(uint *)(local_b90.ray + 0x31c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x31c);
                            *(uint *)(local_b90.ray + 800) =
                                 (uint)(bVar93 & 1) * iVar74 |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 800);
                            *(uint *)(local_b90.ray + 0x324) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x324);
                            *(uint *)(local_b90.ray + 0x328) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x328);
                            *(uint *)(local_b90.ray + 0x32c) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x32c);
                            *(uint *)(local_b90.ray + 0x330) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x330);
                            *(uint *)(local_b90.ray + 0x334) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x334);
                            *(uint *)(local_b90.ray + 0x338) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x338);
                            *(uint *)(local_b90.ray + 0x33c) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x33c);
                            iVar3 = *(int *)(local_b90.hit + 0x44);
                            iVar4 = *(int *)(local_b90.hit + 0x48);
                            iVar1 = *(int *)(local_b90.hit + 0x4c);
                            iVar70 = *(int *)(local_b90.hit + 0x50);
                            iVar71 = *(int *)(local_b90.hit + 0x54);
                            iVar72 = *(int *)(local_b90.hit + 0x58);
                            iVar73 = *(int *)(local_b90.hit + 0x5c);
                            iVar74 = *(int *)(local_b90.hit + 0x60);
                            iVar75 = *(int *)(local_b90.hit + 100);
                            iVar76 = *(int *)(local_b90.hit + 0x68);
                            iVar77 = *(int *)(local_b90.hit + 0x6c);
                            iVar78 = *(int *)(local_b90.hit + 0x70);
                            iVar79 = *(int *)(local_b90.hit + 0x74);
                            iVar80 = *(int *)(local_b90.hit + 0x78);
                            iVar81 = *(int *)(local_b90.hit + 0x7c);
                            bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar102 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar102 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar102 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar102 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar102 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar102 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar102 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar102 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar102 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar102 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar102 >> 0xe) & 1);
                            bVar25 = SUB81(uVar102 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x340) =
                                 (uint)(bVar96 & 1) * *(int *)(local_b90.hit + 0x40) |
                                 (uint)!(bool)(bVar96 & 1) * *(int *)(local_b90.ray + 0x340);
                            *(uint *)(local_b90.ray + 0x344) =
                                 (uint)bVar101 * iVar3 |
                                 (uint)!bVar101 * *(int *)(local_b90.ray + 0x344);
                            *(uint *)(local_b90.ray + 0x348) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x348);
                            *(uint *)(local_b90.ray + 0x34c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x34c);
                            *(uint *)(local_b90.ray + 0x350) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x350);
                            *(uint *)(local_b90.ray + 0x354) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x354);
                            *(uint *)(local_b90.ray + 0x358) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x358);
                            *(uint *)(local_b90.ray + 0x35c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x35c);
                            *(uint *)(local_b90.ray + 0x360) =
                                 (uint)(bVar93 & 1) * iVar74 |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x360);
                            *(uint *)(local_b90.ray + 0x364) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x364);
                            *(uint *)(local_b90.ray + 0x368) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x368);
                            *(uint *)(local_b90.ray + 0x36c) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x36c);
                            *(uint *)(local_b90.ray + 0x370) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x370);
                            *(uint *)(local_b90.ray + 0x374) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x374);
                            *(uint *)(local_b90.ray + 0x378) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x378);
                            *(uint *)(local_b90.ray + 0x37c) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x37c);
                            iVar3 = *(int *)(local_b90.hit + 0x84);
                            iVar4 = *(int *)(local_b90.hit + 0x88);
                            iVar1 = *(int *)(local_b90.hit + 0x8c);
                            iVar70 = *(int *)(local_b90.hit + 0x90);
                            iVar71 = *(int *)(local_b90.hit + 0x94);
                            iVar72 = *(int *)(local_b90.hit + 0x98);
                            iVar73 = *(int *)(local_b90.hit + 0x9c);
                            iVar74 = *(int *)(local_b90.hit + 0xa0);
                            iVar75 = *(int *)(local_b90.hit + 0xa4);
                            iVar76 = *(int *)(local_b90.hit + 0xa8);
                            iVar77 = *(int *)(local_b90.hit + 0xac);
                            iVar78 = *(int *)(local_b90.hit + 0xb0);
                            iVar79 = *(int *)(local_b90.hit + 0xb4);
                            iVar80 = *(int *)(local_b90.hit + 0xb8);
                            iVar81 = *(int *)(local_b90.hit + 0xbc);
                            bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar102 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar102 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar102 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar102 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar102 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar102 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar102 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar102 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar102 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar102 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar102 >> 0xe) & 1);
                            bVar25 = SUB81(uVar102 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x380) =
                                 (uint)(bVar96 & 1) * *(int *)(local_b90.hit + 0x80) |
                                 (uint)!(bool)(bVar96 & 1) * *(int *)(local_b90.ray + 0x380);
                            *(uint *)(local_b90.ray + 900) =
                                 (uint)bVar101 * iVar3 |
                                 (uint)!bVar101 * *(int *)(local_b90.ray + 900);
                            *(uint *)(local_b90.ray + 0x388) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x388);
                            *(uint *)(local_b90.ray + 0x38c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x38c);
                            *(uint *)(local_b90.ray + 0x390) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x390);
                            *(uint *)(local_b90.ray + 0x394) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x394);
                            *(uint *)(local_b90.ray + 0x398) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x398);
                            *(uint *)(local_b90.ray + 0x39c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x39c);
                            *(uint *)(local_b90.ray + 0x3a0) =
                                 (uint)(bVar93 & 1) * iVar74 |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x3a0);
                            *(uint *)(local_b90.ray + 0x3a4) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x3a4);
                            *(uint *)(local_b90.ray + 0x3a8) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x3a8);
                            *(uint *)(local_b90.ray + 0x3ac) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x3ac);
                            *(uint *)(local_b90.ray + 0x3b0) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x3b0);
                            *(uint *)(local_b90.ray + 0x3b4) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x3b4);
                            *(uint *)(local_b90.ray + 0x3b8) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x3b8);
                            *(uint *)(local_b90.ray + 0x3bc) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x3bc);
                            iVar3 = *(int *)(local_b90.hit + 0xc4);
                            iVar4 = *(int *)(local_b90.hit + 200);
                            iVar1 = *(int *)(local_b90.hit + 0xcc);
                            iVar70 = *(int *)(local_b90.hit + 0xd0);
                            iVar71 = *(int *)(local_b90.hit + 0xd4);
                            iVar72 = *(int *)(local_b90.hit + 0xd8);
                            iVar73 = *(int *)(local_b90.hit + 0xdc);
                            iVar74 = *(int *)(local_b90.hit + 0xe0);
                            iVar75 = *(int *)(local_b90.hit + 0xe4);
                            iVar76 = *(int *)(local_b90.hit + 0xe8);
                            iVar77 = *(int *)(local_b90.hit + 0xec);
                            iVar78 = *(int *)(local_b90.hit + 0xf0);
                            iVar79 = *(int *)(local_b90.hit + 0xf4);
                            iVar80 = *(int *)(local_b90.hit + 0xf8);
                            iVar81 = *(int *)(local_b90.hit + 0xfc);
                            bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar102 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar102 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar102 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar102 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar102 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar102 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar102 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar102 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar102 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar102 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar102 >> 0xe) & 1);
                            bVar25 = SUB81(uVar102 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x3c0) =
                                 (uint)(bVar96 & 1) * *(int *)(local_b90.hit + 0xc0) |
                                 (uint)!(bool)(bVar96 & 1) * *(int *)(local_b90.ray + 0x3c0);
                            *(uint *)(local_b90.ray + 0x3c4) =
                                 (uint)bVar101 * iVar3 |
                                 (uint)!bVar101 * *(int *)(local_b90.ray + 0x3c4);
                            *(uint *)(local_b90.ray + 0x3c8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x3c8);
                            *(uint *)(local_b90.ray + 0x3cc) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x3cc);
                            *(uint *)(local_b90.ray + 0x3d0) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x3d0);
                            *(uint *)(local_b90.ray + 0x3d4) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x3d4);
                            *(uint *)(local_b90.ray + 0x3d8) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x3d8);
                            *(uint *)(local_b90.ray + 0x3dc) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x3dc);
                            *(uint *)(local_b90.ray + 0x3e0) =
                                 (uint)(bVar93 & 1) * iVar74 |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x3e0);
                            *(uint *)(local_b90.ray + 0x3e4) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x3e4);
                            *(uint *)(local_b90.ray + 1000) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 1000);
                            *(uint *)(local_b90.ray + 0x3ec) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x3ec);
                            *(uint *)(local_b90.ray + 0x3f0) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x3f0);
                            *(uint *)(local_b90.ray + 0x3f4) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x3f4);
                            *(uint *)(local_b90.ray + 0x3f8) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x3f8);
                            *(uint *)(local_b90.ray + 0x3fc) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x3fc);
                            iVar3 = *(int *)(local_b90.hit + 0x104);
                            iVar4 = *(int *)(local_b90.hit + 0x108);
                            iVar1 = *(int *)(local_b90.hit + 0x10c);
                            iVar70 = *(int *)(local_b90.hit + 0x110);
                            iVar71 = *(int *)(local_b90.hit + 0x114);
                            iVar72 = *(int *)(local_b90.hit + 0x118);
                            iVar73 = *(int *)(local_b90.hit + 0x11c);
                            iVar74 = *(int *)(local_b90.hit + 0x120);
                            iVar75 = *(int *)(local_b90.hit + 0x124);
                            iVar76 = *(int *)(local_b90.hit + 0x128);
                            iVar77 = *(int *)(local_b90.hit + 300);
                            iVar78 = *(int *)(local_b90.hit + 0x130);
                            iVar79 = *(int *)(local_b90.hit + 0x134);
                            iVar80 = *(int *)(local_b90.hit + 0x138);
                            iVar81 = *(int *)(local_b90.hit + 0x13c);
                            bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar102 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar102 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar102 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar102 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar102 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar102 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar102 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar102 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar102 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar102 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar102 >> 0xe) & 1);
                            bVar25 = SUB81(uVar102 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x400) =
                                 (uint)(bVar96 & 1) * *(int *)(local_b90.hit + 0x100) |
                                 (uint)!(bool)(bVar96 & 1) * *(int *)(local_b90.ray + 0x400);
                            *(uint *)(local_b90.ray + 0x404) =
                                 (uint)bVar101 * iVar3 |
                                 (uint)!bVar101 * *(int *)(local_b90.ray + 0x404);
                            *(uint *)(local_b90.ray + 0x408) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x408);
                            *(uint *)(local_b90.ray + 0x40c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x40c);
                            *(uint *)(local_b90.ray + 0x410) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x410);
                            *(uint *)(local_b90.ray + 0x414) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x414);
                            *(uint *)(local_b90.ray + 0x418) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x418);
                            *(uint *)(local_b90.ray + 0x41c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x41c);
                            *(uint *)(local_b90.ray + 0x420) =
                                 (uint)(bVar93 & 1) * iVar74 |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x420);
                            *(uint *)(local_b90.ray + 0x424) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x424);
                            *(uint *)(local_b90.ray + 0x428) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x428);
                            *(uint *)(local_b90.ray + 0x42c) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x42c);
                            *(uint *)(local_b90.ray + 0x430) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x430);
                            *(uint *)(local_b90.ray + 0x434) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x434);
                            *(uint *)(local_b90.ray + 0x438) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x438);
                            *(uint *)(local_b90.ray + 0x43c) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x43c);
                            auVar187 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x140));
                            auVar187 = vmovdqu32_avx512f(auVar187);
                            *(undefined1 (*) [64])(local_b90.ray + 0x440) = auVar187;
                            auVar187 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x180));
                            auVar187 = vmovdqu32_avx512f(auVar187);
                            *(undefined1 (*) [64])(local_b90.ray + 0x480) = auVar187;
                            auVar226 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x1c0));
                            auVar187 = vmovdqa32_avx512f(auVar226);
                            *(undefined1 (*) [64])(local_b90.ray + 0x4c0) = auVar187;
                            auVar187 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x200));
                            bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                            auVar66._4_56_ = auVar187._8_56_;
                            auVar66._0_4_ =
                                 (uint)bVar101 * auVar187._4_4_ | (uint)!bVar101 * auVar226._4_4_;
                            auVar160._0_8_ = auVar66._0_8_ << 0x20;
                            bVar101 = (bool)((byte)(uVar102 >> 2) & 1);
                            auVar160._8_4_ =
                                 (uint)bVar101 * auVar187._8_4_ | (uint)!bVar101 * auVar226._8_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 3) & 1);
                            auVar160._12_4_ =
                                 (uint)bVar101 * auVar187._12_4_ | (uint)!bVar101 * auVar226._12_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 4) & 1);
                            auVar160._16_4_ =
                                 (uint)bVar101 * auVar187._16_4_ | (uint)!bVar101 * auVar226._16_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 5) & 1);
                            auVar160._20_4_ =
                                 (uint)bVar101 * auVar187._20_4_ | (uint)!bVar101 * auVar226._20_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 6) & 1);
                            auVar160._24_4_ =
                                 (uint)bVar101 * auVar187._24_4_ | (uint)!bVar101 * auVar226._24_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 7) & 1);
                            auVar160._28_4_ =
                                 (uint)bVar101 * auVar187._28_4_ | (uint)!bVar101 * auVar226._28_4_;
                            auVar160._32_4_ =
                                 (uint)(bVar93 & 1) * auVar187._32_4_ |
                                 (uint)!(bool)(bVar93 & 1) * auVar226._32_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 9) & 1);
                            auVar160._36_4_ =
                                 (uint)bVar101 * auVar187._36_4_ | (uint)!bVar101 * auVar226._36_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 10) & 1);
                            auVar160._40_4_ =
                                 (uint)bVar101 * auVar187._40_4_ | (uint)!bVar101 * auVar226._40_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 0xb) & 1);
                            auVar160._44_4_ =
                                 (uint)bVar101 * auVar187._44_4_ | (uint)!bVar101 * auVar226._44_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 0xc) & 1);
                            auVar160._48_4_ =
                                 (uint)bVar101 * auVar187._48_4_ | (uint)!bVar101 * auVar226._48_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 0xd) & 1);
                            auVar160._52_4_ =
                                 (uint)bVar101 * auVar187._52_4_ | (uint)!bVar101 * auVar226._52_4_;
                            bVar101 = (bool)((byte)(uVar102 >> 0xe) & 1);
                            auVar160._56_4_ =
                                 (uint)bVar101 * auVar187._56_4_ | (uint)!bVar101 * auVar226._56_4_;
                            bVar101 = SUB81(uVar102 >> 0xf,0);
                            auVar160._60_4_ =
                                 (uint)bVar101 * auVar187._60_4_ | (uint)!bVar101 * auVar226._60_4_;
                            auVar187 = vmovdqa32_avx512f(auVar187);
                            *(undefined1 (*) [64])(local_b90.ray + 0x500) = auVar187;
                            goto LAB_01e152b7;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar254;
                      }
                    }
                  }
                }
LAB_01e152b7:
                auVar116 = auVar160._32_32_;
                bVar101 = lVar100 != 0;
                lVar100 = lVar100 + -1;
              } while ((!bVar12) && (bVar101));
              auVar85._4_4_ = fStack_87c;
              auVar85._0_4_ = local_880;
              auVar85._8_4_ = fStack_878;
              auVar85._12_4_ = fStack_874;
              auVar85._16_4_ = fStack_870;
              auVar85._20_4_ = fStack_86c;
              auVar85._24_4_ = fStack_868;
              auVar85._28_4_ = fStack_864;
              uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar41._4_4_ = uVar5;
              auVar41._0_4_ = uVar5;
              auVar41._8_4_ = uVar5;
              auVar41._12_4_ = uVar5;
              auVar41._16_4_ = uVar5;
              auVar41._20_4_ = uVar5;
              auVar41._24_4_ = uVar5;
              auVar41._28_4_ = uVar5;
              uVar27 = vcmpps_avx512vl(auVar85,auVar41,2);
              bVar97 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar97 & (byte)uVar27;
            } while (bVar97 != 0);
          }
          uVar29 = vpcmpd_avx512vl(local_820,_local_8a0,1);
          uVar28 = vpcmpd_avx512vl(local_820,local_780,1);
          auVar208._0_4_ = (float)local_940._0_4_ + (float)local_500._0_4_;
          auVar208._4_4_ = (float)local_940._4_4_ + (float)local_500._4_4_;
          auVar208._8_4_ = fStack_938 + fStack_4f8;
          auVar208._12_4_ = fStack_934 + fStack_4f4;
          auVar208._16_4_ = fStack_930 + fStack_4f0;
          auVar208._20_4_ = fStack_92c + fStack_4ec;
          auVar208._24_4_ = fStack_928 + fStack_4e8;
          auVar208._28_4_ = fStack_924 + fStack_4e4;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar225._4_4_ = uVar5;
          auVar225._0_4_ = uVar5;
          auVar225._8_4_ = uVar5;
          auVar225._12_4_ = uVar5;
          auVar225._16_4_ = uVar5;
          auVar225._20_4_ = uVar5;
          auVar225._24_4_ = uVar5;
          auVar225._28_4_ = uVar5;
          uVar27 = vcmpps_avx512vl(auVar208,auVar225,2);
          bVar94 = bVar94 & (byte)uVar28 & (byte)uVar27;
          auVar239._0_4_ = (float)local_940._0_4_ + (float)local_7c0._0_4_;
          auVar239._4_4_ = (float)local_940._4_4_ + (float)local_7c0._4_4_;
          auVar239._8_4_ = fStack_938 + fStack_7b8;
          auVar239._12_4_ = fStack_934 + fStack_7b4;
          auVar239._16_4_ = fStack_930 + fStack_7b0;
          auVar239._20_4_ = fStack_92c + fStack_7ac;
          auVar239._24_4_ = fStack_928 + fStack_7a8;
          auVar239._28_4_ = fStack_924 + fStack_7a4;
          uVar27 = vcmpps_avx512vl(auVar239,auVar225,2);
          bVar91 = bVar91 & (byte)uVar29 & (byte)uVar27 | bVar94;
          prim = local_b20;
          if (bVar91 == 0) {
            auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar187 = ZEXT3264(auVar118);
          }
          else {
            uVar102 = local_b10 & 0xffffffff;
            abStack_1a0[uVar102 * 0x60] = bVar91;
            bVar12 = (bool)(bVar94 >> 1 & 1);
            bVar101 = (bool)(bVar94 >> 2 & 1);
            bVar13 = (bool)(bVar94 >> 3 & 1);
            bVar14 = (bool)(bVar94 >> 4 & 1);
            bVar15 = (bool)(bVar94 >> 5 & 1);
            auStack_180[uVar102 * 0x18] =
                 (uint)(bVar94 & 1) * local_500._0_4_ | (uint)!(bool)(bVar94 & 1) * local_7c0._0_4_;
            auStack_180[uVar102 * 0x18 + 1] =
                 (uint)bVar12 * local_500._4_4_ | (uint)!bVar12 * local_7c0._4_4_;
            auStack_180[uVar102 * 0x18 + 2] =
                 (uint)bVar101 * (int)fStack_4f8 | (uint)!bVar101 * (int)fStack_7b8;
            auStack_180[uVar102 * 0x18 + 3] =
                 (uint)bVar13 * (int)fStack_4f4 | (uint)!bVar13 * (int)fStack_7b4;
            auStack_180[uVar102 * 0x18 + 4] =
                 (uint)bVar14 * (int)fStack_4f0 | (uint)!bVar14 * (int)fStack_7b0;
            auStack_180[uVar102 * 0x18 + 5] =
                 (uint)bVar15 * (int)fStack_4ec | (uint)!bVar15 * (int)fStack_7ac;
            auStack_180[uVar102 * 0x18 + 6] =
                 (uint)(bVar94 >> 6) * (int)fStack_4e8 |
                 (uint)!(bool)(bVar94 >> 6) * (int)fStack_7a8;
            (&fStack_164)[uVar102 * 0x18] = fStack_7a4;
            uVar27 = vmovlps_avx(local_b40);
            (&uStack_160)[uVar102 * 0xc] = uVar27;
            afStack_158[uVar102 * 0x18] = (float)((int)local_b18 + 1);
            local_b10 = (ulong)((int)local_b10 + 1);
            auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar187 = ZEXT3264(auVar118);
          }
        }
      }
    }
    auVar226 = ZEXT1664(local_b40);
    local_b10 = local_b10 & 0xffffffff;
    do {
      if ((int)local_b10 == 0) {
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar43._4_4_ = uVar5;
        auVar43._0_4_ = uVar5;
        auVar43._8_4_ = uVar5;
        auVar43._12_4_ = uVar5;
        auVar43._16_4_ = uVar5;
        auVar43._20_4_ = uVar5;
        auVar43._24_4_ = uVar5;
        auVar43._28_4_ = uVar5;
        uVar27 = vcmpps_avx512vl(local_760,auVar43,2);
        uVar99 = (uint)local_b08 & (uint)uVar27;
        local_b08 = (ulong)uVar99;
        if (uVar99 == 0) {
          return;
        }
        goto LAB_01e12eed;
      }
      uVar102 = (ulong)((int)local_b10 - 1);
      auVar118 = *(undefined1 (*) [32])(auStack_180 + uVar102 * 0x18);
      auVar209._0_4_ = auVar118._0_4_ + (float)local_940._0_4_;
      auVar209._4_4_ = auVar118._4_4_ + (float)local_940._4_4_;
      auVar209._8_4_ = auVar118._8_4_ + fStack_938;
      auVar209._12_4_ = auVar118._12_4_ + fStack_934;
      auVar209._16_4_ = auVar118._16_4_ + fStack_930;
      auVar209._20_4_ = auVar118._20_4_ + fStack_92c;
      auVar209._24_4_ = auVar118._24_4_ + fStack_928;
      auVar209._28_4_ = auVar118._28_4_ + fStack_924;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar42._4_4_ = uVar5;
      auVar42._0_4_ = uVar5;
      auVar42._8_4_ = uVar5;
      auVar42._12_4_ = uVar5;
      auVar42._16_4_ = uVar5;
      auVar42._20_4_ = uVar5;
      auVar42._24_4_ = uVar5;
      auVar42._28_4_ = uVar5;
      uVar27 = vcmpps_avx512vl(auVar209,auVar42,2);
      uVar103 = (uint)uVar27 & (uint)abStack_1a0[uVar102 * 0x60];
      bVar91 = (byte)uVar103;
      if (uVar103 != 0) {
        auVar210._8_4_ = 0x7f800000;
        auVar210._0_8_ = 0x7f8000007f800000;
        auVar210._12_4_ = 0x7f800000;
        auVar210._16_4_ = 0x7f800000;
        auVar210._20_4_ = 0x7f800000;
        auVar210._24_4_ = 0x7f800000;
        auVar210._28_4_ = 0x7f800000;
        auVar119 = vblendmps_avx512vl(auVar210,auVar118);
        auVar154._0_4_ =
             (uint)(bVar91 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar91 & 1) * (int)auVar118._0_4_;
        bVar12 = (bool)((byte)(uVar103 >> 1) & 1);
        auVar154._4_4_ = (uint)bVar12 * auVar119._4_4_ | (uint)!bVar12 * (int)auVar118._4_4_;
        bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
        auVar154._8_4_ = (uint)bVar12 * auVar119._8_4_ | (uint)!bVar12 * (int)auVar118._8_4_;
        bVar12 = (bool)((byte)(uVar103 >> 3) & 1);
        auVar154._12_4_ = (uint)bVar12 * auVar119._12_4_ | (uint)!bVar12 * (int)auVar118._12_4_;
        bVar12 = (bool)((byte)(uVar103 >> 4) & 1);
        auVar154._16_4_ = (uint)bVar12 * auVar119._16_4_ | (uint)!bVar12 * (int)auVar118._16_4_;
        bVar12 = (bool)((byte)(uVar103 >> 5) & 1);
        auVar154._20_4_ = (uint)bVar12 * auVar119._20_4_ | (uint)!bVar12 * (int)auVar118._20_4_;
        bVar12 = (bool)((byte)(uVar103 >> 6) & 1);
        auVar154._24_4_ = (uint)bVar12 * auVar119._24_4_ | (uint)!bVar12 * (int)auVar118._24_4_;
        auVar154._28_4_ =
             (uVar103 >> 7) * auVar119._28_4_ | (uint)!SUB41(uVar103 >> 7,0) * (int)auVar118._28_4_;
        auVar118 = vshufps_avx(auVar154,auVar154,0xb1);
        auVar118 = vminps_avx(auVar154,auVar118);
        auVar119 = vshufpd_avx(auVar118,auVar118,5);
        auVar118 = vminps_avx(auVar118,auVar119);
        auVar119 = vpermpd_avx2(auVar118,0x4e);
        auVar118 = vminps_avx(auVar118,auVar119);
        uVar27 = vcmpps_avx512vl(auVar154,auVar118,0);
        bVar97 = (byte)uVar27 & bVar91;
        if (bVar97 != 0) {
          uVar103 = (uint)bVar97;
        }
        fVar168 = afStack_158[uVar102 * 0x18 + -1];
        uVar161 = 0;
        for (; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x80000000) {
          uVar161 = uVar161 + 1;
        }
        local_b18 = (ulong)(uint)afStack_158[uVar102 * 0x18];
        bVar97 = ~('\x01' << ((byte)uVar161 & 0x1f)) & bVar91;
        abStack_1a0[uVar102 * 0x60] = bVar97;
        uVar98 = uVar102;
        if (bVar97 != 0) {
          uVar98 = local_b10;
        }
        fVar252 = *(float *)(&uStack_160 + uVar102 * 0xc);
        auVar211._4_4_ = fVar252;
        auVar211._0_4_ = fVar252;
        auVar211._8_4_ = fVar252;
        auVar211._12_4_ = fVar252;
        auVar211._16_4_ = fVar252;
        auVar211._20_4_ = fVar252;
        auVar211._24_4_ = fVar252;
        auVar211._28_4_ = fVar252;
        fVar168 = fVar168 - fVar252;
        auVar186._4_4_ = fVar168;
        auVar186._0_4_ = fVar168;
        auVar186._8_4_ = fVar168;
        auVar186._12_4_ = fVar168;
        auVar186._16_4_ = fVar168;
        auVar186._20_4_ = fVar168;
        auVar186._24_4_ = fVar168;
        auVar186._28_4_ = fVar168;
        auVar107 = vfmadd132ps_fma(auVar186,auVar211,_DAT_02020f20);
        auVar118 = ZEXT1632(auVar107);
        local_400[0] = (RTCHitN)auVar118[0];
        local_400[1] = (RTCHitN)auVar118[1];
        local_400[2] = (RTCHitN)auVar118[2];
        local_400[3] = (RTCHitN)auVar118[3];
        local_400[4] = (RTCHitN)auVar118[4];
        local_400[5] = (RTCHitN)auVar118[5];
        local_400[6] = (RTCHitN)auVar118[6];
        local_400[7] = (RTCHitN)auVar118[7];
        local_400[8] = (RTCHitN)auVar118[8];
        local_400[9] = (RTCHitN)auVar118[9];
        local_400[10] = (RTCHitN)auVar118[10];
        local_400[0xb] = (RTCHitN)auVar118[0xb];
        local_400[0xc] = (RTCHitN)auVar118[0xc];
        local_400[0xd] = (RTCHitN)auVar118[0xd];
        local_400[0xe] = (RTCHitN)auVar118[0xe];
        local_400[0xf] = (RTCHitN)auVar118[0xf];
        local_400[0x10] = (RTCHitN)auVar118[0x10];
        local_400[0x11] = (RTCHitN)auVar118[0x11];
        local_400[0x12] = (RTCHitN)auVar118[0x12];
        local_400[0x13] = (RTCHitN)auVar118[0x13];
        local_400[0x14] = (RTCHitN)auVar118[0x14];
        local_400[0x15] = (RTCHitN)auVar118[0x15];
        local_400[0x16] = (RTCHitN)auVar118[0x16];
        local_400[0x17] = (RTCHitN)auVar118[0x17];
        local_400[0x18] = (RTCHitN)auVar118[0x18];
        local_400[0x19] = (RTCHitN)auVar118[0x19];
        local_400[0x1a] = (RTCHitN)auVar118[0x1a];
        local_400[0x1b] = (RTCHitN)auVar118[0x1b];
        local_400[0x1c] = (RTCHitN)auVar118[0x1c];
        local_400[0x1d] = (RTCHitN)auVar118[0x1d];
        local_400[0x1e] = (RTCHitN)auVar118[0x1e];
        local_400[0x1f] = (RTCHitN)auVar118[0x1f];
        auVar226 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar161 * 4));
        uVar102 = uVar98;
      }
      local_b10 = uVar102;
    } while (bVar91 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }